

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O1

int ncnn::convolution_im2col_gemm
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int kernel_w,int kernel_h,
              int dilation_w,int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  int iVar35;
  byte bVar36;
  byte bVar37;
  int *piVar38;
  undefined1 (*pauVar39) [64];
  long lVar40;
  undefined1 (*pauVar41) [64];
  long lVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  ulong uVar46;
  uint uVar47;
  ulong uVar48;
  undefined1 (*pauVar49) [16];
  int iVar50;
  int iVar51;
  uint uVar52;
  undefined1 (*pauVar53) [64];
  undefined1 (*pauVar54) [32];
  undefined1 (*pauVar55) [16];
  undefined4 *puVar56;
  undefined1 (*pauVar57) [64];
  undefined1 (*pauVar58) [16];
  bool bVar59;
  bool bVar60;
  undefined4 in_register_00000084;
  ulong uVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  undefined1 (*pauVar65) [64];
  ulong uVar66;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  int iVar67;
  int iVar68;
  int iVar69;
  undefined4 in_register_0000008c;
  int iVar70;
  long lVar71;
  long lVar72;
  int iVar73;
  int iVar74;
  long lVar75;
  uint uVar76;
  long lVar77;
  long lVar78;
  ulong uVar79;
  int K;
  uint uVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  ushort uVar86;
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  float sum1 [4];
  undefined4 uVar171;
  float sum0 [4];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined4 uVar184;
  undefined4 uVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined4 uVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 (*local_300) [64];
  int TILE_K;
  undefined1 (*local_298) [16];
  long local_290;
  long local_288;
  int TILE_N;
  long local_278;
  long local_270;
  ulong local_268;
  int TILE_M;
  int local_25c;
  Mat *local_258;
  Mat *local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  uint local_21c;
  Mat local_218;
  size_t local_1d0;
  long local_1c8;
  long local_1c0;
  ulong local_1b8;
  undefined1 (*local_1b0) [64];
  ulong local_1a8;
  long local_1a0;
  long local_198;
  ulong local_190;
  long local_188;
  long local_180;
  long local_178;
  int local_170;
  int local_16c;
  Mat local_168;
  long local_118;
  ulong local_110;
  ulong local_108;
  Mat *local_100;
  long local_f8;
  ulong local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_240 = CONCAT44(in_register_0000008c,kernel_h);
  local_248 = CONCAT44(in_register_00000084,kernel_w);
  uVar47 = top_blob->elempack * top_blob->c;
  uVar76 = top_blob->h * top_blob->w;
  K = kernel_h * kernel_w * bottom_blob->c * bottom_blob->elempack;
  local_258 = top_blob;
  local_250 = bias;
  local_100 = AT;
  convolution_im2col_gemm_get_optimal_tile_mnk(uVar47,uVar76,K,&TILE_M,&TILE_N,&TILE_K,nT);
  local_21c = (int)(uVar47 + TILE_M + -1) / TILE_M;
  iVar70 = (int)(uVar76 + TILE_N + -1) / TILE_N;
  iVar43 = (K + TILE_K + -1) / TILE_K;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  local_288 = CONCAT44(local_288._4_4_,iVar43);
  local_1b8 = (ulong)uVar76;
  local_110 = (ulong)uVar47;
  Mat::create(&local_168,TILE_K * TILE_N,iVar43,iVar70,4,opt->workspace_allocator);
  iVar43 = -100;
  if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0))
  goto LAB_0019becb;
  iVar70 = iVar70 * (int)local_288;
  local_268 = CONCAT44(local_268._4_4_,iVar70);
  if (0 < iVar70) {
    iVar70 = (int)local_248;
    iVar43 = (int)local_240;
    bVar81 = iVar43 == 1 && iVar70 == 1;
    bVar82 = dilation_w == 1;
    bVar83 = dilation_h == 1;
    local_270 = CONCAT71(local_270._1_7_,
                         ((bVar83 && stride_w == 1) && (bVar81 && bVar82)) && stride_h == 1);
    bVar84 = stride_w == 2;
    bVar85 = stride_h == 2;
    local_278 = CONCAT71(local_278._1_7_,(bVar81 && bVar84) && bVar85);
    bVar59 = ((iVar43 == 3 && iVar70 == 3) && bVar82) && bVar83;
    bVar81 = stride_w == 1 && stride_h == 1;
    local_228 = CONCAT71(local_228._1_7_,bVar59 && (bVar84 && bVar85));
    bVar60 = ((iVar43 == 5 && iVar70 == 5) && bVar82) && bVar83;
    local_230 = CONCAT71(local_230._1_7_,bVar81 && bVar60);
    local_238 = CONCAT71(local_238._1_7_,bVar60 && (bVar84 && bVar85));
    local_298 = (undefined1 (*) [16])
                CONCAT71(local_298._1_7_,
                         ((bVar83 && bVar84) && ((iVar43 == 7 && iVar70 == 7) && bVar82)) && bVar85)
    ;
    iVar43 = 0;
    do {
      iVar70 = TILE_N * (iVar43 / (int)local_288);
      iVar50 = TILE_K * (int)((long)iVar43 % (long)(int)local_288);
      uVar47 = (int)local_1b8 - iVar70;
      if (TILE_N < (int)uVar47) {
        uVar47 = TILE_N;
      }
      iVar35 = K - iVar50;
      if (TILE_K < K - iVar50) {
        iVar35 = TILE_K;
      }
      local_218.cstep = (size_t)local_168.w;
      local_218.data =
           (void *)((long)local_168.data +
                   ((long)iVar43 % (long)(int)local_288 & 0xffffffffU) * local_218.cstep *
                   CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) +
                   (long)(iVar43 / (int)local_288) * local_168.cstep *
                   CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
      local_218.refcount._0_4_ = 0;
      local_218.refcount._4_4_ = 0;
      local_218.elemsize._0_4_ = (undefined4)local_168.elemsize;
      local_218.elemsize._4_4_ = local_168.elemsize._4_4_;
      local_218.elempack = local_168.elempack;
      local_218.allocator = local_168.allocator;
      local_218.dims = 2;
      local_218.w = local_168.w;
      local_218.h = 1;
      local_218.d = 1;
      local_218.c = 1;
      if ((char)local_270 == '\0') {
        if ((char)local_278 == '\0') {
          if (bVar59 && bVar81) {
            iVar73 = 1;
            iVar69 = 1;
LAB_00197d2e:
            lVar78 = 3;
            goto LAB_00197d35;
          }
          if ((char)local_228 != '\0') {
            iVar73 = 2;
            iVar69 = 2;
            goto LAB_00197d2e;
          }
          if ((char)local_230 != '\0') {
            iVar73 = 1;
            iVar69 = 1;
LAB_00197e23:
            lVar78 = 5;
            goto LAB_00197d35;
          }
          if ((char)local_238 != '\0') {
            iVar73 = 2;
            iVar69 = 2;
            goto LAB_00197e23;
          }
          lVar78 = local_248;
          lVar42 = local_240;
          iVar44 = dilation_w;
          iVar68 = dilation_h;
          iVar69 = stride_w;
          iVar73 = stride_h;
          if ((char)local_298 != '\0') {
            iVar73 = 2;
            iVar69 = 2;
            lVar78 = 7;
            goto LAB_00197d35;
          }
        }
        else {
          iVar73 = 2;
          iVar69 = 2;
          lVar78 = 1;
LAB_00197d35:
          lVar42 = lVar78;
          iVar44 = 1;
          iVar68 = 1;
        }
        convolution_im2col_input_tile_impl
                  (bottom_blob,&local_218,iVar70,uVar47,iVar50,iVar35,(int)lVar78,(int)lVar42,iVar44
                   ,iVar68,iVar69,iVar73);
      }
      else {
        iVar69 = bottom_blob->elempack;
        lVar78 = 0;
        lVar42 = (long)iVar50;
        lVar45 = (long)iVar70;
        pauVar39 = (undefined1 (*) [64])local_218.data;
        if (0xb < (int)uVar47) {
          iVar70 = iVar35 + 3;
          if (-1 < iVar35) {
            iVar70 = iVar35;
          }
          iVar73 = iVar35 + 7;
          if (-1 < iVar35) {
            iVar73 = iVar35;
          }
          iVar44 = iVar35 + 0xf;
          if (-1 < iVar35) {
            iVar44 = iVar35;
          }
          iVar68 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar68 = iVar50;
          }
          iVar67 = iVar50 + 7;
          if (-1 < iVar50) {
            iVar67 = iVar50;
          }
          iVar51 = iVar50 + 0xf;
          if (-1 < iVar50) {
            iVar51 = iVar50;
          }
          lVar62 = 0;
          do {
            if (0xf < iVar35 && iVar69 == 0x10) {
              pauVar53 = (undefined1 (*) [64])
                         ((long)bottom_blob->data +
                         (lVar62 + lVar45) * 0x40 +
                         bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
              iVar74 = iVar44 >> 4;
              do {
                auVar127 = vunpcklps_avx512f(*pauVar53,pauVar53[1]);
                auVar128 = vunpckhps_avx512f(*pauVar53,pauVar53[1]);
                auVar129 = vunpcklps_avx512f(pauVar53[2],pauVar53[3]);
                auVar130 = vunpckhps_avx512f(pauVar53[2],pauVar53[3]);
                auVar131 = vunpcklps_avx512f(pauVar53[4],pauVar53[5]);
                auVar132 = vunpckhps_avx512f(pauVar53[4],pauVar53[5]);
                auVar133 = vunpcklps_avx512f(pauVar53[6],pauVar53[7]);
                auVar134 = vunpckhps_avx512f(pauVar53[6],pauVar53[7]);
                auVar135 = vunpcklps_avx512f(pauVar53[8],pauVar53[9]);
                auVar136 = vunpckhps_avx512f(pauVar53[8],pauVar53[9]);
                auVar137 = vunpcklps_avx512f(pauVar53[10],pauVar53[0xb]);
                auVar138 = vunpckhps_avx512f(pauVar53[10],pauVar53[0xb]);
                auVar139 = vunpcklpd_avx512f(auVar127,auVar129);
                auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
                auVar129 = vunpcklpd_avx512f(auVar128,auVar130);
                auVar128 = vunpckhpd_avx512f(auVar128,auVar130);
                auVar130 = vunpcklpd_avx512f(auVar131,auVar133);
                auVar131 = vunpckhpd_avx512f(auVar131,auVar133);
                auVar133 = vunpcklpd_avx512f(auVar132,auVar134);
                auVar132 = vunpckhpd_avx512f(auVar132,auVar134);
                auVar134 = vunpcklpd_avx512f(auVar135,auVar137);
                auVar135 = vunpckhpd_avx512f(auVar135,auVar137);
                auVar137 = vunpcklpd_avx512f(auVar136,auVar138);
                auVar136 = vunpckhpd_avx512f(auVar136,auVar138);
                auVar138 = vshuff64x2_avx512f(auVar139,auVar130,0x88);
                auVar140 = vshuff64x2_avx512f(auVar134,auVar127,0x88);
                auVar141 = vshuff64x2_avx512f(auVar131,auVar135,0x88);
                auVar142 = vshuff64x2_avx512f(auVar129,auVar133,0x88);
                auVar143 = vshuff64x2_avx512f(auVar137,auVar128,0x88);
                auVar144 = vshuff64x2_avx512f(auVar132,auVar136,0x88);
                auVar130 = vshuff64x2_avx512f(auVar139,auVar130,0xdd);
                auVar127 = vshuff64x2_avx512f(auVar134,auVar127,0xdd);
                auVar131 = vshuff64x2_avx512f(auVar131,auVar135,0xdd);
                auVar129 = vshuff64x2_avx512f(auVar129,auVar133,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar137,auVar128,0xdd);
                auVar132 = vshuff64x2_avx512f(auVar132,auVar136,0xdd);
                auVar133 = vshuff64x2_avx512f(auVar138,auVar140,0x88);
                auVar134 = vshuff64x2_avx512f(auVar141,auVar142,0x88);
                auVar135 = vshuff64x2_avx512f(auVar143,auVar144,0x88);
                auVar136 = vshuff64x2_avx512f(auVar130,auVar127,0x88);
                auVar137 = vshuff64x2_avx512f(auVar131,auVar129,0x88);
                auVar139 = vshuff64x2_avx512f(auVar128,auVar132,0x88);
                auVar138 = vshuff64x2_avx512f(auVar138,auVar140,0xdd);
                auVar140 = vshuff64x2_avx512f(auVar141,auVar142,0xdd);
                auVar141 = vshuff64x2_avx512f(auVar143,auVar144,0xdd);
                auVar127 = vshuff64x2_avx512f(auVar130,auVar127,0xdd);
                auVar129 = vshuff64x2_avx512f(auVar131,auVar129,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar128,auVar132,0xdd);
                *pauVar39 = auVar133;
                pauVar39[1] = auVar134;
                pauVar39[2] = auVar135;
                pauVar39[3] = auVar136;
                pauVar39[4] = auVar137;
                pauVar39[5] = auVar139;
                pauVar39[6] = auVar138;
                pauVar39[7] = auVar140;
                pauVar39[8] = auVar141;
                pauVar39[9] = auVar127;
                pauVar39[10] = auVar129;
                pauVar39[0xb] = auVar128;
                pauVar39 = pauVar39 + 0xc;
                pauVar53 = pauVar53 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (7 < iVar35 && iVar69 == 8) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         (lVar62 + lVar45) * 0x20 +
                         bottom_blob->cstep * (long)(iVar67 >> 3) * bottom_blob->elemsize);
              iVar74 = iVar73 >> 3;
              do {
                auVar109 = vunpcklps_avx(*pauVar54,pauVar54[1]);
                auVar110 = vunpckhps_avx(*pauVar54,pauVar54[1]);
                auVar117 = vunpcklps_avx(pauVar54[2],pauVar54[3]);
                auVar111 = vunpckhps_avx(pauVar54[2],pauVar54[3]);
                auVar119 = vunpcklps_avx(pauVar54[4],pauVar54[5]);
                auVar112 = vunpckhps_avx(pauVar54[4],pauVar54[5]);
                auVar120 = vunpcklps_avx(pauVar54[6],pauVar54[7]);
                auVar113 = vunpckhps_avx(pauVar54[6],pauVar54[7]);
                auVar121 = vunpcklps_avx(pauVar54[8],pauVar54[9]);
                auVar114 = vunpckhps_avx(pauVar54[8],pauVar54[9]);
                auVar107 = vunpcklps_avx(pauVar54[10],pauVar54[0xb]);
                auVar115 = vunpckhps_avx(pauVar54[10],pauVar54[0xb]);
                auVar116 = vunpcklpd_avx(auVar109,auVar117);
                auVar109 = vunpckhpd_avx(auVar109,auVar117);
                auVar117 = vunpcklpd_avx(auVar110,auVar111);
                auVar110 = vunpckhpd_avx(auVar110,auVar111);
                auVar118 = vunpcklpd_avx(auVar119,auVar120);
                auVar111 = vunpckhpd_avx(auVar119,auVar120);
                auVar119 = vunpcklpd_avx(auVar112,auVar113);
                auVar112 = vunpckhpd_avx(auVar112,auVar113);
                auVar120 = vunpcklpd_avx(auVar121,auVar107);
                auVar113 = vunpckhpd_avx(auVar121,auVar107);
                auVar121 = vunpcklpd_avx(auVar114,auVar115);
                auVar114 = vunpckhpd_avx(auVar114,auVar115);
                auVar122._16_16_ = auVar118._0_16_;
                auVar122._0_16_ = auVar116._0_16_;
                auVar123._16_16_ = auVar109._0_16_;
                auVar123._0_16_ = auVar120._0_16_;
                auVar124._16_16_ = auVar113._0_16_;
                auVar124._0_16_ = auVar111._0_16_;
                auVar125._16_16_ = auVar119._0_16_;
                auVar125._0_16_ = auVar117._0_16_;
                auVar107 = vinsertf32x4_avx512vl(auVar121,auVar110._0_16_,1);
                auVar108 = vinsertf32x4_avx512vl(auVar112,auVar114._0_16_,1);
                auVar115 = vperm2f128_avx(auVar116,auVar118,0x31);
                auVar109 = vperm2f128_avx(auVar120,auVar109,0x31);
                auVar111 = vperm2f128_avx(auVar111,auVar113,0x31);
                auVar113 = vperm2f128_avx(auVar117,auVar119,0x31);
                auVar110 = vperm2f128_avx(auVar121,auVar110,0x31);
                auVar112 = vperm2f128_avx(auVar112,auVar114,0x31);
                *(undefined1 (*) [32])*pauVar39 = auVar122;
                *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar123;
                *(undefined1 (*) [32])pauVar39[1] = auVar124;
                *(undefined1 (*) [32])(pauVar39[1] + 0x20) = auVar125;
                *(undefined1 (*) [32])pauVar39[2] = auVar107;
                *(undefined1 (*) [32])(pauVar39[2] + 0x20) = auVar108;
                *(undefined1 (*) [32])pauVar39[3] = auVar115;
                *(undefined1 (*) [32])(pauVar39[3] + 0x20) = auVar109;
                *(undefined1 (*) [32])pauVar39[4] = auVar111;
                *(undefined1 (*) [32])(pauVar39[4] + 0x20) = auVar113;
                *(undefined1 (*) [32])pauVar39[5] = auVar110;
                *(undefined1 (*) [32])(pauVar39[5] + 0x20) = auVar112;
                pauVar39 = pauVar39 + 6;
                pauVar54 = pauVar54 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (3 < iVar35 && iVar69 == 4) {
              pauVar55 = (undefined1 (*) [16])
                         ((long)bottom_blob->data +
                         (lVar62 + lVar45) * 0x10 +
                         bottom_blob->cstep * (long)(iVar68 >> 2) * bottom_blob->elemsize);
              iVar74 = iVar70 >> 2;
              do {
                auVar95 = vunpcklps_avx(*pauVar55,pauVar55[1]);
                auVar98 = vunpcklps_avx(pauVar55[2],pauVar55[3]);
                auVar96 = vunpckhps_avx(*pauVar55,pauVar55[1]);
                auVar97 = vunpckhps_avx(pauVar55[2],pauVar55[3]);
                auVar102 = vunpcklpd_avx(auVar95,auVar98);
                auVar95 = vunpckhpd_avx(auVar95,auVar98);
                auVar103 = vunpcklpd_avx(auVar96,auVar97);
                auVar96 = vunpckhpd_avx(auVar96,auVar97);
                auVar97 = vunpcklps_avx(pauVar55[4],pauVar55[5]);
                auVar100 = vunpcklps_avx(pauVar55[6],pauVar55[7]);
                auVar98 = vunpckhps_avx(pauVar55[4],pauVar55[5]);
                auVar99 = vunpckhps_avx(pauVar55[6],pauVar55[7]);
                auVar104 = vunpcklpd_avx(auVar97,auVar100);
                auVar97 = vunpckhpd_avx(auVar97,auVar100);
                auVar105 = vunpcklpd_avx(auVar98,auVar99);
                auVar98 = vunpckhpd_avx(auVar98,auVar99);
                auVar99 = vunpcklps_avx(pauVar55[8],pauVar55[9]);
                auVar87 = vunpcklps_avx(pauVar55[10],pauVar55[0xb]);
                auVar100 = vunpckhps_avx(pauVar55[8],pauVar55[9]);
                auVar101 = vunpckhps_avx(pauVar55[10],pauVar55[0xb]);
                auVar106 = vunpcklpd_avx(auVar99,auVar87);
                auVar99 = vunpckhpd_avx(auVar99,auVar87);
                auVar87 = vunpcklpd_avx(auVar100,auVar101);
                auVar100 = vunpckhpd_avx(auVar100,auVar101);
                *(undefined1 (*) [16])*pauVar39 = auVar102;
                *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar104;
                *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar106;
                *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar95;
                *(undefined1 (*) [16])pauVar39[1] = auVar97;
                *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar99;
                *(undefined1 (*) [16])(pauVar39[1] + 0x20) = auVar103;
                *(undefined1 (*) [16])(pauVar39[1] + 0x30) = auVar105;
                *(undefined1 (*) [16])pauVar39[2] = auVar87;
                *(undefined1 (*) [16])(pauVar39[2] + 0x10) = auVar96;
                *(undefined1 (*) [16])(pauVar39[2] + 0x20) = auVar98;
                *(undefined1 (*) [16])(pauVar39[2] + 0x30) = auVar100;
                pauVar39 = pauVar39 + 3;
                pauVar55 = pauVar55 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (iVar69 == 1 && 0 < iVar35) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         lVar45 * 4 +
                         lVar62 * 4 + bottom_blob->cstep * lVar42 * bottom_blob->elemsize);
              iVar74 = iVar35;
              do {
                auVar95 = *(undefined1 (*) [16])pauVar54[1];
                *(undefined1 (*) [32])*pauVar39 = *pauVar54;
                *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar95;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x30);
                pauVar54 = (undefined1 (*) [32])(*pauVar54 + bottom_blob->cstep * 4);
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            lVar78 = lVar62 + 0xc;
            uVar61 = lVar62 + 0x17;
            lVar62 = lVar78;
          } while (uVar61 < uVar47);
        }
        lVar62 = (long)(int)uVar47;
        if ((int)lVar78 + 7 < (int)uVar47) {
          iVar70 = iVar35 + 3;
          if (-1 < iVar35) {
            iVar70 = iVar35;
          }
          iVar73 = iVar35 + 7;
          if (-1 < iVar35) {
            iVar73 = iVar35;
          }
          iVar44 = iVar35 + 0xf;
          if (-1 < iVar35) {
            iVar44 = iVar35;
          }
          iVar68 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar68 = iVar50;
          }
          iVar67 = iVar50 + 7;
          if (-1 < iVar50) {
            iVar67 = iVar50;
          }
          iVar51 = iVar50 + 0xf;
          if (-1 < iVar50) {
            iVar51 = iVar50;
          }
          local_290 = CONCAT71(local_290._1_7_,iVar69 != 0x10);
          lVar77 = (long)(int)lVar78;
          do {
            if (0xf < iVar35 && iVar69 == 0x10) {
              pauVar53 = (undefined1 (*) [64])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x40 +
                         bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
              iVar74 = iVar44 >> 4;
              do {
                auVar127 = vunpcklps_avx512f(*pauVar53,pauVar53[1]);
                auVar128 = vunpckhps_avx512f(*pauVar53,pauVar53[1]);
                auVar129 = vunpcklps_avx512f(pauVar53[2],pauVar53[3]);
                auVar130 = vunpckhps_avx512f(pauVar53[2],pauVar53[3]);
                auVar131 = vunpcklps_avx512f(pauVar53[4],pauVar53[5]);
                auVar132 = vunpckhps_avx512f(pauVar53[4],pauVar53[5]);
                auVar133 = vunpcklps_avx512f(pauVar53[6],pauVar53[7]);
                auVar134 = vunpckhps_avx512f(pauVar53[6],pauVar53[7]);
                auVar135 = vunpcklpd_avx512f(auVar127,auVar129);
                auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
                auVar129 = vunpcklpd_avx512f(auVar128,auVar130);
                auVar128 = vunpckhpd_avx512f(auVar128,auVar130);
                auVar130 = vunpcklpd_avx512f(auVar131,auVar133);
                auVar131 = vunpckhpd_avx512f(auVar131,auVar133);
                auVar133 = vunpcklpd_avx512f(auVar132,auVar134);
                auVar132 = vunpckhpd_avx512f(auVar132,auVar134);
                auVar134 = vshuff64x2_avx512f(auVar135,auVar130,0x88);
                auVar136 = vshuff64x2_avx512f(auVar127,auVar131,0x88);
                auVar137 = vshuff64x2_avx512f(auVar129,auVar133,0x88);
                auVar138 = vshuff64x2_avx512f(auVar128,auVar132,0x88);
                auVar130 = vshuff64x2_avx512f(auVar135,auVar130,0xdd);
                auVar127 = vshuff64x2_avx512f(auVar127,auVar131,0xdd);
                auVar129 = vshuff64x2_avx512f(auVar129,auVar133,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar128,auVar132,0xdd);
                auVar131 = vshuff64x2_avx512f(auVar134,auVar136,0x88);
                auVar132 = vshuff64x2_avx512f(auVar137,auVar138,0x88);
                auVar133 = vshuff64x2_avx512f(auVar130,auVar127,0x88);
                auVar135 = vshuff64x2_avx512f(auVar129,auVar128,0x88);
                auVar134 = vshuff64x2_avx512f(auVar134,auVar136,0xdd);
                auVar136 = vshuff64x2_avx512f(auVar137,auVar138,0xdd);
                auVar127 = vshuff64x2_avx512f(auVar130,auVar127,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xdd);
                *pauVar39 = auVar131;
                pauVar39[1] = auVar132;
                pauVar39[2] = auVar133;
                pauVar39[3] = auVar135;
                pauVar39[4] = auVar134;
                pauVar39[5] = auVar136;
                pauVar39[6] = auVar127;
                pauVar39[7] = auVar128;
                pauVar39 = pauVar39 + 8;
                pauVar53 = pauVar53 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (7 < iVar35 && iVar69 == 8) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x20 +
                         bottom_blob->cstep * (long)(iVar67 >> 3) * bottom_blob->elemsize);
              iVar74 = iVar73 >> 3;
              do {
                auVar109 = vunpcklps_avx(*pauVar54,pauVar54[1]);
                auVar110 = vunpckhps_avx(*pauVar54,pauVar54[1]);
                auVar115 = vunpcklps_avx(pauVar54[2],pauVar54[3]);
                auVar111 = vunpckhps_avx(pauVar54[2],pauVar54[3]);
                auVar117 = vunpcklps_avx(pauVar54[4],pauVar54[5]);
                auVar112 = vunpckhps_avx(pauVar54[4],pauVar54[5]);
                auVar118 = vunpcklps_avx(pauVar54[6],pauVar54[7]);
                auVar113 = vunpckhps_avx(pauVar54[6],pauVar54[7]);
                auVar114 = vunpcklpd_avx(auVar109,auVar115);
                auVar109 = vunpckhpd_avx(auVar109,auVar115);
                auVar115 = vunpcklpd_avx(auVar110,auVar111);
                auVar110 = vunpckhpd_avx(auVar110,auVar111);
                auVar116 = vunpcklpd_avx(auVar117,auVar118);
                auVar111 = vunpckhpd_avx(auVar117,auVar118);
                auVar117 = vunpcklpd_avx(auVar112,auVar113);
                auVar112 = vunpckhpd_avx(auVar112,auVar113);
                auVar118._16_16_ = auVar116._0_16_;
                auVar118._0_16_ = auVar114._0_16_;
                auVar119._16_16_ = auVar111._0_16_;
                auVar119._0_16_ = auVar109._0_16_;
                auVar120._16_16_ = auVar117._0_16_;
                auVar120._0_16_ = auVar115._0_16_;
                auVar121._16_16_ = auVar112._0_16_;
                auVar121._0_16_ = auVar110._0_16_;
                auVar113 = vperm2f128_avx(auVar114,auVar116,0x31);
                auVar109 = vperm2f128_avx(auVar109,auVar111,0x31);
                auVar111 = vperm2f128_avx(auVar115,auVar117,0x31);
                auVar110 = vperm2f128_avx(auVar110,auVar112,0x31);
                *(undefined1 (*) [32])*pauVar39 = auVar118;
                *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar119;
                *(undefined1 (*) [32])pauVar39[1] = auVar120;
                *(undefined1 (*) [32])(pauVar39[1] + 0x20) = auVar121;
                *(undefined1 (*) [32])pauVar39[2] = auVar113;
                *(undefined1 (*) [32])(pauVar39[2] + 0x20) = auVar109;
                *(undefined1 (*) [32])pauVar39[3] = auVar111;
                *(undefined1 (*) [32])(pauVar39[3] + 0x20) = auVar110;
                pauVar39 = pauVar39 + 4;
                pauVar54 = pauVar54 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (3 < iVar35 && iVar69 == 4) {
              pauVar55 = (undefined1 (*) [16])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x10 +
                         bottom_blob->cstep * (long)(iVar68 >> 2) * bottom_blob->elemsize);
              iVar74 = iVar70 >> 2;
              do {
                auVar95 = vunpcklps_avx(*pauVar55,pauVar55[1]);
                auVar98 = vunpcklps_avx(pauVar55[2],pauVar55[3]);
                auVar96 = vunpckhps_avx(*pauVar55,pauVar55[1]);
                auVar97 = vunpckhps_avx(pauVar55[2],pauVar55[3]);
                auVar100 = vunpcklpd_avx(auVar95,auVar98);
                auVar95 = vunpckhpd_avx(auVar95,auVar98);
                auVar101 = vunpcklpd_avx(auVar96,auVar97);
                auVar96 = vunpckhpd_avx(auVar96,auVar97);
                auVar97 = vunpcklps_avx(pauVar55[4],pauVar55[5]);
                auVar103 = vunpcklps_avx(pauVar55[6],pauVar55[7]);
                auVar98 = vunpckhps_avx(pauVar55[4],pauVar55[5]);
                auVar99 = vunpckhps_avx(pauVar55[6],pauVar55[7]);
                auVar102 = vunpcklpd_avx(auVar97,auVar103);
                auVar97 = vunpckhpd_avx(auVar97,auVar103);
                auVar103 = vunpcklpd_avx(auVar98,auVar99);
                auVar98 = vunpckhpd_avx(auVar98,auVar99);
                *(undefined1 (*) [16])*pauVar39 = auVar100;
                *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar102;
                *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar95;
                *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar97;
                *(undefined1 (*) [16])pauVar39[1] = auVar101;
                *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar103;
                *(undefined1 (*) [16])(pauVar39[1] + 0x20) = auVar96;
                *(undefined1 (*) [16])(pauVar39[1] + 0x30) = auVar98;
                pauVar39 = pauVar39 + 2;
                pauVar55 = pauVar55 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (iVar69 == 1 && 0 < iVar35) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         lVar45 * 4 +
                         lVar77 * 4 + bottom_blob->cstep * lVar42 * bottom_blob->elemsize);
              iVar74 = iVar35;
              do {
                *(undefined1 (*) [32])*pauVar39 = *pauVar54;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                pauVar54 = (undefined1 (*) [32])(*pauVar54 + bottom_blob->cstep * 4);
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            lVar78 = lVar77 + 8;
            bVar60 = lVar77 < lVar62 + -0xf;
            lVar77 = lVar78;
          } while (bVar60);
        }
        if ((int)((uint)lVar78 | 3) < (int)uVar47) {
          iVar70 = iVar35 + 3;
          if (-1 < iVar35) {
            iVar70 = iVar35;
          }
          iVar73 = iVar35 + 7;
          if (-1 < iVar35) {
            iVar73 = iVar35;
          }
          iVar44 = iVar35 + 0xf;
          if (-1 < iVar35) {
            iVar44 = iVar35;
          }
          iVar68 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar68 = iVar50;
          }
          iVar67 = iVar50 + 7;
          if (-1 < iVar50) {
            iVar67 = iVar50;
          }
          iVar51 = iVar50 + 0xf;
          if (-1 < iVar50) {
            iVar51 = iVar50;
          }
          local_290 = CONCAT71(local_290._1_7_,iVar69 != 8);
          lVar77 = (long)(int)(uint)lVar78;
          do {
            if (0xf < iVar35 && iVar69 == 0x10) {
              pauVar53 = (undefined1 (*) [64])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x40 +
                         bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
              iVar74 = iVar44 >> 4;
              do {
                auVar127 = vunpcklps_avx512f(*pauVar53,pauVar53[1]);
                auVar128 = vunpckhps_avx512f(*pauVar53,pauVar53[1]);
                auVar129 = vunpcklps_avx512f(pauVar53[2],pauVar53[3]);
                auVar130 = vunpckhps_avx512f(pauVar53[2],pauVar53[3]);
                auVar131 = vunpcklpd_avx512f(auVar127,auVar129);
                auVar127 = vunpckhpd_avx512f(auVar127,auVar129);
                auVar129 = vunpcklpd_avx512f(auVar128,auVar130);
                auVar128 = vunpckhpd_avx512f(auVar128,auVar130);
                auVar130 = vshuff64x2_avx512f(auVar131,auVar127,0x88);
                auVar132 = vshuff64x2_avx512f(auVar129,auVar128,0x88);
                auVar127 = vshuff64x2_avx512f(auVar131,auVar127,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar129,auVar128,0xdd);
                auVar129 = vshuff64x2_avx512f(auVar130,auVar132,0x88);
                auVar131 = vshuff64x2_avx512f(auVar127,auVar128,0x88);
                auVar130 = vshuff64x2_avx512f(auVar130,auVar132,0xdd);
                auVar127 = vshuff64x2_avx512f(auVar127,auVar128,0xdd);
                *pauVar39 = auVar129;
                pauVar39[1] = auVar131;
                pauVar39[2] = auVar130;
                pauVar39[3] = auVar127;
                pauVar39 = pauVar39 + 4;
                pauVar53 = pauVar53 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (7 < iVar35 && iVar69 == 8) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x20 +
                         bottom_blob->cstep * (long)(iVar67 >> 3) * bottom_blob->elemsize);
              iVar74 = iVar73 >> 3;
              do {
                auVar109 = vunpcklps_avx(*pauVar54,pauVar54[1]);
                auVar110 = vunpckhps_avx(*pauVar54,pauVar54[1]);
                auVar113 = vunpcklps_avx(pauVar54[2],pauVar54[3]);
                auVar111 = vunpckhps_avx(pauVar54[2],pauVar54[3]);
                auVar112 = vunpcklpd_avx(auVar109,auVar113);
                auVar109 = vunpckhpd_avx(auVar109,auVar113);
                auVar113 = vunpcklpd_avx(auVar110,auVar111);
                auVar110 = vunpckhpd_avx(auVar110,auVar111);
                auVar111._16_16_ = auVar109._0_16_;
                auVar111._0_16_ = auVar112._0_16_;
                auVar114._16_16_ = auVar110._0_16_;
                auVar114._0_16_ = auVar113._0_16_;
                auVar109 = vperm2f128_avx(auVar112,auVar109,0x31);
                auVar110 = vperm2f128_avx(auVar113,auVar110,0x31);
                *(undefined1 (*) [32])*pauVar39 = auVar111;
                *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar114;
                *(undefined1 (*) [32])pauVar39[1] = auVar109;
                *(undefined1 (*) [32])(pauVar39[1] + 0x20) = auVar110;
                pauVar39 = pauVar39 + 2;
                pauVar54 = pauVar54 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (3 < iVar35 && iVar69 == 4) {
              pauVar55 = (undefined1 (*) [16])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x10 +
                         bottom_blob->cstep * (long)(iVar68 >> 2) * bottom_blob->elemsize);
              iVar74 = iVar70 >> 2;
              do {
                auVar95 = vunpcklps_avx(*pauVar55,pauVar55[1]);
                auVar99 = vunpcklps_avx(pauVar55[2],pauVar55[3]);
                auVar96 = vunpckhps_avx(*pauVar55,pauVar55[1]);
                auVar97 = vunpckhps_avx(pauVar55[2],pauVar55[3]);
                auVar98 = vunpcklpd_avx(auVar95,auVar99);
                auVar95 = vunpckhpd_avx(auVar95,auVar99);
                auVar99 = vunpcklpd_avx(auVar96,auVar97);
                auVar96 = vunpckhpd_avx(auVar96,auVar97);
                *(undefined1 (*) [16])*pauVar39 = auVar98;
                *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar95;
                *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar99;
                *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar96;
                pauVar39 = pauVar39 + 1;
                pauVar55 = pauVar55 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (iVar69 == 1 && 0 < iVar35) {
              pauVar55 = (undefined1 (*) [16])
                         ((long)bottom_blob->data +
                         lVar45 * 4 +
                         lVar77 * 4 + bottom_blob->cstep * lVar42 * bottom_blob->elemsize);
              iVar74 = iVar35;
              do {
                *(undefined1 (*) [16])*pauVar39 = *pauVar55;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
                pauVar55 = (undefined1 (*) [16])(*pauVar55 + bottom_blob->cstep * 4);
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            lVar78 = lVar77 + 4;
            lVar63 = lVar77 + 7;
            lVar77 = lVar78;
          } while (lVar63 < lVar62);
        }
        uVar76 = (uint)lVar78;
        if ((int)(uVar76 | 1) < (int)uVar47) {
          local_290 = CONCAT71(local_290._1_7_,iVar35 < 1);
          iVar70 = iVar35 + 3;
          if (-1 < iVar35) {
            iVar70 = iVar35;
          }
          iVar73 = iVar35 + 7;
          if (-1 < iVar35) {
            iVar73 = iVar35;
          }
          iVar44 = iVar35 + 0xf;
          if (-1 < iVar35) {
            iVar44 = iVar35;
          }
          iVar68 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar68 = iVar50;
          }
          iVar67 = iVar50 + 7;
          if (-1 < iVar50) {
            iVar67 = iVar50;
          }
          iVar51 = iVar50 + 0xf;
          if (-1 < iVar50) {
            iVar51 = iVar50;
          }
          lVar77 = lVar45 * 4 + (long)(int)uVar76 * 4;
          lVar63 = (long)(int)uVar76;
          do {
            if (0xf < iVar35 && iVar69 == 0x10) {
              pauVar53 = (undefined1 (*) [64])
                         ((long)bottom_blob->data +
                         (lVar45 + lVar63) * 0x40 +
                         bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
              iVar74 = iVar44 >> 4;
              do {
                auVar127 = vunpcklps_avx512f(*pauVar53,pauVar53[1]);
                auVar128 = vunpckhps_avx512f(*pauVar53,pauVar53[1]);
                auVar129 = vshuff64x2_avx512f(auVar127,auVar128,0x88);
                auVar127 = vshuff64x2_avx512f(auVar127,auVar128,0xdd);
                auVar128 = vshuff64x2_avx512f(auVar129,auVar127,0x88);
                auVar127 = vshuff64x2_avx512f(auVar129,auVar127,0xdd);
                *pauVar39 = auVar128;
                pauVar39[1] = auVar127;
                pauVar39 = pauVar39 + 2;
                pauVar53 = pauVar53 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (7 < iVar35 && iVar69 == 8) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         (lVar45 + lVar63) * 0x20 +
                         bottom_blob->cstep * (long)(iVar67 >> 3) * bottom_blob->elemsize);
              iVar74 = iVar73 >> 3;
              do {
                auVar110 = vunpcklps_avx(*pauVar54,pauVar54[1]);
                auVar109 = vunpckhps_avx(*pauVar54,pauVar54[1]);
                auVar112._16_16_ = auVar109._0_16_;
                auVar112._0_16_ = auVar110._0_16_;
                auVar109 = vperm2f128_avx(auVar110,auVar109,0x31);
                *(undefined1 (*) [32])*pauVar39 = auVar112;
                *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar109;
                pauVar39 = pauVar39 + 1;
                pauVar54 = pauVar54 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (3 < iVar35 && iVar69 == 4) {
              pauVar55 = (undefined1 (*) [16])
                         ((long)bottom_blob->data +
                         (lVar45 + lVar63) * 0x10 +
                         bottom_blob->cstep * (long)(iVar68 >> 2) * bottom_blob->elemsize);
              iVar74 = iVar70 >> 2;
              do {
                auVar96 = vunpcklps_avx(*pauVar55,pauVar55[1]);
                auVar95 = vunpckhps_avx(*pauVar55,pauVar55[1]);
                *(undefined1 (*) [16])*pauVar39 = auVar96;
                *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar95;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                pauVar55 = pauVar55 + bottom_blob->cstep;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            if (iVar69 == 1 && iVar35 >= 1) {
              sVar1 = bottom_blob->cstep;
              puVar56 = (undefined4 *)
                        (sVar1 * lVar42 * bottom_blob->elemsize + lVar77 + (long)bottom_blob->data);
              iVar74 = iVar35;
              do {
                *(undefined4 *)*pauVar39 = *puVar56;
                *(undefined4 *)(*pauVar39 + 4) = puVar56[1];
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 8);
                puVar56 = puVar56 + sVar1;
                iVar74 = iVar74 + -1;
              } while (iVar74 != 0);
            }
            lVar78 = lVar63 + 2;
            lVar75 = lVar63 + 3;
            lVar77 = lVar77 + 8;
            lVar63 = lVar78;
          } while (lVar75 < lVar62);
        }
        if ((int)lVar78 < (int)uVar47) {
          iVar70 = iVar35 + 3;
          if (-1 < iVar35) {
            iVar70 = iVar35;
          }
          iVar73 = iVar35 + 7;
          if (-1 < iVar35) {
            iVar73 = iVar35;
          }
          iVar44 = iVar35 + 0xf;
          if (-1 < iVar35) {
            iVar44 = iVar35;
          }
          iVar68 = iVar50 + 3;
          if (-1 < iVar50) {
            iVar68 = iVar50;
          }
          iVar67 = iVar50 + 7;
          if (-1 < iVar50) {
            iVar67 = iVar50;
          }
          iVar51 = iVar50 + 0xf;
          if (-1 < iVar50) {
            iVar51 = iVar50;
          }
          lVar77 = (long)(int)lVar78;
          lVar78 = lVar45 * 4 + lVar77 * 4;
          do {
            if (0xf < iVar35 && iVar69 == 0x10) {
              pauVar53 = (undefined1 (*) [64])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x40 +
                         bottom_blob->cstep * (long)(iVar51 >> 4) * bottom_blob->elemsize);
              iVar50 = iVar44 >> 4;
              do {
                *pauVar39 = *pauVar53;
                pauVar39 = pauVar39 + 1;
                pauVar53 = pauVar53 + bottom_blob->cstep;
                iVar50 = iVar50 + -1;
              } while (iVar50 != 0);
            }
            if (7 < iVar35 && iVar69 == 8) {
              pauVar54 = (undefined1 (*) [32])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x20 +
                         bottom_blob->cstep * (long)(iVar67 >> 3) * bottom_blob->elemsize);
              iVar50 = iVar73 >> 3;
              do {
                *(undefined1 (*) [32])*pauVar39 = *pauVar54;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                pauVar54 = pauVar54 + bottom_blob->cstep;
                iVar50 = iVar50 + -1;
              } while (iVar50 != 0);
            }
            if (3 < iVar35 && iVar69 == 4) {
              pauVar55 = (undefined1 (*) [16])
                         ((long)bottom_blob->data +
                         (lVar77 + lVar45) * 0x10 +
                         bottom_blob->cstep * (long)(iVar68 >> 2) * bottom_blob->elemsize);
              iVar50 = iVar70 >> 2;
              do {
                *(undefined1 (*) [16])*pauVar39 = *pauVar55;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
                pauVar55 = pauVar55 + bottom_blob->cstep;
                iVar50 = iVar50 + -1;
              } while (iVar50 != 0);
            }
            if (iVar69 == 1 && 0 < iVar35) {
              sVar1 = bottom_blob->cstep;
              puVar56 = (undefined4 *)
                        (sVar1 * lVar42 * bottom_blob->elemsize + lVar78 + (long)bottom_blob->data);
              iVar50 = iVar35;
              do {
                *(undefined4 *)*pauVar39 = *puVar56;
                pauVar39 = (undefined1 (*) [64])(*pauVar39 + 4);
                puVar56 = puVar56 + sVar1;
                iVar50 = iVar50 + -1;
              } while (iVar50 != 0);
            }
            lVar77 = lVar77 + 1;
            lVar78 = lVar78 + 4;
          } while (lVar77 != lVar62);
        }
      }
      piVar38 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
      if (piVar38 != (int *)0x0) {
        LOCK();
        *piVar38 = *piVar38 + -1;
        UNLOCK();
        if (*piVar38 == 0) {
          if (local_218.allocator == (Allocator *)0x0) {
            if ((undefined1 (*) [64])local_218.data != (undefined1 (*) [64])0x0) {
              free(local_218.data);
            }
          }
          else {
            (*(local_218.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar43 = iVar43 + 1;
    } while (iVar43 != (int)local_268);
  }
  uVar61 = local_1b8;
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218.elemsize._4_4_ = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  if (TILE_K < K) {
    Mat::create(&local_218,TILE_M * TILE_N,1,nT,4,opt->workspace_allocator);
    iVar43 = -100;
    if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0))
    goto LAB_00197f51;
  }
  else {
LAB_00197f51:
    if (0 < (int)local_21c) {
      uVar46 = 0;
      do {
        uVar79 = uVar46;
        lVar78 = (long)TILE_M;
        if (TILE_K < K) {
          iVar43 = get_omp_thread_num();
          local_1b0 = (undefined1 (*) [64])
                      ((long)iVar43 * local_218.cstep *
                       CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize) +
                      (long)local_218.data);
        }
        else {
          local_1b0 = (undefined1 (*) [64])0x0;
        }
        local_1a8 = lVar78 * (int)uVar79;
        iVar43 = (int)local_1a8;
        uVar47 = (int)local_110 - iVar43;
        if (TILE_M < (int)uVar47) {
          uVar47 = TILE_M;
        }
        if (0 < (int)uVar61) {
          local_f0 = (ulong)uVar47;
          local_1c0 = (long)iVar43;
          local_1c8 = (long)(int)uVar47;
          iVar70 = 0;
          do {
            uVar76 = (int)uVar61 - iVar70;
            if (TILE_N < (int)uVar76) {
              uVar76 = TILE_N;
            }
            if (0 < K) {
              local_118 = (long)iVar70;
              iVar50 = 0;
              do {
                local_170 = K - iVar50;
                local_f8 = (long)TILE_K;
                iVar35 = local_170;
                if (TILE_K < local_170) {
                  iVar35 = TILE_K;
                }
                pauVar53 = (undefined1 (*) [64])
                           ((long)local_100->data +
                           (long)local_100->w * local_100->elemsize * (long)(iVar50 / TILE_K) +
                           (long)(int)((long)((ulong)(uint)(iVar43 >> 0x1f) << 0x20 |
                                             local_1a8 & 0xffffffff) / (long)TILE_M) *
                           local_100->cstep * local_100->elemsize);
                local_298 = (undefined1 (*) [16])
                            ((long)local_168.data +
                            (long)local_168.w *
                            CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) *
                            (long)(iVar50 / TILE_K) +
                            (long)(iVar70 / TILE_N) * local_168.cstep *
                            CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
                iVar44 = TILE_K + iVar50;
                iVar69 = local_258->elempack;
                local_1d0 = local_258->cstep;
                iVar73 = (int)local_1d0;
                pauVar39 = local_1b0;
                local_300 = (undefined1 (*) [64])local_250->data;
                if ((int)uVar47 < 0x10) {
                  uVar61 = 0;
                }
                else {
                  local_e0 = (long)(iVar69 * iVar70);
                  lVar62 = (long)(iVar73 * 8);
                  lVar78 = (long)(iVar73 * 4);
                  lVar42 = (long)((local_1d0 << 0x22) * 3) >> 0x20;
                  lVar77 = (long)(iVar73 * 2);
                  lVar63 = (long)(local_1d0 * 0x300000000) >> 0x20;
                  lVar75 = (long)(local_1d0 * 0x500000000) >> 0x20;
                  lVar71 = (long)(local_1d0 * 0x600000000) >> 0x20;
                  lVar72 = (long)(local_1d0 * 0x700000000) >> 0x20;
                  lVar45 = (long)((local_1d0 << 0x20) * 9) >> 0x20;
                  local_288 = (long)((local_1d0 << 0x21) * 5) >> 0x20;
                  local_268 = (long)(local_1d0 * 0xb00000000) >> 0x20;
                  local_270 = (long)(local_1d0 * 0xd00000000) >> 0x20;
                  local_278 = (long)(local_1d0 * 0xe00000000) >> 0x20;
                  local_290 = (long)(local_1d0 * 0xf00000000) >> 0x20;
                  local_180 = (long)(iVar73 * 3);
                  local_188 = (long)(iVar73 * 5);
                  local_190 = (ulong)(iVar73 * 6);
                  local_198 = (long)(iVar73 * 7);
                  local_1a0 = (long)(iVar73 * 9);
                  local_38 = (long)(iVar73 * 10);
                  local_40 = (long)(iVar73 * 0xb);
                  local_48 = (long)(iVar73 * 0xc);
                  local_50 = (long)(iVar73 * 0xd);
                  local_58 = (long)(iVar73 * 0xe);
                  local_60 = (long)(iVar73 * 0xf);
                  local_178 = (long)((local_1d0 << 0x20) + 0x100000000) >> 0x20;
                  local_68 = (long)(iVar73 * 2 + 1);
                  local_70 = (long)(iVar73 * 3 + 1);
                  local_78 = (long)(iVar73 * 4 + 1);
                  local_80 = (long)(iVar73 * 5 + 1);
                  local_88 = (long)(iVar73 * 6 + 1);
                  local_90 = (long)(iVar73 * 7 + 1);
                  local_98 = (long)(iVar73 * 8 + 1);
                  local_a0 = (long)(iVar73 * 9 + 1);
                  local_a8 = (long)(iVar73 * 10 + 1);
                  local_b0 = (long)(iVar73 * 0xb + 1);
                  local_b8 = (long)(iVar73 * 0xc + 1);
                  local_c0 = (long)(iVar73 * 0xd + 1);
                  local_c8 = (long)(int)(iVar73 * 0xe | 1);
                  uVar46 = (ulong)(iVar35 - 1);
                  local_240 = uVar46 * 0x30 + 0x30;
                  local_228 = uVar46 * 8 + 8;
                  local_230 = uVar46 * 4 + 4;
                  local_238 = uVar46 * 0x20 + 0x20;
                  local_248 = uVar46 * 0x10 + 0x10;
                  local_e8 = (long)(iVar35 << 4) * 4;
                  iVar68 = local_170;
                  if (local_f8 < local_170) {
                    iVar68 = TILE_K;
                  }
                  local_d0 = (long)(iVar73 * 0xf + 1);
                  lVar40 = (long)iVar73;
                  uVar61 = 0;
                  do {
                    local_d8 = uVar61;
                    pauVar41 = (undefined1 (*) [64])
                               ((long)local_250->data + local_d8 * 4 + local_1a8 * 4);
                    if (local_300 == (undefined1 (*) [64])0x0) {
                      pauVar41 = local_300;
                    }
                    uVar80 = 0;
                    pauVar57 = (undefined1 (*) [64])
                               ((long)local_258->data +
                               local_e0 * 4 + (local_d8 + local_1a8) * lVar40 * 4);
                    pauVar55 = local_298;
                    if (0xb < (int)uVar76) {
                      uVar52 = 0;
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT864(0) << 0x40;
                            auVar128 = ZEXT864(0) << 0x40;
                            auVar129 = ZEXT864(0) << 0x40;
                            auVar130 = ZEXT864(0) << 0x40;
                            auVar131 = ZEXT864(0) << 0x40;
                            auVar132 = ZEXT864(0) << 0x40;
                            auVar133 = ZEXT864(0) << 0x40;
                            auVar134 = ZEXT864(0) << 0x40;
                            auVar135 = ZEXT864(0) << 0x40;
                            auVar136 = ZEXT864(0) << 0x40;
                            auVar137 = ZEXT864(0) << 0x40;
                            auVar138 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar127 = *pauVar41;
                            auVar128 = auVar127;
                            auVar129 = auVar127;
                            auVar130 = auVar127;
                            auVar131 = auVar127;
                            auVar132 = auVar127;
                            auVar133 = auVar127;
                            auVar134 = auVar127;
                            auVar135 = auVar127;
                            auVar136 = auVar127;
                            auVar137 = auVar127;
                            auVar138 = auVar127;
                          }
                        }
                        else {
                          auVar127 = pauVar39[0xb];
                          auVar128 = pauVar39[10];
                          auVar129 = pauVar39[9];
                          auVar130 = pauVar39[8];
                          auVar131 = pauVar39[7];
                          auVar132 = pauVar39[6];
                          auVar133 = pauVar39[5];
                          auVar134 = pauVar39[4];
                          auVar135 = pauVar39[3];
                          auVar136 = pauVar39[2];
                          auVar137 = pauVar39[1];
                          auVar138 = *pauVar39;
                        }
                        pauVar65 = pauVar53;
                        pauVar49 = pauVar55;
                        iVar67 = iVar35;
                        if (0 < iVar35) {
                          do {
                            auVar139 = *pauVar65;
                            uVar171 = *(undefined4 *)*pauVar49;
                            auVar140._4_4_ = uVar171;
                            auVar140._0_4_ = uVar171;
                            auVar140._8_4_ = uVar171;
                            auVar140._12_4_ = uVar171;
                            auVar140._16_4_ = uVar171;
                            auVar140._20_4_ = uVar171;
                            auVar140._24_4_ = uVar171;
                            auVar140._28_4_ = uVar171;
                            auVar140._32_4_ = uVar171;
                            auVar140._36_4_ = uVar171;
                            auVar140._40_4_ = uVar171;
                            auVar140._44_4_ = uVar171;
                            auVar140._48_4_ = uVar171;
                            auVar140._52_4_ = uVar171;
                            auVar140._56_4_ = uVar171;
                            auVar140._60_4_ = uVar171;
                            auVar138 = vfmadd231ps_avx512f(auVar138,auVar139,auVar140);
                            uVar171 = *(undefined4 *)(*pauVar49 + 4);
                            auVar141._4_4_ = uVar171;
                            auVar141._0_4_ = uVar171;
                            auVar141._8_4_ = uVar171;
                            auVar141._12_4_ = uVar171;
                            auVar141._16_4_ = uVar171;
                            auVar141._20_4_ = uVar171;
                            auVar141._24_4_ = uVar171;
                            auVar141._28_4_ = uVar171;
                            auVar141._32_4_ = uVar171;
                            auVar141._36_4_ = uVar171;
                            auVar141._40_4_ = uVar171;
                            auVar141._44_4_ = uVar171;
                            auVar141._48_4_ = uVar171;
                            auVar141._52_4_ = uVar171;
                            auVar141._56_4_ = uVar171;
                            auVar141._60_4_ = uVar171;
                            auVar137 = vfmadd231ps_avx512f(auVar137,auVar139,auVar141);
                            uVar171 = *(undefined4 *)(*pauVar49 + 8);
                            auVar142._4_4_ = uVar171;
                            auVar142._0_4_ = uVar171;
                            auVar142._8_4_ = uVar171;
                            auVar142._12_4_ = uVar171;
                            auVar142._16_4_ = uVar171;
                            auVar142._20_4_ = uVar171;
                            auVar142._24_4_ = uVar171;
                            auVar142._28_4_ = uVar171;
                            auVar142._32_4_ = uVar171;
                            auVar142._36_4_ = uVar171;
                            auVar142._40_4_ = uVar171;
                            auVar142._44_4_ = uVar171;
                            auVar142._48_4_ = uVar171;
                            auVar142._52_4_ = uVar171;
                            auVar142._56_4_ = uVar171;
                            auVar142._60_4_ = uVar171;
                            auVar136 = vfmadd231ps_avx512f(auVar136,auVar139,auVar142);
                            uVar171 = *(undefined4 *)(*pauVar49 + 0xc);
                            auVar143._4_4_ = uVar171;
                            auVar143._0_4_ = uVar171;
                            auVar143._8_4_ = uVar171;
                            auVar143._12_4_ = uVar171;
                            auVar143._16_4_ = uVar171;
                            auVar143._20_4_ = uVar171;
                            auVar143._24_4_ = uVar171;
                            auVar143._28_4_ = uVar171;
                            auVar143._32_4_ = uVar171;
                            auVar143._36_4_ = uVar171;
                            auVar143._40_4_ = uVar171;
                            auVar143._44_4_ = uVar171;
                            auVar143._48_4_ = uVar171;
                            auVar143._52_4_ = uVar171;
                            auVar143._56_4_ = uVar171;
                            auVar143._60_4_ = uVar171;
                            auVar135 = vfmadd231ps_avx512f(auVar135,auVar139,auVar143);
                            uVar171 = *(undefined4 *)pauVar49[1];
                            auVar144._4_4_ = uVar171;
                            auVar144._0_4_ = uVar171;
                            auVar144._8_4_ = uVar171;
                            auVar144._12_4_ = uVar171;
                            auVar144._16_4_ = uVar171;
                            auVar144._20_4_ = uVar171;
                            auVar144._24_4_ = uVar171;
                            auVar144._28_4_ = uVar171;
                            auVar144._32_4_ = uVar171;
                            auVar144._36_4_ = uVar171;
                            auVar144._40_4_ = uVar171;
                            auVar144._44_4_ = uVar171;
                            auVar144._48_4_ = uVar171;
                            auVar144._52_4_ = uVar171;
                            auVar144._56_4_ = uVar171;
                            auVar144._60_4_ = uVar171;
                            auVar134 = vfmadd231ps_avx512f(auVar134,auVar139,auVar144);
                            uVar171 = *(undefined4 *)(pauVar49[1] + 4);
                            auVar145._4_4_ = uVar171;
                            auVar145._0_4_ = uVar171;
                            auVar145._8_4_ = uVar171;
                            auVar145._12_4_ = uVar171;
                            auVar145._16_4_ = uVar171;
                            auVar145._20_4_ = uVar171;
                            auVar145._24_4_ = uVar171;
                            auVar145._28_4_ = uVar171;
                            auVar145._32_4_ = uVar171;
                            auVar145._36_4_ = uVar171;
                            auVar145._40_4_ = uVar171;
                            auVar145._44_4_ = uVar171;
                            auVar145._48_4_ = uVar171;
                            auVar145._52_4_ = uVar171;
                            auVar145._56_4_ = uVar171;
                            auVar145._60_4_ = uVar171;
                            auVar133 = vfmadd231ps_avx512f(auVar133,auVar139,auVar145);
                            uVar171 = *(undefined4 *)(pauVar49[1] + 8);
                            auVar146._4_4_ = uVar171;
                            auVar146._0_4_ = uVar171;
                            auVar146._8_4_ = uVar171;
                            auVar146._12_4_ = uVar171;
                            auVar146._16_4_ = uVar171;
                            auVar146._20_4_ = uVar171;
                            auVar146._24_4_ = uVar171;
                            auVar146._28_4_ = uVar171;
                            auVar146._32_4_ = uVar171;
                            auVar146._36_4_ = uVar171;
                            auVar146._40_4_ = uVar171;
                            auVar146._44_4_ = uVar171;
                            auVar146._48_4_ = uVar171;
                            auVar146._52_4_ = uVar171;
                            auVar146._56_4_ = uVar171;
                            auVar146._60_4_ = uVar171;
                            auVar132 = vfmadd231ps_avx512f(auVar132,auVar139,auVar146);
                            uVar171 = *(undefined4 *)(pauVar49[1] + 0xc);
                            auVar147._4_4_ = uVar171;
                            auVar147._0_4_ = uVar171;
                            auVar147._8_4_ = uVar171;
                            auVar147._12_4_ = uVar171;
                            auVar147._16_4_ = uVar171;
                            auVar147._20_4_ = uVar171;
                            auVar147._24_4_ = uVar171;
                            auVar147._28_4_ = uVar171;
                            auVar147._32_4_ = uVar171;
                            auVar147._36_4_ = uVar171;
                            auVar147._40_4_ = uVar171;
                            auVar147._44_4_ = uVar171;
                            auVar147._48_4_ = uVar171;
                            auVar147._52_4_ = uVar171;
                            auVar147._56_4_ = uVar171;
                            auVar147._60_4_ = uVar171;
                            auVar131 = vfmadd231ps_avx512f(auVar131,auVar139,auVar147);
                            uVar171 = *(undefined4 *)pauVar49[2];
                            auVar148._4_4_ = uVar171;
                            auVar148._0_4_ = uVar171;
                            auVar148._8_4_ = uVar171;
                            auVar148._12_4_ = uVar171;
                            auVar148._16_4_ = uVar171;
                            auVar148._20_4_ = uVar171;
                            auVar148._24_4_ = uVar171;
                            auVar148._28_4_ = uVar171;
                            auVar148._32_4_ = uVar171;
                            auVar148._36_4_ = uVar171;
                            auVar148._40_4_ = uVar171;
                            auVar148._44_4_ = uVar171;
                            auVar148._48_4_ = uVar171;
                            auVar148._52_4_ = uVar171;
                            auVar148._56_4_ = uVar171;
                            auVar148._60_4_ = uVar171;
                            auVar130 = vfmadd231ps_avx512f(auVar130,auVar139,auVar148);
                            uVar171 = *(undefined4 *)(pauVar49[2] + 4);
                            auVar149._4_4_ = uVar171;
                            auVar149._0_4_ = uVar171;
                            auVar149._8_4_ = uVar171;
                            auVar149._12_4_ = uVar171;
                            auVar149._16_4_ = uVar171;
                            auVar149._20_4_ = uVar171;
                            auVar149._24_4_ = uVar171;
                            auVar149._28_4_ = uVar171;
                            auVar149._32_4_ = uVar171;
                            auVar149._36_4_ = uVar171;
                            auVar149._40_4_ = uVar171;
                            auVar149._44_4_ = uVar171;
                            auVar149._48_4_ = uVar171;
                            auVar149._52_4_ = uVar171;
                            auVar149._56_4_ = uVar171;
                            auVar149._60_4_ = uVar171;
                            auVar129 = vfmadd231ps_avx512f(auVar129,auVar139,auVar149);
                            uVar171 = *(undefined4 *)(pauVar49[2] + 8);
                            auVar150._4_4_ = uVar171;
                            auVar150._0_4_ = uVar171;
                            auVar150._8_4_ = uVar171;
                            auVar150._12_4_ = uVar171;
                            auVar150._16_4_ = uVar171;
                            auVar150._20_4_ = uVar171;
                            auVar150._24_4_ = uVar171;
                            auVar150._28_4_ = uVar171;
                            auVar150._32_4_ = uVar171;
                            auVar150._36_4_ = uVar171;
                            auVar150._40_4_ = uVar171;
                            auVar150._44_4_ = uVar171;
                            auVar150._48_4_ = uVar171;
                            auVar150._52_4_ = uVar171;
                            auVar150._56_4_ = uVar171;
                            auVar150._60_4_ = uVar171;
                            auVar128 = vfmadd231ps_avx512f(auVar128,auVar139,auVar150);
                            uVar171 = *(undefined4 *)(pauVar49[2] + 0xc);
                            auVar30._4_4_ = uVar171;
                            auVar30._0_4_ = uVar171;
                            auVar30._8_4_ = uVar171;
                            auVar30._12_4_ = uVar171;
                            auVar30._16_4_ = uVar171;
                            auVar30._20_4_ = uVar171;
                            auVar30._24_4_ = uVar171;
                            auVar30._28_4_ = uVar171;
                            auVar30._32_4_ = uVar171;
                            auVar30._36_4_ = uVar171;
                            auVar30._40_4_ = uVar171;
                            auVar30._44_4_ = uVar171;
                            auVar30._48_4_ = uVar171;
                            auVar30._52_4_ = uVar171;
                            auVar30._56_4_ = uVar171;
                            auVar30._60_4_ = uVar171;
                            auVar127 = vfmadd231ps_avx512f(auVar127,auVar139,auVar30);
                            iVar67 = iVar67 + -1;
                            pauVar65 = pauVar65 + 1;
                            pauVar49 = pauVar49 + 3;
                          } while (iVar67 != 0);
                          pauVar55 = pauVar55 + uVar46 * 3 + 3;
                        }
                        if (iVar44 < K) {
                          *pauVar39 = auVar138;
                          pauVar39[1] = auVar137;
                          pauVar39[2] = auVar136;
                          pauVar39[3] = auVar135;
                          pauVar39[4] = auVar134;
                          pauVar39[5] = auVar133;
                          pauVar39[6] = auVar132;
                          pauVar39[7] = auVar131;
                          pauVar39[8] = auVar130;
                          pauVar39[9] = auVar129;
                          pauVar39[10] = auVar128;
                          pauVar39[0xb] = auVar127;
                        }
                        else {
                          if (iVar69 == 0x10) {
                            *pauVar57 = auVar138;
                            pauVar57[1] = auVar137;
                            pauVar57[2] = auVar136;
                            pauVar57[3] = auVar135;
                            pauVar57[4] = auVar134;
                            pauVar57[5] = auVar133;
                            pauVar57[6] = auVar132;
                            pauVar57[7] = auVar131;
                            pauVar57[8] = auVar130;
                            pauVar57[9] = auVar129;
                            pauVar57[10] = auVar128;
                            pauVar57[0xb] = auVar127;
                            pauVar57 = pauVar57 + 0xc;
                          }
                          if (iVar69 == 8) {
                            auVar139 = vinsertf64x4_avx512f(auVar138,auVar137._0_32_,1);
                            auVar140 = vinsertf64x4_avx512f(auVar136,auVar135._0_32_,1);
                            auVar141 = vinsertf64x4_avx512f(auVar134,auVar133._0_32_,1);
                            auVar142 = vinsertf64x4_avx512f(auVar132,auVar131._0_32_,1);
                            auVar143 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                            auVar144 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                            auVar145 = vshuff64x2_avx512f(auVar138,auVar137,0xee);
                            auVar146 = vshuff64x2_avx512f(auVar136,auVar135,0xee);
                            auVar147 = vshuff64x2_avx512f(auVar134,auVar133,0xee);
                            auVar148 = vshuff64x2_avx512f(auVar132,auVar131,0xee);
                            auVar149 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                            auVar150 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                            *pauVar57 = auVar139;
                            pauVar57[1] = auVar140;
                            pauVar57[2] = auVar141;
                            pauVar57[3] = auVar142;
                            pauVar57[4] = auVar143;
                            pauVar57[5] = auVar144;
                            *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar145;
                            *(undefined1 (*) [64])(pauVar57[1] + lVar62 * 4) = auVar146;
                            *(undefined1 (*) [64])(pauVar57[2] + lVar62 * 4) = auVar147;
                            *(undefined1 (*) [64])(pauVar57[3] + lVar62 * 4) = auVar148;
                            *(undefined1 (*) [64])(pauVar57[4] + lVar62 * 4) = auVar149;
                            *(undefined1 (*) [64])(pauVar57[5] + lVar62 * 4) = auVar150;
                            pauVar57 = pauVar57 + 6;
                          }
                          if (iVar69 == 4) {
                            auVar139 = vinsertf64x4_avx512f(auVar138,auVar137._0_32_,1);
                            auVar140 = vinsertf64x4_avx512f(auVar136,auVar135._0_32_,1);
                            auVar141 = vshuff64x2_avx512f(auVar138,auVar137,0xee);
                            auVar135 = vshuff64x2_avx512f(auVar136,auVar135,0xee);
                            auVar142 = vinsertf64x4_avx512f(auVar134,auVar133._0_32_,1);
                            auVar143 = vinsertf64x4_avx512f(auVar132,auVar131._0_32_,1);
                            auVar144 = vshuff64x2_avx512f(auVar134,auVar133,0xee);
                            auVar131 = vshuff64x2_avx512f(auVar132,auVar131,0xee);
                            auVar145 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                            auVar146 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                            auVar147 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                            auVar127 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                            auVar138 = vshuff64x2_avx512f(auVar139,auVar140,0x88);
                            auVar137 = vshuff64x2_avx512f(auVar139,auVar140,0xdd);
                            auVar136 = vshuff64x2_avx512f(auVar141,auVar135,0x88);
                            auVar135 = vshuff64x2_avx512f(auVar141,auVar135,0xdd);
                            auVar134 = vshuff64x2_avx512f(auVar142,auVar143,0x88);
                            auVar133 = vshuff64x2_avx512f(auVar142,auVar143,0xdd);
                            auVar132 = vshuff64x2_avx512f(auVar144,auVar131,0x88);
                            auVar131 = vshuff64x2_avx512f(auVar144,auVar131,0xdd);
                            auVar130 = vshuff64x2_avx512f(auVar145,auVar146,0x88);
                            auVar129 = vshuff64x2_avx512f(auVar145,auVar146,0xdd);
                            auVar128 = vshuff64x2_avx512f(auVar147,auVar127,0x88);
                            auVar127 = vshuff64x2_avx512f(auVar147,auVar127,0xdd);
                            *pauVar57 = auVar138;
                            pauVar57[1] = auVar134;
                            pauVar57[2] = auVar130;
                            *(undefined1 (*) [64])(*pauVar57 + lVar78 * 4) = auVar137;
                            *(undefined1 (*) [64])(pauVar57[1] + lVar78 * 4) = auVar133;
                            *(undefined1 (*) [64])(pauVar57[2] + lVar78 * 4) = auVar129;
                            *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar136;
                            *(undefined1 (*) [64])(pauVar57[1] + lVar62 * 4) = auVar132;
                            *(undefined1 (*) [64])(pauVar57[2] + lVar62 * 4) = auVar128;
                            *(undefined1 (*) [64])(*pauVar57 + lVar42 * 4) = auVar135;
                            *(undefined1 (*) [64])(pauVar57[1] + lVar42 * 4) = auVar131;
                            *(undefined1 (*) [64])(pauVar57[2] + lVar42 * 4) = auVar127;
                            pauVar57 = pauVar57 + 3;
                          }
                          if (iVar69 == 1) {
                            auVar139 = vunpcklps_avx512f(auVar138,auVar137);
                            auVar137 = vunpckhps_avx512f(auVar138,auVar137);
                            auVar138 = vunpcklps_avx512f(auVar136,auVar135);
                            auVar135 = vunpckhps_avx512f(auVar136,auVar135);
                            auVar136 = vunpcklps_avx512f(auVar134,auVar133);
                            auVar133 = vunpckhps_avx512f(auVar134,auVar133);
                            auVar134 = vunpcklps_avx512f(auVar132,auVar131);
                            auVar131 = vunpckhps_avx512f(auVar132,auVar131);
                            auVar132 = vunpcklps_avx512f(auVar130,auVar129);
                            auVar129 = vunpckhps_avx512f(auVar130,auVar129);
                            auVar130 = vunpcklps_avx512f(auVar128,auVar127);
                            auVar127 = vunpckhps_avx512f(auVar128,auVar127);
                            auVar128 = vunpcklpd_avx512f(auVar139,auVar138);
                            auVar138 = vunpckhpd_avx512f(auVar139,auVar138);
                            auVar139 = vunpcklpd_avx512f(auVar137,auVar135);
                            auVar135 = vunpckhpd_avx512f(auVar137,auVar135);
                            auVar137 = vunpcklpd_avx512f(auVar136,auVar134);
                            auVar134 = vunpckhpd_avx512f(auVar136,auVar134);
                            auVar136 = vunpcklpd_avx512f(auVar133,auVar131);
                            auVar131 = vunpckhpd_avx512f(auVar133,auVar131);
                            auVar133 = vunpcklpd_avx512f(auVar132,auVar130);
                            auVar130 = vunpckhpd_avx512f(auVar132,auVar130);
                            auVar132 = vunpcklpd_avx512f(auVar129,auVar127);
                            auVar127 = vunpckhpd_avx512f(auVar129,auVar127);
                            auVar129 = vshuff64x2_avx512f(auVar128,auVar137,0x88);
                            auVar140 = vshuff64x2_avx512f(auVar133,auVar138,0x88);
                            auVar141 = vshuff64x2_avx512f(auVar134,auVar130,0x88);
                            auVar142 = vshuff64x2_avx512f(auVar139,auVar136,0x88);
                            auVar143 = vshuff64x2_avx512f(auVar132,auVar135,0x88);
                            auVar144 = vshuff64x2_avx512f(auVar131,auVar127,0x88);
                            auVar128 = vshuff64x2_avx512f(auVar128,auVar137,0xdd);
                            auVar137 = vshuff64x2_avx512f(auVar133,auVar138,0xdd);
                            auVar130 = vshuff64x2_avx512f(auVar134,auVar130,0xdd);
                            auVar134 = vshuff64x2_avx512f(auVar139,auVar136,0xdd);
                            auVar136 = vshuff64x2_avx512f(auVar132,auVar135,0xdd);
                            auVar127 = vshuff64x2_avx512f(auVar131,auVar127,0xdd);
                            auVar131 = vshuff64x2_avx512f(auVar129,auVar140,0x88);
                            auVar139 = vshuff64x2_avx512f(auVar141,auVar142,0x88);
                            auVar145 = vshuff64x2_avx512f(auVar143,auVar144,0x88);
                            auVar146 = vshuff64x2_avx512f(auVar128,auVar137,0x88);
                            auVar147 = vshuff64x2_avx512f(auVar130,auVar134,0x88);
                            auVar148 = vshuff64x2_avx512f(auVar136,auVar127,0x88);
                            auVar129 = vshuff64x2_avx512f(auVar129,auVar140,0xdd);
                            auVar140 = vshuff64x2_avx512f(auVar141,auVar142,0xdd);
                            auVar141 = vshuff64x2_avx512f(auVar143,auVar144,0xdd);
                            auVar128 = vshuff64x2_avx512f(auVar128,auVar137,0xdd);
                            auVar130 = vshuff64x2_avx512f(auVar130,auVar134,0xdd);
                            auVar127 = vshuff64x2_avx512f(auVar136,auVar127,0xdd);
                            *(undefined1 (*) [32])*pauVar57 = auVar131._0_32_;
                            *(undefined1 (*) [16])(*pauVar57 + 0x20) = auVar133._0_16_;
                            *(undefined1 (*) [16])(*pauVar57 + lVar40 * 4) = auVar138._0_16_;
                            *(undefined1 (*) [32])(*pauVar57 + lVar40 * 4 + 0x10) = auVar139._0_32_;
                            auVar109 = vextractf64x4_avx512f(auVar139,1);
                            *(undefined1 (*) [32])(*pauVar57 + lVar77 * 4) = auVar109;
                            *(undefined1 (*) [16])(*pauVar57 + lVar77 * 4 + 0x20) = auVar132._0_16_;
                            *(undefined1 (*) [16])(*pauVar57 + lVar63 * 4) = auVar135._0_16_;
                            auVar109 = vextractf64x4_avx512f(auVar145,1);
                            *(undefined1 (*) [32])(*pauVar57 + lVar63 * 4 + 0x10) = auVar109;
                            *(undefined1 (*) [32])(*pauVar57 + lVar78 * 4) = auVar146._0_32_;
                            auVar95 = vextractf32x4_avx512f(auVar133,1);
                            *(undefined1 (*) [16])(*pauVar57 + lVar78 * 4 + 0x10) = auVar95;
                            auVar95 = vextractf32x4_avx512f(auVar138,1);
                            *(undefined1 (*) [16])(*pauVar57 + lVar75 * 4) = auVar95;
                            *(undefined1 (*) [32])(*pauVar57 + lVar75 * 4 + 0x10) = auVar147._0_32_;
                            auVar109 = vextractf64x4_avx512f(auVar147,1);
                            *(undefined1 (*) [32])(*pauVar57 + lVar71 * 4) = auVar109;
                            auVar95 = vextractf32x4_avx512f(auVar132,1);
                            *(undefined1 (*) [16])(*pauVar57 + lVar71 * 4 + 0x10) = auVar95;
                            auVar95 = vextractf32x4_avx512f(auVar135,1);
                            *(undefined1 (*) [16])(*pauVar57 + lVar72 * 4) = auVar95;
                            auVar109 = vextractf64x4_avx512f(auVar148,1);
                            *(undefined1 (*) [32])(*pauVar57 + lVar72 * 4 + 0x10) = auVar109;
                            *(undefined1 (*) [32])(*pauVar57 + lVar62 * 4) = auVar129._0_32_;
                            auVar95 = vextractf32x4_avx512f(auVar133,2);
                            *(undefined1 (*) [16])(*pauVar57 + lVar62 * 4 + 0x10) = auVar95;
                            auVar95 = vextractf32x4_avx512f(auVar138,2);
                            *(undefined1 (*) [16])(*pauVar57 + lVar45 * 4) = auVar95;
                            *(undefined1 (*) [32])(*pauVar57 + lVar45 * 4 + 0x10) = auVar140._0_32_;
                            auVar109 = vextractf64x4_avx512f(auVar140,1);
                            *(undefined1 (*) [32])(*pauVar57 + local_288 * 4) = auVar109;
                            auVar95 = vextractf32x4_avx512f(auVar132,2);
                            *(undefined1 (*) [16])(*pauVar57 + local_288 * 4 + 0x10) = auVar95;
                            auVar95 = vextractf32x4_avx512f(auVar135,2);
                            *(undefined1 (*) [16])(*pauVar57 + local_268 * 4) = auVar95;
                            auVar109 = vextractf64x4_avx512f(auVar141,1);
                            *(undefined1 (*) [32])(*pauVar57 + local_268 * 4 + 0x10) = auVar109;
                            *(undefined1 (*) [32])(*pauVar57 + lVar42 * 4) = auVar128._0_32_;
                            auVar95 = vextractf32x4_avx512f(auVar133,3);
                            *(undefined1 (*) [16])(*pauVar57 + lVar42 * 4 + 0x10) = auVar95;
                            auVar95 = vextractf32x4_avx512f(auVar138,3);
                            *(undefined1 (*) [16])(*pauVar57 + local_270 * 4) = auVar95;
                            *(undefined1 (*) [32])(*pauVar57 + local_270 * 4 + 0x10) =
                                 auVar130._0_32_;
                            auVar109 = vextractf64x4_avx512f(auVar130,1);
                            *(undefined1 (*) [32])(*pauVar57 + local_278 * 4) = auVar109;
                            auVar95 = vextractf32x4_avx512f(auVar132,3);
                            *(undefined1 (*) [16])(*pauVar57 + local_278 * 4 + 0x10) = auVar95;
                            auVar95 = vextractf32x4_avx512f(auVar135,3);
                            *(undefined1 (*) [16])(*pauVar57 + local_290 * 4) = auVar95;
                            auVar109 = vextractf64x4_avx512f(auVar127,1);
                            *(undefined1 (*) [32])(*pauVar57 + local_290 * 4 + 0x10) = auVar109;
                            pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x30);
                          }
                        }
                        pauVar39 = pauVar39 + 0xc;
                        uVar80 = uVar52 + 0xc;
                        iVar67 = uVar52 + 0x17;
                        uVar52 = uVar80;
                      } while (iVar67 < (int)uVar76);
                    }
                    iVar67 = uVar80 + 7;
                    while (iVar67 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT864(0) << 0x40;
                          auVar128 = ZEXT864(0) << 0x40;
                          auVar129 = ZEXT864(0) << 0x40;
                          auVar130 = ZEXT864(0) << 0x40;
                          auVar131 = ZEXT864(0) << 0x40;
                          auVar132 = ZEXT864(0) << 0x40;
                          auVar133 = ZEXT864(0) << 0x40;
                          auVar134 = ZEXT864(0) << 0x40;
                        }
                        else {
                          auVar127 = *pauVar41;
                          auVar128 = auVar127;
                          auVar129 = auVar127;
                          auVar130 = auVar127;
                          auVar131 = auVar127;
                          auVar132 = auVar127;
                          auVar133 = auVar127;
                          auVar134 = auVar127;
                        }
                      }
                      else {
                        auVar127 = pauVar39[7];
                        auVar128 = pauVar39[6];
                        auVar129 = pauVar39[5];
                        auVar130 = pauVar39[4];
                        auVar131 = pauVar39[3];
                        auVar132 = pauVar39[2];
                        auVar133 = pauVar39[1];
                        auVar134 = *pauVar39;
                      }
                      if (0 < iVar35) {
                        lVar64 = 0;
                        iVar67 = iVar35;
                        do {
                          auVar135 = *(undefined1 (*) [64])(*pauVar53 + lVar64 * 2);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64);
                          auVar136._4_4_ = uVar171;
                          auVar136._0_4_ = uVar171;
                          auVar136._8_4_ = uVar171;
                          auVar136._12_4_ = uVar171;
                          auVar136._16_4_ = uVar171;
                          auVar136._20_4_ = uVar171;
                          auVar136._24_4_ = uVar171;
                          auVar136._28_4_ = uVar171;
                          auVar136._32_4_ = uVar171;
                          auVar136._36_4_ = uVar171;
                          auVar136._40_4_ = uVar171;
                          auVar136._44_4_ = uVar171;
                          auVar136._48_4_ = uVar171;
                          auVar136._52_4_ = uVar171;
                          auVar136._56_4_ = uVar171;
                          auVar136._60_4_ = uVar171;
                          auVar134 = vfmadd231ps_avx512f(auVar134,auVar135,auVar136);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 4);
                          auVar137._4_4_ = uVar171;
                          auVar137._0_4_ = uVar171;
                          auVar137._8_4_ = uVar171;
                          auVar137._12_4_ = uVar171;
                          auVar137._16_4_ = uVar171;
                          auVar137._20_4_ = uVar171;
                          auVar137._24_4_ = uVar171;
                          auVar137._28_4_ = uVar171;
                          auVar137._32_4_ = uVar171;
                          auVar137._36_4_ = uVar171;
                          auVar137._40_4_ = uVar171;
                          auVar137._44_4_ = uVar171;
                          auVar137._48_4_ = uVar171;
                          auVar137._52_4_ = uVar171;
                          auVar137._56_4_ = uVar171;
                          auVar137._60_4_ = uVar171;
                          auVar133 = vfmadd231ps_avx512f(auVar133,auVar135,auVar137);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 8);
                          auVar138._4_4_ = uVar171;
                          auVar138._0_4_ = uVar171;
                          auVar138._8_4_ = uVar171;
                          auVar138._12_4_ = uVar171;
                          auVar138._16_4_ = uVar171;
                          auVar138._20_4_ = uVar171;
                          auVar138._24_4_ = uVar171;
                          auVar138._28_4_ = uVar171;
                          auVar138._32_4_ = uVar171;
                          auVar138._36_4_ = uVar171;
                          auVar138._40_4_ = uVar171;
                          auVar138._44_4_ = uVar171;
                          auVar138._48_4_ = uVar171;
                          auVar138._52_4_ = uVar171;
                          auVar138._56_4_ = uVar171;
                          auVar138._60_4_ = uVar171;
                          auVar132 = vfmadd231ps_avx512f(auVar132,auVar135,auVar138);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 0xc);
                          auVar139._4_4_ = uVar171;
                          auVar139._0_4_ = uVar171;
                          auVar139._8_4_ = uVar171;
                          auVar139._12_4_ = uVar171;
                          auVar139._16_4_ = uVar171;
                          auVar139._20_4_ = uVar171;
                          auVar139._24_4_ = uVar171;
                          auVar139._28_4_ = uVar171;
                          auVar139._32_4_ = uVar171;
                          auVar139._36_4_ = uVar171;
                          auVar139._40_4_ = uVar171;
                          auVar139._44_4_ = uVar171;
                          auVar139._48_4_ = uVar171;
                          auVar139._52_4_ = uVar171;
                          auVar139._56_4_ = uVar171;
                          auVar139._60_4_ = uVar171;
                          auVar131 = vfmadd231ps_avx512f(auVar131,auVar135,auVar139);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar64);
                          auVar31._4_4_ = uVar171;
                          auVar31._0_4_ = uVar171;
                          auVar31._8_4_ = uVar171;
                          auVar31._12_4_ = uVar171;
                          auVar31._16_4_ = uVar171;
                          auVar31._20_4_ = uVar171;
                          auVar31._24_4_ = uVar171;
                          auVar31._28_4_ = uVar171;
                          auVar31._32_4_ = uVar171;
                          auVar31._36_4_ = uVar171;
                          auVar31._40_4_ = uVar171;
                          auVar31._44_4_ = uVar171;
                          auVar31._48_4_ = uVar171;
                          auVar31._52_4_ = uVar171;
                          auVar31._56_4_ = uVar171;
                          auVar31._60_4_ = uVar171;
                          auVar130 = vfmadd231ps_avx512f(auVar130,auVar135,auVar31);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar64 + 4);
                          auVar32._4_4_ = uVar171;
                          auVar32._0_4_ = uVar171;
                          auVar32._8_4_ = uVar171;
                          auVar32._12_4_ = uVar171;
                          auVar32._16_4_ = uVar171;
                          auVar32._20_4_ = uVar171;
                          auVar32._24_4_ = uVar171;
                          auVar32._28_4_ = uVar171;
                          auVar32._32_4_ = uVar171;
                          auVar32._36_4_ = uVar171;
                          auVar32._40_4_ = uVar171;
                          auVar32._44_4_ = uVar171;
                          auVar32._48_4_ = uVar171;
                          auVar32._52_4_ = uVar171;
                          auVar32._56_4_ = uVar171;
                          auVar32._60_4_ = uVar171;
                          auVar129 = vfmadd231ps_avx512f(auVar129,auVar135,auVar32);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar64 + 8);
                          auVar33._4_4_ = uVar171;
                          auVar33._0_4_ = uVar171;
                          auVar33._8_4_ = uVar171;
                          auVar33._12_4_ = uVar171;
                          auVar33._16_4_ = uVar171;
                          auVar33._20_4_ = uVar171;
                          auVar33._24_4_ = uVar171;
                          auVar33._28_4_ = uVar171;
                          auVar33._32_4_ = uVar171;
                          auVar33._36_4_ = uVar171;
                          auVar33._40_4_ = uVar171;
                          auVar33._44_4_ = uVar171;
                          auVar33._48_4_ = uVar171;
                          auVar33._52_4_ = uVar171;
                          auVar33._56_4_ = uVar171;
                          auVar33._60_4_ = uVar171;
                          auVar128 = vfmadd231ps_avx512f(auVar128,auVar135,auVar33);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar64 + 0xc);
                          auVar34._4_4_ = uVar171;
                          auVar34._0_4_ = uVar171;
                          auVar34._8_4_ = uVar171;
                          auVar34._12_4_ = uVar171;
                          auVar34._16_4_ = uVar171;
                          auVar34._20_4_ = uVar171;
                          auVar34._24_4_ = uVar171;
                          auVar34._28_4_ = uVar171;
                          auVar34._32_4_ = uVar171;
                          auVar34._36_4_ = uVar171;
                          auVar34._40_4_ = uVar171;
                          auVar34._44_4_ = uVar171;
                          auVar34._48_4_ = uVar171;
                          auVar34._52_4_ = uVar171;
                          auVar34._56_4_ = uVar171;
                          auVar34._60_4_ = uVar171;
                          auVar127 = vfmadd231ps_avx512f(auVar127,auVar135,auVar34);
                          lVar64 = lVar64 + 0x20;
                          iVar67 = iVar67 + -1;
                        } while (iVar67 != 0);
                        pauVar55 = pauVar55 + uVar46 * 2 + 2;
                      }
                      if (iVar44 < K) {
                        *pauVar39 = auVar134;
                        pauVar39[1] = auVar133;
                        pauVar39[2] = auVar132;
                        pauVar39[3] = auVar131;
                        pauVar39[4] = auVar130;
                        pauVar39[5] = auVar129;
                        pauVar39[6] = auVar128;
                        pauVar39[7] = auVar127;
                      }
                      else {
                        if (iVar69 == 0x10) {
                          *pauVar57 = auVar134;
                          pauVar57[1] = auVar133;
                          pauVar57[2] = auVar132;
                          pauVar57[3] = auVar131;
                          pauVar57[4] = auVar130;
                          pauVar57[5] = auVar129;
                          pauVar57[6] = auVar128;
                          pauVar57[7] = auVar127;
                          pauVar57 = pauVar57 + 8;
                        }
                        if (iVar69 == 8) {
                          auVar135 = vinsertf64x4_avx512f(auVar134,auVar133._0_32_,1);
                          auVar136 = vinsertf64x4_avx512f(auVar132,auVar131._0_32_,1);
                          auVar137 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                          auVar138 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                          auVar139 = vshuff64x2_avx512f(auVar134,auVar133,0xee);
                          auVar140 = vshuff64x2_avx512f(auVar132,auVar131,0xee);
                          auVar141 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                          auVar142 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                          *pauVar57 = auVar135;
                          pauVar57[1] = auVar136;
                          pauVar57[2] = auVar137;
                          pauVar57[3] = auVar138;
                          *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar139;
                          *(undefined1 (*) [64])(pauVar57[1] + lVar62 * 4) = auVar140;
                          *(undefined1 (*) [64])(pauVar57[2] + lVar62 * 4) = auVar141;
                          *(undefined1 (*) [64])(pauVar57[3] + lVar62 * 4) = auVar142;
                          pauVar57 = pauVar57 + 4;
                        }
                        if (iVar69 == 4) {
                          auVar135 = vinsertf64x4_avx512f(auVar134,auVar133._0_32_,1);
                          auVar136 = vinsertf64x4_avx512f(auVar132,auVar131._0_32_,1);
                          auVar137 = vshuff64x2_avx512f(auVar134,auVar133,0xee);
                          auVar131 = vshuff64x2_avx512f(auVar132,auVar131,0xee);
                          auVar138 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                          auVar139 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                          auVar140 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                          auVar127 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                          auVar134 = vshuff64x2_avx512f(auVar135,auVar136,0x88);
                          auVar133 = vshuff64x2_avx512f(auVar135,auVar136,0xdd);
                          auVar132 = vshuff64x2_avx512f(auVar137,auVar131,0x88);
                          auVar131 = vshuff64x2_avx512f(auVar137,auVar131,0xdd);
                          auVar130 = vshuff64x2_avx512f(auVar138,auVar139,0x88);
                          auVar129 = vshuff64x2_avx512f(auVar138,auVar139,0xdd);
                          auVar128 = vshuff64x2_avx512f(auVar140,auVar127,0x88);
                          auVar127 = vshuff64x2_avx512f(auVar140,auVar127,0xdd);
                          *pauVar57 = auVar134;
                          pauVar57[1] = auVar130;
                          *(undefined1 (*) [64])(*pauVar57 + lVar78 * 4) = auVar133;
                          *(undefined1 (*) [64])(pauVar57[1] + lVar78 * 4) = auVar129;
                          *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar132;
                          *(undefined1 (*) [64])(pauVar57[1] + lVar62 * 4) = auVar128;
                          *(undefined1 (*) [64])(*pauVar57 + lVar42 * 4) = auVar131;
                          *(undefined1 (*) [64])(pauVar57[1] + lVar42 * 4) = auVar127;
                          pauVar57 = pauVar57 + 2;
                        }
                        if (iVar69 == 1) {
                          auVar135 = vunpcklps_avx512f(auVar134,auVar133);
                          auVar133 = vunpckhps_avx512f(auVar134,auVar133);
                          auVar134 = vunpcklps_avx512f(auVar132,auVar131);
                          auVar131 = vunpckhps_avx512f(auVar132,auVar131);
                          auVar132 = vunpcklps_avx512f(auVar130,auVar129);
                          auVar129 = vunpckhps_avx512f(auVar130,auVar129);
                          auVar130 = vunpcklps_avx512f(auVar128,auVar127);
                          auVar127 = vunpckhps_avx512f(auVar128,auVar127);
                          auVar128 = vunpcklpd_avx512f(auVar135,auVar134);
                          auVar134 = vunpckhpd_avx512f(auVar135,auVar134);
                          auVar135 = vunpcklpd_avx512f(auVar133,auVar131);
                          auVar131 = vunpckhpd_avx512f(auVar133,auVar131);
                          auVar133 = vunpcklpd_avx512f(auVar132,auVar130);
                          auVar130 = vunpckhpd_avx512f(auVar132,auVar130);
                          auVar132 = vunpcklpd_avx512f(auVar129,auVar127);
                          auVar127 = vunpckhpd_avx512f(auVar129,auVar127);
                          auVar129 = vshuff64x2_avx512f(auVar128,auVar133,0x88);
                          auVar136 = vshuff64x2_avx512f(auVar134,auVar130,0x88);
                          auVar137 = vshuff64x2_avx512f(auVar135,auVar132,0x88);
                          auVar138 = vshuff64x2_avx512f(auVar131,auVar127,0x88);
                          auVar128 = vshuff64x2_avx512f(auVar128,auVar133,0xdd);
                          auVar130 = vshuff64x2_avx512f(auVar134,auVar130,0xdd);
                          auVar132 = vshuff64x2_avx512f(auVar135,auVar132,0xdd);
                          auVar127 = vshuff64x2_avx512f(auVar131,auVar127,0xdd);
                          auVar131 = vshuff64x2_avx512f(auVar129,auVar136,0x88);
                          auVar133 = vshuff64x2_avx512f(auVar137,auVar138,0x88);
                          auVar134 = vshuff64x2_avx512f(auVar128,auVar130,0x88);
                          auVar135 = vshuff64x2_avx512f(auVar132,auVar127,0x88);
                          auVar129 = vshuff64x2_avx512f(auVar129,auVar136,0xdd);
                          auVar136 = vshuff64x2_avx512f(auVar137,auVar138,0xdd);
                          auVar128 = vshuff64x2_avx512f(auVar128,auVar130,0xdd);
                          auVar127 = vshuff64x2_avx512f(auVar132,auVar127,0xdd);
                          *(undefined1 (*) [32])*pauVar57 = auVar131._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar131,1);
                          *(undefined1 (*) [32])(*pauVar57 + lVar40 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + lVar77 * 4) = auVar133._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar133,1);
                          *(undefined1 (*) [32])(*pauVar57 + lVar63 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + lVar78 * 4) = auVar134._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar134,1);
                          *(undefined1 (*) [32])(*pauVar57 + lVar75 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + lVar71 * 4) = auVar135._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar135,1);
                          *(undefined1 (*) [32])(*pauVar57 + lVar72 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + lVar62 * 4) = auVar129._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar129,1);
                          *(undefined1 (*) [32])(*pauVar57 + lVar45 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + local_288 * 4) = auVar136._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar136,1);
                          *(undefined1 (*) [32])(*pauVar57 + local_268 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + lVar42 * 4) = auVar128._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar128,1);
                          *(undefined1 (*) [32])(*pauVar57 + local_270 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar57 + local_278 * 4) = auVar127._0_32_;
                          auVar109 = vextractf64x4_avx512f(auVar127,1);
                          *(undefined1 (*) [32])(*pauVar57 + local_290 * 4) = auVar109;
                          pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x20);
                        }
                      }
                      pauVar39 = pauVar39 + 8;
                      iVar67 = uVar80 + 0xf;
                      uVar80 = uVar80 + 8;
                    }
                    uVar52 = uVar80 | 3;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT864(0) << 0x40;
                          auVar128 = ZEXT864(0) << 0x40;
                          auVar129 = ZEXT864(0) << 0x40;
                          auVar130 = ZEXT864(0) << 0x40;
                        }
                        else {
                          auVar127 = *pauVar41;
                          auVar128 = auVar127;
                          auVar129 = auVar127;
                          auVar130 = auVar127;
                        }
                      }
                      else {
                        auVar127 = pauVar39[3];
                        auVar128 = pauVar39[2];
                        auVar129 = pauVar39[1];
                        auVar130 = *pauVar39;
                      }
                      if (0 < iVar35) {
                        lVar64 = 0;
                        iVar67 = iVar35;
                        do {
                          auVar131 = *(undefined1 (*) [64])(*pauVar53 + lVar64 * 4);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64);
                          auVar132._4_4_ = uVar171;
                          auVar132._0_4_ = uVar171;
                          auVar132._8_4_ = uVar171;
                          auVar132._12_4_ = uVar171;
                          auVar132._16_4_ = uVar171;
                          auVar132._20_4_ = uVar171;
                          auVar132._24_4_ = uVar171;
                          auVar132._28_4_ = uVar171;
                          auVar132._32_4_ = uVar171;
                          auVar132._36_4_ = uVar171;
                          auVar132._40_4_ = uVar171;
                          auVar132._44_4_ = uVar171;
                          auVar132._48_4_ = uVar171;
                          auVar132._52_4_ = uVar171;
                          auVar132._56_4_ = uVar171;
                          auVar132._60_4_ = uVar171;
                          auVar130 = vfmadd231ps_avx512f(auVar130,auVar131,auVar132);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 4);
                          auVar133._4_4_ = uVar171;
                          auVar133._0_4_ = uVar171;
                          auVar133._8_4_ = uVar171;
                          auVar133._12_4_ = uVar171;
                          auVar133._16_4_ = uVar171;
                          auVar133._20_4_ = uVar171;
                          auVar133._24_4_ = uVar171;
                          auVar133._28_4_ = uVar171;
                          auVar133._32_4_ = uVar171;
                          auVar133._36_4_ = uVar171;
                          auVar133._40_4_ = uVar171;
                          auVar133._44_4_ = uVar171;
                          auVar133._48_4_ = uVar171;
                          auVar133._52_4_ = uVar171;
                          auVar133._56_4_ = uVar171;
                          auVar133._60_4_ = uVar171;
                          auVar129 = vfmadd231ps_avx512f(auVar129,auVar131,auVar133);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 8);
                          auVar134._4_4_ = uVar171;
                          auVar134._0_4_ = uVar171;
                          auVar134._8_4_ = uVar171;
                          auVar134._12_4_ = uVar171;
                          auVar134._16_4_ = uVar171;
                          auVar134._20_4_ = uVar171;
                          auVar134._24_4_ = uVar171;
                          auVar134._28_4_ = uVar171;
                          auVar134._32_4_ = uVar171;
                          auVar134._36_4_ = uVar171;
                          auVar134._40_4_ = uVar171;
                          auVar134._44_4_ = uVar171;
                          auVar134._48_4_ = uVar171;
                          auVar134._52_4_ = uVar171;
                          auVar134._56_4_ = uVar171;
                          auVar134._60_4_ = uVar171;
                          auVar128 = vfmadd231ps_avx512f(auVar128,auVar131,auVar134);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 0xc);
                          auVar135._4_4_ = uVar171;
                          auVar135._0_4_ = uVar171;
                          auVar135._8_4_ = uVar171;
                          auVar135._12_4_ = uVar171;
                          auVar135._16_4_ = uVar171;
                          auVar135._20_4_ = uVar171;
                          auVar135._24_4_ = uVar171;
                          auVar135._28_4_ = uVar171;
                          auVar135._32_4_ = uVar171;
                          auVar135._36_4_ = uVar171;
                          auVar135._40_4_ = uVar171;
                          auVar135._44_4_ = uVar171;
                          auVar135._48_4_ = uVar171;
                          auVar135._52_4_ = uVar171;
                          auVar135._56_4_ = uVar171;
                          auVar135._60_4_ = uVar171;
                          auVar127 = vfmadd231ps_avx512f(auVar127,auVar131,auVar135);
                          lVar64 = lVar64 + 0x10;
                          iVar67 = iVar67 + -1;
                        } while (iVar67 != 0);
                        pauVar55 = pauVar55 + uVar46 + 1;
                      }
                      if (iVar44 < K) {
                        *pauVar39 = auVar130;
                        pauVar39[1] = auVar129;
                        pauVar39[2] = auVar128;
                        pauVar39[3] = auVar127;
                      }
                      else {
                        if (iVar69 == 0x10) {
                          *pauVar57 = auVar130;
                          pauVar57[1] = auVar129;
                          pauVar57[2] = auVar128;
                          pauVar57[3] = auVar127;
                          pauVar57 = pauVar57 + 4;
                        }
                        if (iVar69 == 8) {
                          auVar131 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                          auVar132 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                          auVar133 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                          auVar134 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                          *pauVar57 = auVar131;
                          pauVar57[1] = auVar132;
                          *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar133;
                          *(undefined1 (*) [64])(pauVar57[1] + lVar62 * 4) = auVar134;
                          pauVar57 = pauVar57 + 2;
                        }
                        if (iVar69 == 4) {
                          auVar131 = vinsertf64x4_avx512f(auVar130,auVar129._0_32_,1);
                          auVar132 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                          auVar133 = vshuff64x2_avx512f(auVar130,auVar129,0xee);
                          auVar127 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                          auVar130 = vshuff64x2_avx512f(auVar131,auVar132,0x88);
                          auVar129 = vshuff64x2_avx512f(auVar131,auVar132,0xdd);
                          auVar128 = vshuff64x2_avx512f(auVar133,auVar127,0x88);
                          auVar127 = vshuff64x2_avx512f(auVar133,auVar127,0xdd);
                          *pauVar57 = auVar130;
                          *(undefined1 (*) [64])(*pauVar57 + lVar78 * 4) = auVar129;
                          *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar128;
                          *(undefined1 (*) [64])(*pauVar57 + lVar42 * 4) = auVar127;
                          pauVar57 = pauVar57 + 1;
                        }
                        if (iVar69 == 1) {
                          auVar101 = vextractf32x4_avx512f(auVar130,2);
                          auVar102 = vextractf32x4_avx512f(auVar129,2);
                          auVar103 = vextractf32x4_avx512f(auVar128,2);
                          auVar104 = vextractf32x4_avx512f(auVar127,2);
                          auVar105 = vextractf32x4_avx512f(auVar130,3);
                          auVar106 = vextractf32x4_avx512f(auVar129,3);
                          auVar87 = vextractf32x4_avx512f(auVar128,3);
                          auVar88 = vextractf32x4_avx512f(auVar127,3);
                          auVar97 = vunpcklps_avx512vl(auVar130._0_16_,auVar129._0_16_);
                          auVar98 = vunpcklps_avx512vl(auVar128._0_16_,auVar127._0_16_);
                          auVar95 = vunpckhps_avx(auVar130._0_16_,auVar129._0_16_);
                          auVar96 = vunpckhps_avx(auVar128._0_16_,auVar127._0_16_);
                          auVar89 = vunpcklpd_avx512vl(auVar97,auVar98);
                          auVar90 = vunpckhpd_avx512vl(auVar97,auVar98);
                          auVar91 = vunpcklpd_avx512vl(auVar95,auVar96);
                          auVar95 = vunpckhpd_avx(auVar95,auVar96);
                          auVar98 = vunpcklps_avx(auVar130._16_16_,auVar129._16_16_);
                          auVar99 = vunpcklps_avx512vl(auVar128._16_16_,auVar127._16_16_);
                          auVar96 = vunpckhps_avx(auVar130._16_16_,auVar129._16_16_);
                          auVar97 = vunpckhps_avx(auVar128._16_16_,auVar127._16_16_);
                          auVar92 = vunpcklpd_avx512vl(auVar98,auVar99);
                          auVar93 = vunpckhpd_avx512vl(auVar98,auVar99);
                          auVar100 = vunpcklpd_avx(auVar96,auVar97);
                          auVar96 = vunpckhpd_avx(auVar96,auVar97);
                          auVar99 = vunpcklps_avx(auVar101,auVar102);
                          auVar94 = vunpcklps_avx512vl(auVar103,auVar104);
                          auVar97 = vunpckhps_avx(auVar101,auVar102);
                          auVar98 = vunpckhps_avx(auVar103,auVar104);
                          auVar103 = vunpcklpd_avx512vl(auVar99,auVar94);
                          auVar104 = vunpckhpd_avx512vl(auVar99,auVar94);
                          auVar101 = vunpcklpd_avx(auVar97,auVar98);
                          auVar97 = vunpckhpd_avx(auVar97,auVar98);
                          auVar102 = vunpcklps_avx(auVar105,auVar106);
                          auVar94 = vunpcklps_avx512vl(auVar87,auVar88);
                          auVar98 = vunpckhps_avx(auVar105,auVar106);
                          auVar99 = vunpckhps_avx(auVar87,auVar88);
                          auVar105 = vunpcklpd_avx512vl(auVar102,auVar94);
                          auVar106 = vunpckhpd_avx512vl(auVar102,auVar94);
                          auVar102 = vunpcklpd_avx(auVar98,auVar99);
                          auVar98 = vunpckhpd_avx(auVar98,auVar99);
                          *(undefined1 (*) [16])*pauVar57 = auVar89;
                          *(undefined1 (*) [16])(*pauVar57 + lVar40 * 4) = auVar90;
                          *(undefined1 (*) [16])(*pauVar57 + lVar77 * 4) = auVar91;
                          *(undefined1 (*) [16])(*pauVar57 + lVar63 * 4) = auVar95;
                          *(undefined1 (*) [16])(*pauVar57 + lVar78 * 4) = auVar92;
                          *(undefined1 (*) [16])(*pauVar57 + lVar75 * 4) = auVar93;
                          *(undefined1 (*) [16])(*pauVar57 + lVar71 * 4) = auVar100;
                          *(undefined1 (*) [16])(*pauVar57 + lVar72 * 4) = auVar96;
                          *(undefined1 (*) [16])(*pauVar57 + lVar62 * 4) = auVar103;
                          *(undefined1 (*) [16])(*pauVar57 + lVar45 * 4) = auVar104;
                          *(undefined1 (*) [16])(*pauVar57 + local_288 * 4) = auVar101;
                          *(undefined1 (*) [16])(*pauVar57 + local_268 * 4) = auVar97;
                          *(undefined1 (*) [16])(*pauVar57 + lVar42 * 4) = auVar105;
                          *(undefined1 (*) [16])(*pauVar57 + local_270 * 4) = auVar106;
                          *(undefined1 (*) [16])(*pauVar57 + local_278 * 4) = auVar102;
                          *(undefined1 (*) [16])(*pauVar57 + local_290 * 4) = auVar98;
                          pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x10);
                        }
                      }
                      pauVar39 = pauVar39 + 4;
                      uVar52 = uVar80 + 7;
                      uVar80 = uVar80 + 4;
                    }
                    uVar52 = uVar80 | 1;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT864(0) << 0x40;
                          auVar128 = ZEXT864(0) << 0x40;
                        }
                        else {
                          auVar127 = *pauVar41;
                          auVar128 = auVar127;
                        }
                      }
                      else {
                        auVar127 = pauVar39[1];
                        auVar128 = *pauVar39;
                      }
                      if (0 < iVar35) {
                        lVar64 = 0;
                        iVar67 = iVar35;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64);
                          auVar129._4_4_ = uVar171;
                          auVar129._0_4_ = uVar171;
                          auVar129._8_4_ = uVar171;
                          auVar129._12_4_ = uVar171;
                          auVar129._16_4_ = uVar171;
                          auVar129._20_4_ = uVar171;
                          auVar129._24_4_ = uVar171;
                          auVar129._28_4_ = uVar171;
                          auVar129._32_4_ = uVar171;
                          auVar129._36_4_ = uVar171;
                          auVar129._40_4_ = uVar171;
                          auVar129._44_4_ = uVar171;
                          auVar129._48_4_ = uVar171;
                          auVar129._52_4_ = uVar171;
                          auVar129._56_4_ = uVar171;
                          auVar129._60_4_ = uVar171;
                          auVar128 = vfmadd231ps_avx512f(auVar128,*(undefined1 (*) [64])
                                                                   (*pauVar53 + lVar64 * 8),auVar129
                                                        );
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar64 + 4);
                          auVar130._4_4_ = uVar171;
                          auVar130._0_4_ = uVar171;
                          auVar130._8_4_ = uVar171;
                          auVar130._12_4_ = uVar171;
                          auVar130._16_4_ = uVar171;
                          auVar130._20_4_ = uVar171;
                          auVar130._24_4_ = uVar171;
                          auVar130._28_4_ = uVar171;
                          auVar130._32_4_ = uVar171;
                          auVar130._36_4_ = uVar171;
                          auVar130._40_4_ = uVar171;
                          auVar130._44_4_ = uVar171;
                          auVar130._48_4_ = uVar171;
                          auVar130._52_4_ = uVar171;
                          auVar130._56_4_ = uVar171;
                          auVar130._60_4_ = uVar171;
                          auVar127 = vfmadd231ps_avx512f(auVar127,*(undefined1 (*) [64])
                                                                   (*pauVar53 + lVar64 * 8),auVar130
                                                        );
                          lVar64 = lVar64 + 8;
                          iVar67 = iVar67 + -1;
                        } while (iVar67 != 0);
                        pauVar55 = (undefined1 (*) [16])(*pauVar55 + local_228);
                      }
                      if (iVar44 < K) {
                        *pauVar39 = auVar128;
                        pauVar39[1] = auVar127;
                      }
                      else {
                        if (iVar69 == 0x10) {
                          *pauVar57 = auVar128;
                          pauVar57[1] = auVar127;
                          pauVar57 = pauVar57 + 2;
                        }
                        if (iVar69 == 8) {
                          auVar129 = vinsertf64x4_avx512f(auVar128,auVar127._0_32_,1);
                          auVar130 = vshuff64x2_avx512f(auVar128,auVar127,0xee);
                          *pauVar57 = auVar129;
                          *(undefined1 (*) [64])(*pauVar57 + lVar62 * 4) = auVar130;
                          pauVar57 = pauVar57 + 1;
                        }
                        auVar95 = auVar127._0_16_;
                        auVar96 = auVar128._0_16_;
                        if (iVar69 == 4) {
                          *(undefined1 (*) [16])(*pauVar57 + 0x10) = auVar95;
                          *(undefined1 (*) [16])*pauVar57 = auVar96;
                          auVar97 = vextractf32x4_avx512f(auVar127,1);
                          *(undefined1 (*) [16])(*pauVar57 + lVar78 * 4 + 8) = auVar97;
                          auVar97 = vextractf32x4_avx512f(auVar128,1);
                          *(undefined1 (*) [16])(*pauVar57 + lVar78 * 4) = auVar97;
                          auVar97 = vextractf32x4_avx512f(auVar127,2);
                          *(undefined1 (*) [16])(*pauVar57 + lVar62 * 4 + 8) = auVar97;
                          auVar97 = vextractf32x4_avx512f(auVar128,2);
                          *(undefined1 (*) [16])(*pauVar57 + lVar62 * 4) = auVar97;
                          auVar97 = vextractf32x4_avx512f(auVar127,3);
                          *(undefined1 (*) [16])(*pauVar57 + lVar42 * 4 + 8) = auVar97;
                          auVar97 = vextractf32x4_avx512f(auVar128,3);
                          *(undefined1 (*) [16])(*pauVar57 + lVar42 * 4) = auVar97;
                          pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x20);
                        }
                        if (iVar69 == 1) {
                          *(int *)*pauVar57 = auVar128._0_4_;
                          uVar171 = vextractps_avx(auVar96,1);
                          *(undefined4 *)(*pauVar57 + lVar40 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar57 + lVar77 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar57 + local_180 * 4) = uVar171;
                          auVar96 = auVar128._16_16_;
                          *(int *)(*pauVar57 + lVar78 * 4) = auVar128._16_4_;
                          uVar171 = vextractps_avx(auVar96,1);
                          *(undefined4 *)(*pauVar57 + local_188 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar57 + local_190 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar57 + local_198 * 4) = uVar171;
                          auVar96 = vextracti32x4_avx512f(auVar128,2);
                          *(int *)(*pauVar57 + lVar62 * 4) = auVar96._0_4_;
                          uVar171 = vextractps_avx(auVar96,1);
                          *(undefined4 *)(*pauVar57 + local_1a0 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar57 + local_38 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar57 + local_40 * 4) = uVar171;
                          auVar96 = vextracti32x4_avx512f(auVar128,3);
                          *(int *)(*pauVar57 + local_48 * 4) = auVar96._0_4_;
                          uVar171 = vextractps_avx(auVar96,1);
                          *(undefined4 *)(*pauVar57 + local_50 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar57 + local_58 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar57 + local_60 * 4) = uVar171;
                          *(int *)(*pauVar57 + 4) = auVar127._0_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar57 + local_178 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar57 + local_68 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar57 + local_70 * 4) = uVar171;
                          auVar95 = auVar127._16_16_;
                          *(int *)(*pauVar57 + local_78 * 4) = auVar127._16_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar57 + local_80 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar57 + local_88 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar57 + local_90 * 4) = uVar171;
                          auVar95 = vextracti32x4_avx512f(auVar127,2);
                          *(int *)(*pauVar57 + local_98 * 4) = auVar95._0_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar57 + local_a0 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar57 + local_a8 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar57 + local_b0 * 4) = uVar171;
                          auVar95 = vextracti32x4_avx512f(auVar127,3);
                          *(int *)(*pauVar57 + local_b8 * 4) = auVar95._0_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar57 + local_c0 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar57 + local_c8 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar57 + local_d0 * 4) = uVar171;
                          pauVar57 = (undefined1 (*) [64])(*pauVar57 + 8);
                        }
                      }
                      pauVar39 = pauVar39 + 2;
                      uVar52 = uVar80 + 3;
                      uVar80 = uVar80 + 2;
                    }
                    if ((int)uVar80 < (int)uVar76) {
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar127 = *pauVar41;
                          }
                        }
                        else {
                          auVar127 = *pauVar39;
                        }
                        if (0 < iVar35) {
                          lVar64 = 0;
                          pauVar65 = pauVar53;
                          do {
                            uVar171 = *(undefined4 *)(*pauVar55 + lVar64 * 4);
                            auVar128._4_4_ = uVar171;
                            auVar128._0_4_ = uVar171;
                            auVar128._8_4_ = uVar171;
                            auVar128._12_4_ = uVar171;
                            auVar128._16_4_ = uVar171;
                            auVar128._20_4_ = uVar171;
                            auVar128._24_4_ = uVar171;
                            auVar128._28_4_ = uVar171;
                            auVar128._32_4_ = uVar171;
                            auVar128._36_4_ = uVar171;
                            auVar128._40_4_ = uVar171;
                            auVar128._44_4_ = uVar171;
                            auVar128._48_4_ = uVar171;
                            auVar128._52_4_ = uVar171;
                            auVar128._56_4_ = uVar171;
                            auVar128._60_4_ = uVar171;
                            auVar127 = vfmadd231ps_avx512f(auVar127,*pauVar65,auVar128);
                            pauVar65 = pauVar65 + 1;
                            lVar64 = lVar64 + 1;
                          } while (iVar68 != (int)lVar64);
                          pauVar55 = (undefined1 (*) [16])(*pauVar55 + local_230);
                        }
                        if (iVar44 < K) {
                          *pauVar39 = auVar127;
                        }
                        else {
                          if (iVar69 == 0x10) {
                            *pauVar57 = auVar127;
                            pauVar57 = pauVar57 + 1;
                          }
                          if (iVar69 == 8) {
                            *(undefined1 (*) [32])*pauVar57 = auVar127._0_32_;
                            auVar109 = vextractf64x4_avx512f(auVar127,1);
                            *(undefined1 (*) [32])(*pauVar57 + lVar62 * 4) = auVar109;
                            pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x20);
                          }
                          auVar95 = auVar127._0_16_;
                          if (iVar69 == 4) {
                            *(undefined1 (*) [16])*pauVar57 = auVar95;
                            auVar96 = vextractf32x4_avx512f(auVar127,1);
                            *(undefined1 (*) [16])(*pauVar57 + lVar78 * 4) = auVar96;
                            auVar96 = vextractf32x4_avx512f(auVar127,2);
                            *(undefined1 (*) [16])(*pauVar57 + lVar62 * 4) = auVar96;
                            auVar96 = vextractf32x4_avx512f(auVar127,3);
                            *(undefined1 (*) [16])(*pauVar57 + lVar42 * 4) = auVar96;
                            pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x10);
                          }
                          if (iVar69 == 1) {
                            *(int *)*pauVar57 = auVar127._0_4_;
                            uVar171 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar57 + lVar40 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar57 + lVar77 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar57 + lVar63 * 4) = uVar171;
                            auVar95 = auVar127._16_16_;
                            *(int *)(*pauVar57 + lVar78 * 4) = auVar127._16_4_;
                            uVar171 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar57 + lVar75 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar57 + lVar71 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar57 + lVar72 * 4) = uVar171;
                            auVar95 = vextracti32x4_avx512f(auVar127,2);
                            *(int *)(*pauVar57 + lVar62 * 4) = auVar95._0_4_;
                            uVar171 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar57 + lVar45 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar57 + local_288 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar57 + local_268 * 4) = uVar171;
                            auVar95 = vextracti32x4_avx512f(auVar127,3);
                            *(int *)(*pauVar57 + lVar42 * 4) = auVar95._0_4_;
                            uVar171 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar57 + local_270 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar57 + local_278 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar57 + local_290 * 4) = uVar171;
                            pauVar57 = (undefined1 (*) [64])(*pauVar57 + 4);
                          }
                        }
                        pauVar39 = pauVar39 + 1;
                        uVar80 = uVar80 + 1;
                      } while (uVar80 != uVar76);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + local_e8);
                    uVar61 = local_d8 + 0x10;
                    local_300 = pauVar41;
                  } while (local_d8 + 0x1f < local_f0);
                }
                if ((int)((uint)uVar61 | 7) < (int)uVar47) {
                  local_198 = (long)(iVar69 * iVar70);
                  lVar75 = (long)(iVar73 * 4);
                  lVar42 = (long)(iVar73 * 2);
                  lVar45 = (long)(local_1d0 * 0x300000000) >> 0x20;
                  lVar62 = (long)(local_1d0 * 0x500000000) >> 0x20;
                  lVar77 = (long)(local_1d0 * 0x600000000) >> 0x20;
                  lVar63 = (long)(local_1d0 * 0x700000000) >> 0x20;
                  local_278 = (long)(iVar73 * 3);
                  local_290 = (long)(iVar73 * 5);
                  local_240 = (long)(iVar73 * 6);
                  local_248 = (long)(iVar73 * 7);
                  local_270 = (long)((local_1d0 << 0x20) + 0x100000000) >> 0x20;
                  local_228 = (long)(iVar73 * 2 + 1);
                  local_230 = (long)(iVar73 * 3 + 1);
                  local_238 = (long)(iVar73 * 4 + 1);
                  local_178 = (long)(iVar73 * 5 + 1);
                  local_180 = (long)(iVar73 * 6 + 1);
                  local_188 = (long)(iVar73 * 7 + 1);
                  uVar46 = (ulong)(iVar35 - 1);
                  local_288 = uVar46 * 4 + 4;
                  local_268 = uVar46 * 0x20 + 0x20;
                  local_1a0 = (long)(iVar35 * 8) * 4;
                  lVar78 = (long)iVar73;
                  uVar61 = uVar61 & 0xffffffff;
                  do {
                    local_190 = uVar61;
                    pauVar41 = (undefined1 (*) [64])
                               ((long)local_250->data + local_190 * 4 + local_1c0 * 4);
                    if (local_300 == (undefined1 (*) [64])0x0) {
                      pauVar41 = local_300;
                    }
                    uVar80 = 0;
                    pauVar54 = (undefined1 (*) [32])
                               ((long)local_258->data +
                               local_198 * 4 + (local_190 + local_1c0) * lVar78 * 4);
                    pauVar55 = local_298;
                    if (0xb < (int)uVar76) {
                      uVar52 = 0;
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT864(0) << 0x40;
                            auVar128 = ZEXT864(0) << 0x40;
                            auVar129 = ZEXT864(0) << 0x40;
                            auVar130 = ZEXT864(0) << 0x40;
                            auVar131 = ZEXT864(0) << 0x40;
                            auVar132 = ZEXT864(0) << 0x40;
                            auVar133 = ZEXT864(0) << 0x40;
                            auVar134 = ZEXT864(0) << 0x40;
                            auVar135 = ZEXT864(0) << 0x40;
                            auVar136 = ZEXT864(0) << 0x40;
                            auVar137 = ZEXT864(0) << 0x40;
                            auVar138 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar109 = *(undefined1 (*) [32])*pauVar41;
                            auVar127 = ZEXT3264(auVar109);
                            auVar128 = ZEXT3264(auVar109);
                            auVar129 = ZEXT3264(auVar109);
                            auVar130 = ZEXT3264(auVar109);
                            auVar131 = ZEXT3264(auVar109);
                            auVar132 = ZEXT3264(auVar109);
                            auVar133 = ZEXT3264(auVar109);
                            auVar134 = ZEXT3264(auVar109);
                            auVar135 = ZEXT3264(auVar109);
                            auVar136 = ZEXT3264(auVar109);
                            auVar137 = ZEXT3264(auVar109);
                            auVar138 = ZEXT3264(auVar109);
                          }
                        }
                        else {
                          auVar138 = ZEXT3264(*(undefined1 (*) [32])*pauVar39);
                          auVar137 = ZEXT3264(*(undefined1 (*) [32])(*pauVar39 + 0x20));
                          auVar136 = ZEXT3264(*(undefined1 (*) [32])pauVar39[1]);
                          auVar135 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[1] + 0x20));
                          auVar134 = ZEXT3264(*(undefined1 (*) [32])pauVar39[2]);
                          auVar133 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[2] + 0x20));
                          auVar132 = ZEXT3264(*(undefined1 (*) [32])pauVar39[3]);
                          auVar131 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[3] + 0x20));
                          auVar130 = ZEXT3264(*(undefined1 (*) [32])pauVar39[4]);
                          auVar129 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[4] + 0x20));
                          auVar128 = ZEXT3264(*(undefined1 (*) [32])pauVar39[5]);
                          auVar127 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[5] + 0x20));
                        }
                        auVar120 = auVar127._0_32_;
                        auVar118 = auVar129._0_32_;
                        auVar116 = auVar131._0_32_;
                        auVar115 = auVar132._0_32_;
                        auVar114 = auVar133._0_32_;
                        auVar113 = auVar134._0_32_;
                        auVar112 = auVar135._0_32_;
                        auVar111 = auVar136._0_32_;
                        auVar110 = auVar137._0_32_;
                        auVar109 = auVar138._0_32_;
                        auVar119 = auVar128._0_32_;
                        auVar117 = auVar130._0_32_;
                        pauVar49 = pauVar55;
                        pauVar57 = pauVar53;
                        iVar68 = iVar35;
                        if (0 < iVar35) {
                          do {
                            auVar120 = *(undefined1 (*) [32])*pauVar57;
                            uVar171 = *(undefined4 *)*pauVar49;
                            auVar109._4_4_ = uVar171;
                            auVar109._0_4_ = uVar171;
                            auVar109._8_4_ = uVar171;
                            auVar109._12_4_ = uVar171;
                            auVar109._16_4_ = uVar171;
                            auVar109._20_4_ = uVar171;
                            auVar109._24_4_ = uVar171;
                            auVar109._28_4_ = uVar171;
                            auVar109 = vfmadd231ps_avx512vl(auVar138._0_32_,auVar120,auVar109);
                            auVar138 = ZEXT3264(auVar109);
                            uVar171 = *(undefined4 *)(*pauVar49 + 4);
                            auVar110._4_4_ = uVar171;
                            auVar110._0_4_ = uVar171;
                            auVar110._8_4_ = uVar171;
                            auVar110._12_4_ = uVar171;
                            auVar110._16_4_ = uVar171;
                            auVar110._20_4_ = uVar171;
                            auVar110._24_4_ = uVar171;
                            auVar110._28_4_ = uVar171;
                            auVar110 = vfmadd231ps_avx512vl(auVar137._0_32_,auVar120,auVar110);
                            auVar137 = ZEXT3264(auVar110);
                            uVar171 = *(undefined4 *)(*pauVar49 + 8);
                            auVar113._4_4_ = uVar171;
                            auVar113._0_4_ = uVar171;
                            auVar113._8_4_ = uVar171;
                            auVar113._12_4_ = uVar171;
                            auVar113._16_4_ = uVar171;
                            auVar113._20_4_ = uVar171;
                            auVar113._24_4_ = uVar171;
                            auVar113._28_4_ = uVar171;
                            auVar111 = vfmadd231ps_avx512vl(auVar136._0_32_,auVar120,auVar113);
                            auVar136 = ZEXT3264(auVar111);
                            uVar171 = *(undefined4 *)(*pauVar49 + 0xc);
                            auVar115._4_4_ = uVar171;
                            auVar115._0_4_ = uVar171;
                            auVar115._8_4_ = uVar171;
                            auVar115._12_4_ = uVar171;
                            auVar115._16_4_ = uVar171;
                            auVar115._20_4_ = uVar171;
                            auVar115._24_4_ = uVar171;
                            auVar115._28_4_ = uVar171;
                            auVar112 = vfmadd231ps_avx512vl(auVar135._0_32_,auVar120,auVar115);
                            auVar135 = ZEXT3264(auVar112);
                            uVar171 = *(undefined4 *)pauVar49[1];
                            auVar116._4_4_ = uVar171;
                            auVar116._0_4_ = uVar171;
                            auVar116._8_4_ = uVar171;
                            auVar116._12_4_ = uVar171;
                            auVar116._16_4_ = uVar171;
                            auVar116._20_4_ = uVar171;
                            auVar116._24_4_ = uVar171;
                            auVar116._28_4_ = uVar171;
                            auVar113 = vfmadd231ps_avx512vl(auVar134._0_32_,auVar120,auVar116);
                            auVar134 = ZEXT3264(auVar113);
                            uVar171 = *(undefined4 *)(pauVar49[1] + 4);
                            auVar117._4_4_ = uVar171;
                            auVar117._0_4_ = uVar171;
                            auVar117._8_4_ = uVar171;
                            auVar117._12_4_ = uVar171;
                            auVar117._16_4_ = uVar171;
                            auVar117._20_4_ = uVar171;
                            auVar117._24_4_ = uVar171;
                            auVar117._28_4_ = uVar171;
                            auVar114 = vfmadd231ps_avx512vl(auVar133._0_32_,auVar120,auVar117);
                            auVar133 = ZEXT3264(auVar114);
                            uVar171 = *(undefined4 *)(pauVar49[1] + 8);
                            auVar107._4_4_ = uVar171;
                            auVar107._0_4_ = uVar171;
                            auVar107._8_4_ = uVar171;
                            auVar107._12_4_ = uVar171;
                            auVar107._16_4_ = uVar171;
                            auVar107._20_4_ = uVar171;
                            auVar107._24_4_ = uVar171;
                            auVar107._28_4_ = uVar171;
                            auVar115 = vfmadd231ps_avx512vl(auVar132._0_32_,auVar120,auVar107);
                            auVar132 = ZEXT3264(auVar115);
                            uVar171 = *(undefined4 *)(pauVar49[1] + 0xc);
                            auVar108._4_4_ = uVar171;
                            auVar108._0_4_ = uVar171;
                            auVar108._8_4_ = uVar171;
                            auVar108._12_4_ = uVar171;
                            auVar108._16_4_ = uVar171;
                            auVar108._20_4_ = uVar171;
                            auVar108._24_4_ = uVar171;
                            auVar108._28_4_ = uVar171;
                            auVar116 = vfmadd231ps_avx512vl(auVar131._0_32_,auVar120,auVar108);
                            auVar131 = ZEXT3264(auVar116);
                            uVar171 = *(undefined4 *)pauVar49[2];
                            auVar126._4_4_ = uVar171;
                            auVar126._0_4_ = uVar171;
                            auVar126._8_4_ = uVar171;
                            auVar126._12_4_ = uVar171;
                            auVar126._16_4_ = uVar171;
                            auVar126._20_4_ = uVar171;
                            auVar126._24_4_ = uVar171;
                            auVar126._28_4_ = uVar171;
                            auVar117 = vfmadd231ps_avx512vl(auVar130._0_32_,auVar120,auVar126);
                            auVar130 = ZEXT3264(auVar117);
                            uVar171 = *(undefined4 *)(pauVar49[2] + 4);
                            auVar12._4_4_ = uVar171;
                            auVar12._0_4_ = uVar171;
                            auVar12._8_4_ = uVar171;
                            auVar12._12_4_ = uVar171;
                            auVar12._16_4_ = uVar171;
                            auVar12._20_4_ = uVar171;
                            auVar12._24_4_ = uVar171;
                            auVar12._28_4_ = uVar171;
                            auVar118 = vfmadd231ps_avx512vl(auVar129._0_32_,auVar120,auVar12);
                            auVar129 = ZEXT3264(auVar118);
                            uVar171 = *(undefined4 *)(pauVar49[2] + 8);
                            auVar13._4_4_ = uVar171;
                            auVar13._0_4_ = uVar171;
                            auVar13._8_4_ = uVar171;
                            auVar13._12_4_ = uVar171;
                            auVar13._16_4_ = uVar171;
                            auVar13._20_4_ = uVar171;
                            auVar13._24_4_ = uVar171;
                            auVar13._28_4_ = uVar171;
                            auVar119 = vfmadd231ps_avx512vl(auVar128._0_32_,auVar120,auVar13);
                            auVar128 = ZEXT3264(auVar119);
                            uVar171 = *(undefined4 *)(pauVar49[2] + 0xc);
                            auVar14._4_4_ = uVar171;
                            auVar14._0_4_ = uVar171;
                            auVar14._8_4_ = uVar171;
                            auVar14._12_4_ = uVar171;
                            auVar14._16_4_ = uVar171;
                            auVar14._20_4_ = uVar171;
                            auVar14._24_4_ = uVar171;
                            auVar14._28_4_ = uVar171;
                            auVar120 = vfmadd231ps_avx512vl(auVar127._0_32_,auVar120,auVar14);
                            auVar127 = ZEXT3264(auVar120);
                            iVar68 = iVar68 + -1;
                            pauVar49 = pauVar49 + 3;
                            pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x20);
                          } while (iVar68 != 0);
                          pauVar55 = pauVar55 + uVar46 * 3 + 3;
                        }
                        if (iVar44 < K) {
                          *(undefined1 (*) [32])*pauVar39 = auVar109;
                          *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar110;
                          *(undefined1 (*) [32])pauVar39[1] = auVar111;
                          *(undefined1 (*) [32])(pauVar39[1] + 0x20) = auVar112;
                          *(undefined1 (*) [32])pauVar39[2] = auVar113;
                          *(undefined1 (*) [32])(pauVar39[2] + 0x20) = auVar114;
                          *(undefined1 (*) [32])pauVar39[3] = auVar115;
                          *(undefined1 (*) [32])(pauVar39[3] + 0x20) = auVar116;
                          *(undefined1 (*) [32])pauVar39[4] = auVar117;
                          *(undefined1 (*) [32])(pauVar39[4] + 0x20) = auVar118;
                          *(undefined1 (*) [32])pauVar39[5] = auVar119;
                          *(undefined1 (*) [32])(pauVar39[5] + 0x20) = auVar120;
                        }
                        else {
                          if (iVar69 == 8) {
                            *pauVar54 = auVar109;
                            pauVar54[1] = auVar110;
                            pauVar54[2] = auVar111;
                            pauVar54[3] = auVar112;
                            pauVar54[4] = auVar113;
                            pauVar54[5] = auVar114;
                            pauVar54[6] = auVar115;
                            pauVar54[7] = auVar116;
                            pauVar54[8] = auVar117;
                            pauVar54[9] = auVar118;
                            pauVar54[10] = auVar119;
                            pauVar54[0xb] = auVar120;
                            pauVar54 = pauVar54 + 0xc;
                          }
                          auVar96 = auVar118._0_16_;
                          auVar95 = auVar120._0_16_;
                          if (iVar69 == 4) {
                            auVar218._16_16_ = auVar110._0_16_;
                            auVar218._0_16_ = auVar109._0_16_;
                            auVar219._16_16_ = auVar112._0_16_;
                            auVar219._0_16_ = auVar111._0_16_;
                            auVar221._16_16_ = auVar114._0_16_;
                            auVar221._0_16_ = auVar113._0_16_;
                            auVar223._16_16_ = auVar116._0_16_;
                            auVar223._0_16_ = auVar115._0_16_;
                            auVar121 = vinsertf32x4_avx512vl(auVar117,auVar96,1);
                            auVar107 = vinsertf32x4_avx512vl(auVar119,auVar95,1);
                            auVar108 = vshuff64x2_avx512vl(auVar109,auVar110,3);
                            auVar122 = vshuff64x2_avx512vl(auVar111,auVar112,3);
                            auVar123 = vshuff64x2_avx512vl(auVar113,auVar114,3);
                            auVar124 = vshuff64x2_avx512vl(auVar115,auVar116,3);
                            auVar125 = vshuff64x2_avx512vl(auVar117,auVar118,3);
                            auVar126 = vshuff64x2_avx512vl(auVar119,auVar120,3);
                            *pauVar54 = auVar218;
                            pauVar54[1] = auVar219;
                            pauVar54[2] = auVar221;
                            pauVar54[3] = auVar223;
                            pauVar54[4] = auVar121;
                            pauVar54[5] = auVar107;
                            *(undefined1 (*) [32])(*pauVar54 + lVar75 * 4) = auVar108;
                            *(undefined1 (*) [32])(pauVar54[1] + lVar75 * 4) = auVar122;
                            *(undefined1 (*) [32])(pauVar54[2] + lVar75 * 4) = auVar123;
                            *(undefined1 (*) [32])(pauVar54[3] + lVar75 * 4) = auVar124;
                            *(undefined1 (*) [32])(pauVar54[4] + lVar75 * 4) = auVar125;
                            *(undefined1 (*) [32])(pauVar54[5] + lVar75 * 4) = auVar126;
                            pauVar54 = pauVar54 + 6;
                          }
                          if (iVar69 == 1) {
                            auVar121 = vunpcklps_avx(auVar109,auVar110);
                            auVar110 = vunpckhps_avx(auVar109,auVar110);
                            auVar109 = vunpcklps_avx(auVar111,auVar112);
                            auVar111 = vunpckhps_avx(auVar111,auVar112);
                            auVar107 = vunpcklps_avx(auVar113,auVar114);
                            auVar112 = vunpckhps_avx(auVar113,auVar114);
                            auVar108 = vunpcklps_avx(auVar115,auVar116);
                            auVar113 = vunpckhps_avx(auVar115,auVar116);
                            auVar114 = vunpcklpd_avx(auVar121,auVar109);
                            auVar109 = vunpckhpd_avx(auVar121,auVar109);
                            auVar115 = vunpcklpd_avx(auVar110,auVar111);
                            auVar110 = vunpckhpd_avx(auVar110,auVar111);
                            auVar116 = vunpcklpd_avx(auVar107,auVar108);
                            auVar111 = vunpckhpd_avx(auVar107,auVar108);
                            auVar121 = vunpcklpd_avx(auVar112,auVar113);
                            auVar112 = vunpckhpd_avx(auVar112,auVar113);
                            auVar206._16_16_ = auVar116._0_16_;
                            auVar206._0_16_ = auVar114._0_16_;
                            auVar220._16_16_ = auVar111._0_16_;
                            auVar220._0_16_ = auVar109._0_16_;
                            auVar222._16_16_ = auVar121._0_16_;
                            auVar222._0_16_ = auVar115._0_16_;
                            auVar224._16_16_ = auVar112._0_16_;
                            auVar224._0_16_ = auVar110._0_16_;
                            auVar113 = vperm2f128_avx(auVar114,auVar116,0x31);
                            auVar109 = vperm2f128_avx(auVar109,auVar111,0x31);
                            auVar111 = vperm2f128_avx(auVar115,auVar121,0x31);
                            auVar110 = vperm2f128_avx(auVar110,auVar112,0x31);
                            *pauVar54 = auVar206;
                            *(undefined1 (*) [32])(*pauVar54 + lVar78 * 4) = auVar220;
                            *(undefined1 (*) [32])(*pauVar54 + lVar42 * 4) = auVar222;
                            *(undefined1 (*) [32])(*pauVar54 + lVar45 * 4) = auVar224;
                            *(undefined1 (*) [32])(*pauVar54 + lVar75 * 4) = auVar113;
                            *(undefined1 (*) [32])(*pauVar54 + lVar62 * 4) = auVar109;
                            *(undefined1 (*) [32])(*pauVar54 + lVar77 * 4) = auVar111;
                            *(undefined1 (*) [32])(*pauVar54 + lVar63 * 4) = auVar110;
                            auVar99 = vunpcklps_avx(auVar117._0_16_,auVar96);
                            auVar100 = vunpcklps_avx(auVar119._0_16_,auVar95);
                            auVar97 = vunpckhps_avx(auVar117._0_16_,auVar96);
                            auVar98 = vunpckhps_avx(auVar119._0_16_,auVar95);
                            auVar95 = vmovlhps_avx(auVar99,auVar100);
                            auVar99 = vunpckhpd_avx(auVar99,auVar100);
                            auVar96 = vmovlhps_avx(auVar97,auVar98);
                            auVar100 = vunpckhpd_avx(auVar97,auVar98);
                            auVar98 = vunpcklps_avx(auVar117._16_16_,auVar118._16_16_);
                            auVar101 = vunpcklps_avx(auVar119._16_16_,auVar120._16_16_);
                            auVar102 = vunpckhps_avx(auVar117._16_16_,auVar118._16_16_);
                            auVar103 = vunpckhps_avx(auVar119._16_16_,auVar120._16_16_);
                            auVar97 = vmovlhps_avx(auVar98,auVar101);
                            auVar101 = vunpckhpd_avx(auVar98,auVar101);
                            auVar98 = vmovlhps_avx(auVar102,auVar103);
                            auVar102 = vunpckhpd_avx(auVar102,auVar103);
                            *(undefined1 (*) [16])pauVar54[1] = auVar95;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar78 * 4) = auVar99;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar42 * 4) = auVar96;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar45 * 4) = auVar100;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar75 * 4) = auVar97;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar62 * 4) = auVar101;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar77 * 4) = auVar98;
                            *(undefined1 (*) [16])(pauVar54[1] + lVar63 * 4) = auVar102;
                            pauVar54 = (undefined1 (*) [32])(pauVar54[1] + 0x10);
                          }
                        }
                        pauVar39 = pauVar39 + 6;
                        uVar80 = uVar52 + 0xc;
                        iVar68 = uVar52 + 0x17;
                        uVar52 = uVar80;
                      } while (iVar68 < (int)uVar76);
                    }
                    iVar68 = uVar80 + 7;
                    while (iVar68 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar134 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar109 = *(undefined1 (*) [32])*pauVar41;
                          auVar127 = ZEXT3264(auVar109);
                          auVar128 = ZEXT3264(auVar109);
                          auVar129 = ZEXT3264(auVar109);
                          auVar130 = ZEXT3264(auVar109);
                          auVar131 = ZEXT3264(auVar109);
                          auVar132 = ZEXT3264(auVar109);
                          auVar133 = ZEXT3264(auVar109);
                          auVar134 = ZEXT3264(auVar109);
                        }
                      }
                      else {
                        auVar134 = ZEXT3264(*(undefined1 (*) [32])*pauVar39);
                        auVar133 = ZEXT3264(*(undefined1 (*) [32])(*pauVar39 + 0x20));
                        auVar132 = ZEXT3264(*(undefined1 (*) [32])pauVar39[1]);
                        auVar131 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[1] + 0x20));
                        auVar130 = ZEXT3264(*(undefined1 (*) [32])pauVar39[2]);
                        auVar129 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[2] + 0x20));
                        auVar128 = ZEXT3264(*(undefined1 (*) [32])pauVar39[3]);
                        auVar127 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[3] + 0x20));
                      }
                      auVar116 = auVar127._0_32_;
                      auVar115 = auVar128._0_32_;
                      auVar114 = auVar129._0_32_;
                      auVar113 = auVar130._0_32_;
                      auVar112 = auVar131._0_32_;
                      auVar111 = auVar132._0_32_;
                      auVar110 = auVar133._0_32_;
                      auVar109 = auVar134._0_32_;
                      if (0 < iVar35) {
                        lVar71 = 0;
                        iVar68 = iVar35;
                        do {
                          auVar116 = *(undefined1 (*) [32])(*pauVar53 + lVar71);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71);
                          auVar15._4_4_ = uVar171;
                          auVar15._0_4_ = uVar171;
                          auVar15._8_4_ = uVar171;
                          auVar15._12_4_ = uVar171;
                          auVar15._16_4_ = uVar171;
                          auVar15._20_4_ = uVar171;
                          auVar15._24_4_ = uVar171;
                          auVar15._28_4_ = uVar171;
                          auVar109 = vfmadd231ps_avx512vl(auVar134._0_32_,auVar116,auVar15);
                          auVar134 = ZEXT3264(auVar109);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 4);
                          auVar16._4_4_ = uVar171;
                          auVar16._0_4_ = uVar171;
                          auVar16._8_4_ = uVar171;
                          auVar16._12_4_ = uVar171;
                          auVar16._16_4_ = uVar171;
                          auVar16._20_4_ = uVar171;
                          auVar16._24_4_ = uVar171;
                          auVar16._28_4_ = uVar171;
                          auVar110 = vfmadd231ps_avx512vl(auVar133._0_32_,auVar116,auVar16);
                          auVar133 = ZEXT3264(auVar110);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 8);
                          auVar17._4_4_ = uVar171;
                          auVar17._0_4_ = uVar171;
                          auVar17._8_4_ = uVar171;
                          auVar17._12_4_ = uVar171;
                          auVar17._16_4_ = uVar171;
                          auVar17._20_4_ = uVar171;
                          auVar17._24_4_ = uVar171;
                          auVar17._28_4_ = uVar171;
                          auVar111 = vfmadd231ps_avx512vl(auVar132._0_32_,auVar116,auVar17);
                          auVar132 = ZEXT3264(auVar111);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 0xc);
                          auVar18._4_4_ = uVar171;
                          auVar18._0_4_ = uVar171;
                          auVar18._8_4_ = uVar171;
                          auVar18._12_4_ = uVar171;
                          auVar18._16_4_ = uVar171;
                          auVar18._20_4_ = uVar171;
                          auVar18._24_4_ = uVar171;
                          auVar18._28_4_ = uVar171;
                          auVar112 = vfmadd231ps_avx512vl(auVar131._0_32_,auVar116,auVar18);
                          auVar131 = ZEXT3264(auVar112);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar71);
                          auVar19._4_4_ = uVar171;
                          auVar19._0_4_ = uVar171;
                          auVar19._8_4_ = uVar171;
                          auVar19._12_4_ = uVar171;
                          auVar19._16_4_ = uVar171;
                          auVar19._20_4_ = uVar171;
                          auVar19._24_4_ = uVar171;
                          auVar19._28_4_ = uVar171;
                          auVar113 = vfmadd231ps_avx512vl(auVar130._0_32_,auVar116,auVar19);
                          auVar130 = ZEXT3264(auVar113);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar71 + 4);
                          auVar20._4_4_ = uVar171;
                          auVar20._0_4_ = uVar171;
                          auVar20._8_4_ = uVar171;
                          auVar20._12_4_ = uVar171;
                          auVar20._16_4_ = uVar171;
                          auVar20._20_4_ = uVar171;
                          auVar20._24_4_ = uVar171;
                          auVar20._28_4_ = uVar171;
                          auVar114 = vfmadd231ps_avx512vl(auVar129._0_32_,auVar116,auVar20);
                          auVar129 = ZEXT3264(auVar114);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar71 + 8);
                          auVar21._4_4_ = uVar171;
                          auVar21._0_4_ = uVar171;
                          auVar21._8_4_ = uVar171;
                          auVar21._12_4_ = uVar171;
                          auVar21._16_4_ = uVar171;
                          auVar21._20_4_ = uVar171;
                          auVar21._24_4_ = uVar171;
                          auVar21._28_4_ = uVar171;
                          auVar115 = vfmadd231ps_avx512vl(auVar128._0_32_,auVar116,auVar21);
                          auVar128 = ZEXT3264(auVar115);
                          uVar171 = *(undefined4 *)(pauVar55[1] + lVar71 + 0xc);
                          auVar22._4_4_ = uVar171;
                          auVar22._0_4_ = uVar171;
                          auVar22._8_4_ = uVar171;
                          auVar22._12_4_ = uVar171;
                          auVar22._16_4_ = uVar171;
                          auVar22._20_4_ = uVar171;
                          auVar22._24_4_ = uVar171;
                          auVar22._28_4_ = uVar171;
                          auVar116 = vfmadd231ps_avx512vl(auVar127._0_32_,auVar116,auVar22);
                          auVar127 = ZEXT3264(auVar116);
                          lVar71 = lVar71 + 0x20;
                          iVar68 = iVar68 + -1;
                        } while (iVar68 != 0);
                        pauVar55 = pauVar55 + uVar46 * 2 + 2;
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [32])*pauVar39 = auVar109;
                        *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar110;
                        *(undefined1 (*) [32])pauVar39[1] = auVar111;
                        *(undefined1 (*) [32])(pauVar39[1] + 0x20) = auVar112;
                        *(undefined1 (*) [32])pauVar39[2] = auVar113;
                        *(undefined1 (*) [32])(pauVar39[2] + 0x20) = auVar114;
                        *(undefined1 (*) [32])pauVar39[3] = auVar115;
                        *(undefined1 (*) [32])(pauVar39[3] + 0x20) = auVar116;
                      }
                      else {
                        if (iVar69 == 8) {
                          *pauVar54 = auVar109;
                          pauVar54[1] = auVar110;
                          pauVar54[2] = auVar111;
                          pauVar54[3] = auVar112;
                          pauVar54[4] = auVar113;
                          pauVar54[5] = auVar114;
                          pauVar54[6] = auVar115;
                          pauVar54[7] = auVar116;
                          pauVar54 = pauVar54 + 8;
                        }
                        if (iVar69 == 4) {
                          auVar209._16_16_ = auVar110._0_16_;
                          auVar209._0_16_ = auVar109._0_16_;
                          auVar212._16_16_ = auVar112._0_16_;
                          auVar212._0_16_ = auVar111._0_16_;
                          auVar214._16_16_ = auVar114._0_16_;
                          auVar214._0_16_ = auVar113._0_16_;
                          auVar216._16_16_ = auVar116._0_16_;
                          auVar216._0_16_ = auVar115._0_16_;
                          auVar117 = vperm2f128_avx(auVar109,auVar110,0x31);
                          auVar118 = vperm2f128_avx(auVar111,auVar112,0x31);
                          auVar119 = vperm2f128_avx(auVar113,auVar114,0x31);
                          auVar120 = vperm2f128_avx(auVar115,auVar116,0x31);
                          *pauVar54 = auVar209;
                          pauVar54[1] = auVar212;
                          pauVar54[2] = auVar214;
                          pauVar54[3] = auVar216;
                          *(undefined1 (*) [32])(*pauVar54 + lVar75 * 4) = auVar117;
                          *(undefined1 (*) [32])(pauVar54[1] + lVar75 * 4) = auVar118;
                          *(undefined1 (*) [32])(pauVar54[2] + lVar75 * 4) = auVar119;
                          *(undefined1 (*) [32])(pauVar54[3] + lVar75 * 4) = auVar120;
                          pauVar54 = pauVar54 + 4;
                        }
                        if (iVar69 == 1) {
                          auVar117 = vunpcklps_avx(auVar109,auVar110);
                          auVar110 = vunpckhps_avx(auVar109,auVar110);
                          auVar109 = vunpcklps_avx(auVar111,auVar112);
                          auVar111 = vunpckhps_avx(auVar111,auVar112);
                          auVar118 = vunpcklps_avx(auVar113,auVar114);
                          auVar112 = vunpckhps_avx(auVar113,auVar114);
                          auVar119 = vunpcklps_avx(auVar115,auVar116);
                          auVar113 = vunpckhps_avx(auVar115,auVar116);
                          auVar114 = vunpcklpd_avx(auVar117,auVar109);
                          auVar109 = vunpckhpd_avx(auVar117,auVar109);
                          auVar115 = vunpcklpd_avx(auVar110,auVar111);
                          auVar110 = vunpckhpd_avx(auVar110,auVar111);
                          auVar116 = vunpcklpd_avx(auVar118,auVar119);
                          auVar111 = vunpckhpd_avx(auVar118,auVar119);
                          auVar117 = vunpcklpd_avx(auVar112,auVar113);
                          auVar112 = vunpckhpd_avx(auVar112,auVar113);
                          auVar193._16_16_ = auVar116._0_16_;
                          auVar193._0_16_ = auVar114._0_16_;
                          auVar213._16_16_ = auVar111._0_16_;
                          auVar213._0_16_ = auVar109._0_16_;
                          auVar215._16_16_ = auVar117._0_16_;
                          auVar215._0_16_ = auVar115._0_16_;
                          auVar217._16_16_ = auVar112._0_16_;
                          auVar217._0_16_ = auVar110._0_16_;
                          auVar113 = vperm2f128_avx(auVar114,auVar116,0x31);
                          auVar109 = vperm2f128_avx(auVar109,auVar111,0x31);
                          auVar111 = vperm2f128_avx(auVar115,auVar117,0x31);
                          auVar110 = vperm2f128_avx(auVar110,auVar112,0x31);
                          *pauVar54 = auVar193;
                          *(undefined1 (*) [32])(*pauVar54 + lVar78 * 4) = auVar213;
                          *(undefined1 (*) [32])(*pauVar54 + lVar42 * 4) = auVar215;
                          *(undefined1 (*) [32])(*pauVar54 + lVar45 * 4) = auVar217;
                          *(undefined1 (*) [32])(*pauVar54 + lVar75 * 4) = auVar113;
                          *(undefined1 (*) [32])(*pauVar54 + lVar62 * 4) = auVar109;
                          *(undefined1 (*) [32])(*pauVar54 + lVar77 * 4) = auVar111;
                          *(undefined1 (*) [32])(*pauVar54 + lVar63 * 4) = auVar110;
                          pauVar54 = pauVar54 + 1;
                        }
                      }
                      pauVar39 = pauVar39 + 4;
                      iVar68 = uVar80 + 0xf;
                      uVar80 = uVar80 + 8;
                    }
                    uVar52 = uVar80 | 3;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar109 = *(undefined1 (*) [32])*pauVar41;
                          auVar127 = ZEXT3264(auVar109);
                          auVar128 = ZEXT3264(auVar109);
                          auVar129 = ZEXT3264(auVar109);
                          auVar130 = ZEXT3264(auVar109);
                        }
                      }
                      else {
                        auVar130 = ZEXT3264(*(undefined1 (*) [32])*pauVar39);
                        auVar129 = ZEXT3264(*(undefined1 (*) [32])(*pauVar39 + 0x20));
                        auVar128 = ZEXT3264(*(undefined1 (*) [32])pauVar39[1]);
                        auVar127 = ZEXT3264(*(undefined1 (*) [32])(pauVar39[1] + 0x20));
                      }
                      auVar112 = auVar127._0_32_;
                      auVar111 = auVar128._0_32_;
                      auVar110 = auVar129._0_32_;
                      auVar109 = auVar130._0_32_;
                      if (0 < iVar35) {
                        lVar71 = 0;
                        iVar68 = iVar35;
                        do {
                          auVar112 = *(undefined1 (*) [32])(*pauVar53 + lVar71 * 2);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71);
                          auVar23._4_4_ = uVar171;
                          auVar23._0_4_ = uVar171;
                          auVar23._8_4_ = uVar171;
                          auVar23._12_4_ = uVar171;
                          auVar23._16_4_ = uVar171;
                          auVar23._20_4_ = uVar171;
                          auVar23._24_4_ = uVar171;
                          auVar23._28_4_ = uVar171;
                          auVar109 = vfmadd231ps_avx512vl(auVar130._0_32_,auVar112,auVar23);
                          auVar130 = ZEXT3264(auVar109);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 4);
                          auVar24._4_4_ = uVar171;
                          auVar24._0_4_ = uVar171;
                          auVar24._8_4_ = uVar171;
                          auVar24._12_4_ = uVar171;
                          auVar24._16_4_ = uVar171;
                          auVar24._20_4_ = uVar171;
                          auVar24._24_4_ = uVar171;
                          auVar24._28_4_ = uVar171;
                          auVar110 = vfmadd231ps_avx512vl(auVar129._0_32_,auVar112,auVar24);
                          auVar129 = ZEXT3264(auVar110);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 8);
                          auVar25._4_4_ = uVar171;
                          auVar25._0_4_ = uVar171;
                          auVar25._8_4_ = uVar171;
                          auVar25._12_4_ = uVar171;
                          auVar25._16_4_ = uVar171;
                          auVar25._20_4_ = uVar171;
                          auVar25._24_4_ = uVar171;
                          auVar25._28_4_ = uVar171;
                          auVar111 = vfmadd231ps_avx512vl(auVar128._0_32_,auVar112,auVar25);
                          auVar128 = ZEXT3264(auVar111);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 0xc);
                          auVar26._4_4_ = uVar171;
                          auVar26._0_4_ = uVar171;
                          auVar26._8_4_ = uVar171;
                          auVar26._12_4_ = uVar171;
                          auVar26._16_4_ = uVar171;
                          auVar26._20_4_ = uVar171;
                          auVar26._24_4_ = uVar171;
                          auVar26._28_4_ = uVar171;
                          auVar112 = vfmadd231ps_avx512vl(auVar127._0_32_,auVar112,auVar26);
                          auVar127 = ZEXT3264(auVar112);
                          lVar71 = lVar71 + 0x10;
                          iVar68 = iVar68 + -1;
                        } while (iVar68 != 0);
                        pauVar55 = pauVar55 + uVar46 + 1;
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [32])*pauVar39 = auVar109;
                        *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar110;
                        *(undefined1 (*) [32])pauVar39[1] = auVar111;
                        *(undefined1 (*) [32])(pauVar39[1] + 0x20) = auVar112;
                      }
                      else {
                        if (iVar69 == 8) {
                          *pauVar54 = auVar109;
                          pauVar54[1] = auVar110;
                          pauVar54[2] = auVar111;
                          pauVar54[3] = auVar112;
                          pauVar54 = pauVar54 + 4;
                        }
                        auVar98 = auVar109._0_16_;
                        auVar97 = auVar110._0_16_;
                        auVar96 = auVar111._0_16_;
                        auVar95 = auVar112._0_16_;
                        if (iVar69 == 4) {
                          auVar201._16_16_ = auVar97;
                          auVar201._0_16_ = auVar98;
                          auVar205._16_16_ = auVar95;
                          auVar205._0_16_ = auVar96;
                          auVar113 = vperm2f128_avx(auVar109,auVar110,0x31);
                          auVar114 = vperm2f128_avx(auVar111,auVar112,0x31);
                          *pauVar54 = auVar201;
                          pauVar54[1] = auVar205;
                          *(undefined1 (*) [32])(*pauVar54 + lVar75 * 4) = auVar113;
                          *(undefined1 (*) [32])(pauVar54[1] + lVar75 * 4) = auVar114;
                          pauVar54 = pauVar54 + 2;
                        }
                        if (iVar69 == 1) {
                          auVar99 = vunpcklps_avx(auVar98,auVar97);
                          auVar100 = vunpcklps_avx(auVar96,auVar95);
                          auVar97 = vunpckhps_avx(auVar98,auVar97);
                          auVar98 = vunpckhps_avx(auVar96,auVar95);
                          auVar95 = vmovlhps_avx(auVar99,auVar100);
                          auVar99 = vunpckhpd_avx(auVar99,auVar100);
                          auVar96 = vmovlhps_avx(auVar97,auVar98);
                          auVar100 = vunpckhpd_avx(auVar97,auVar98);
                          auVar98 = vunpcklps_avx(auVar109._16_16_,auVar110._16_16_);
                          auVar101 = vunpcklps_avx(auVar111._16_16_,auVar112._16_16_);
                          auVar102 = vunpckhps_avx(auVar109._16_16_,auVar110._16_16_);
                          auVar103 = vunpckhps_avx(auVar111._16_16_,auVar112._16_16_);
                          auVar97 = vmovlhps_avx(auVar98,auVar101);
                          auVar101 = vunpckhpd_avx(auVar98,auVar101);
                          auVar98 = vmovlhps_avx(auVar102,auVar103);
                          auVar102 = vunpckhpd_avx(auVar102,auVar103);
                          *(undefined1 (*) [16])*pauVar54 = auVar95;
                          *(undefined1 (*) [16])(*pauVar54 + lVar78 * 4) = auVar99;
                          *(undefined1 (*) [16])(*pauVar54 + lVar42 * 4) = auVar96;
                          *(undefined1 (*) [16])(*pauVar54 + lVar45 * 4) = auVar100;
                          *(undefined1 (*) [16])(*pauVar54 + lVar75 * 4) = auVar97;
                          *(undefined1 (*) [16])(*pauVar54 + lVar62 * 4) = auVar101;
                          *(undefined1 (*) [16])(*pauVar54 + lVar77 * 4) = auVar98;
                          *(undefined1 (*) [16])(*pauVar54 + lVar63 * 4) = auVar102;
                          pauVar54 = (undefined1 (*) [32])(*pauVar54 + 0x10);
                        }
                      }
                      pauVar39 = pauVar39 + 2;
                      uVar52 = uVar80 + 7;
                      uVar80 = uVar80 + 4;
                    }
                    uVar52 = uVar80 | 1;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar127 = ZEXT3264(*(undefined1 (*) [32])*pauVar41);
                          auVar128 = ZEXT3264(*(undefined1 (*) [32])*pauVar41);
                        }
                      }
                      else {
                        auVar128 = ZEXT3264(*(undefined1 (*) [32])*pauVar39);
                        auVar127 = ZEXT3264(*(undefined1 (*) [32])(*pauVar39 + 0x20));
                      }
                      auVar110 = auVar127._0_32_;
                      auVar109 = auVar128._0_32_;
                      if (0 < iVar35) {
                        lVar71 = 0;
                        iVar68 = iVar35;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71);
                          auVar27._4_4_ = uVar171;
                          auVar27._0_4_ = uVar171;
                          auVar27._8_4_ = uVar171;
                          auVar27._12_4_ = uVar171;
                          auVar27._16_4_ = uVar171;
                          auVar27._20_4_ = uVar171;
                          auVar27._24_4_ = uVar171;
                          auVar27._28_4_ = uVar171;
                          auVar109 = vfmadd231ps_avx512vl
                                               (auVar128._0_32_,
                                                *(undefined1 (*) [32])(*pauVar53 + lVar71 * 4),
                                                auVar27);
                          auVar128 = ZEXT3264(auVar109);
                          uVar171 = *(undefined4 *)(*pauVar55 + lVar71 + 4);
                          auVar28._4_4_ = uVar171;
                          auVar28._0_4_ = uVar171;
                          auVar28._8_4_ = uVar171;
                          auVar28._12_4_ = uVar171;
                          auVar28._16_4_ = uVar171;
                          auVar28._20_4_ = uVar171;
                          auVar28._24_4_ = uVar171;
                          auVar28._28_4_ = uVar171;
                          auVar110 = vfmadd231ps_avx512vl
                                               (auVar127._0_32_,
                                                *(undefined1 (*) [32])(*pauVar53 + lVar71 * 4),
                                                auVar28);
                          auVar127 = ZEXT3264(auVar110);
                          lVar71 = lVar71 + 8;
                          iVar68 = iVar68 + -1;
                        } while (iVar68 != 0);
                        pauVar55 = (undefined1 (*) [16])(*pauVar55 + uVar46 * 8 + 8);
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [32])*pauVar39 = auVar109;
                        *(undefined1 (*) [32])(*pauVar39 + 0x20) = auVar110;
                      }
                      else {
                        if (iVar69 == 8) {
                          *pauVar54 = auVar109;
                          pauVar54[1] = auVar110;
                          pauVar54 = pauVar54 + 2;
                        }
                        auVar96 = auVar109._0_16_;
                        auVar97 = auVar109._16_16_;
                        auVar95 = auVar110._0_16_;
                        if (iVar69 == 4) {
                          auVar194._16_16_ = auVar95;
                          auVar194._0_16_ = auVar96;
                          auVar111 = vperm2f128_avx(auVar109,auVar110,0x31);
                          *pauVar54 = auVar194;
                          *(undefined1 (*) [32])(*pauVar54 + lVar75 * 4) = auVar111;
                          pauVar54 = pauVar54 + 1;
                        }
                        if (iVar69 == 1) {
                          *(int *)*pauVar54 = auVar109._0_4_;
                          uVar171 = vextractps_avx(auVar96,1);
                          *(undefined4 *)(*pauVar54 + lVar78 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar54 + lVar42 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar54 + local_278 * 4) = uVar171;
                          *(int *)(*pauVar54 + lVar75 * 4) = auVar109._16_4_;
                          uVar171 = vextractps_avx(auVar97,1);
                          *(undefined4 *)(*pauVar54 + local_290 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar97,2);
                          *(undefined4 *)(*pauVar54 + local_240 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar97,3);
                          *(undefined4 *)(*pauVar54 + local_248 * 4) = uVar171;
                          *(int *)(*pauVar54 + 4) = auVar110._0_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar54 + local_270 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar54 + local_228 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar54 + local_230 * 4) = uVar171;
                          auVar95 = auVar110._16_16_;
                          *(int *)(*pauVar54 + local_238 * 4) = auVar110._16_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar54 + local_178 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar54 + local_180 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar54 + local_188 * 4) = uVar171;
                          pauVar54 = (undefined1 (*) [32])(*pauVar54 + 8);
                        }
                      }
                      pauVar39 = pauVar39 + 1;
                      uVar52 = uVar80 + 3;
                      uVar80 = uVar80 + 2;
                    }
                    if ((int)uVar80 < (int)uVar76) {
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar127 = ZEXT3264(*(undefined1 (*) [32])*pauVar41);
                          }
                        }
                        else {
                          auVar127 = ZEXT3264(*(undefined1 (*) [32])*pauVar39);
                        }
                        auVar109 = auVar127._0_32_;
                        if (0 < iVar35) {
                          lVar71 = 0;
                          iVar68 = iVar35;
                          do {
                            uVar171 = *(undefined4 *)(*pauVar55 + lVar71);
                            auVar29._4_4_ = uVar171;
                            auVar29._0_4_ = uVar171;
                            auVar29._8_4_ = uVar171;
                            auVar29._12_4_ = uVar171;
                            auVar29._16_4_ = uVar171;
                            auVar29._20_4_ = uVar171;
                            auVar29._24_4_ = uVar171;
                            auVar29._28_4_ = uVar171;
                            auVar109 = vfmadd231ps_avx512vl
                                                 (auVar127._0_32_,
                                                  *(undefined1 (*) [32])(*pauVar53 + lVar71 * 8),
                                                  auVar29);
                            auVar127 = ZEXT3264(auVar109);
                            lVar71 = lVar71 + 4;
                            iVar68 = iVar68 + -1;
                          } while (iVar68 != 0);
                          pauVar55 = (undefined1 (*) [16])(*pauVar55 + local_288);
                        }
                        if (iVar44 < K) {
                          *(undefined1 (*) [32])*pauVar39 = auVar109;
                        }
                        else {
                          if (iVar69 == 8) {
                            *pauVar54 = auVar109;
                            pauVar54 = pauVar54 + 1;
                          }
                          auVar96 = auVar109._16_16_;
                          auVar95 = auVar109._0_16_;
                          if (iVar69 == 4) {
                            *(undefined1 (*) [16])*pauVar54 = auVar95;
                            *(undefined1 (*) [16])(*pauVar54 + lVar75 * 4) = auVar96;
                            pauVar54 = (undefined1 (*) [32])(*pauVar54 + 0x10);
                          }
                          if (iVar69 == 1) {
                            *(int *)*pauVar54 = auVar109._0_4_;
                            uVar171 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar54 + lVar78 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar54 + lVar42 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar54 + lVar45 * 4) = uVar171;
                            *(int *)(*pauVar54 + lVar75 * 4) = auVar109._16_4_;
                            uVar171 = vextractps_avx(auVar96,1);
                            *(undefined4 *)(*pauVar54 + lVar62 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar96,2);
                            *(undefined4 *)(*pauVar54 + lVar77 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar96,3);
                            *(undefined4 *)(*pauVar54 + lVar63 * 4) = uVar171;
                            pauVar54 = (undefined1 (*) [32])(*pauVar54 + 4);
                          }
                        }
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                        uVar80 = uVar80 + 1;
                      } while (uVar80 != uVar76);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + local_1a0);
                    uVar61 = local_190 + 8;
                    local_300 = pauVar41;
                    local_16c = iVar69;
                  } while ((long)(local_190 + 0xf) < local_1c8);
                }
                if ((int)((uint)uVar61 | 3) < (int)uVar47) {
                  local_270 = (long)(iVar69 * iVar70);
                  lVar45 = (long)iVar73;
                  lVar78 = (long)(iVar73 * 2);
                  lVar42 = (long)(local_1d0 * 0x300000000) >> 0x20;
                  local_288 = (long)(iVar73 * 3 + 1);
                  uVar46 = (ulong)(iVar35 - 1);
                  local_278 = (long)(iVar35 * 4) * 4;
                  uVar61 = uVar61 & 0xffffffff;
                  do {
                    local_268 = uVar61;
                    pauVar41 = (undefined1 (*) [64])
                               ((long)local_250->data + local_268 * 4 + local_1c0 * 4);
                    if (local_300 == (undefined1 (*) [64])0x0) {
                      pauVar41 = local_300;
                    }
                    uVar80 = 0;
                    pauVar55 = (undefined1 (*) [16])
                               ((long)local_258->data +
                               local_270 * 4 + (local_268 + local_1c0) * lVar45 * 4);
                    pauVar49 = local_298;
                    if (0xb < (int)uVar76) {
                      uVar52 = 0;
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar134 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar136 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar137 = ZEXT864(0) << 0x40;
                            auVar138 = ZEXT864(0) << 0x40;
                          }
                          else {
                            auVar95 = *(undefined1 (*) [16])*pauVar41;
                            auVar127 = ZEXT1664(auVar95);
                            auVar128 = ZEXT1664(auVar95);
                            auVar129 = ZEXT1664(auVar95);
                            auVar130 = ZEXT1664(auVar95);
                            auVar131 = ZEXT1664(auVar95);
                            auVar132 = ZEXT1664(auVar95);
                            auVar133 = ZEXT1664(auVar95);
                            auVar134 = ZEXT1664(auVar95);
                            auVar135 = ZEXT1664(auVar95);
                            auVar136 = ZEXT1664(auVar95);
                            auVar137 = ZEXT1664(auVar95);
                            auVar138 = ZEXT1664(auVar95);
                          }
                        }
                        else {
                          auVar138 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                          auVar137 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x10));
                          auVar136 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x20));
                          auVar135 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x30));
                          auVar134 = ZEXT1664(*(undefined1 (*) [16])pauVar39[1]);
                          auVar133 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[1] + 0x10));
                          auVar132 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[1] + 0x20));
                          auVar131 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[1] + 0x30));
                          auVar130 = ZEXT1664(*(undefined1 (*) [16])pauVar39[2]);
                          auVar127 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[2] + 0x10));
                          auVar128 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[2] + 0x20));
                          auVar129 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[2] + 0x30));
                        }
                        auVar106 = auVar129._0_16_;
                        auVar105 = auVar128._0_16_;
                        auVar104 = auVar127._0_16_;
                        auVar103 = auVar130._0_16_;
                        auVar102 = auVar131._0_16_;
                        auVar101 = auVar132._0_16_;
                        auVar100 = auVar133._0_16_;
                        auVar99 = auVar134._0_16_;
                        auVar98 = auVar135._0_16_;
                        auVar97 = auVar136._0_16_;
                        auVar96 = auVar137._0_16_;
                        auVar95 = auVar138._0_16_;
                        pauVar57 = pauVar53;
                        pauVar58 = pauVar49;
                        iVar68 = iVar35;
                        if (0 < iVar35) {
                          do {
                            auVar106 = *(undefined1 (*) [16])*pauVar57;
                            uVar171 = *(undefined4 *)*pauVar58;
                            auVar95._4_4_ = uVar171;
                            auVar95._0_4_ = uVar171;
                            auVar95._8_4_ = uVar171;
                            auVar95._12_4_ = uVar171;
                            auVar95 = vfmadd231ps_avx512vl(auVar138._0_16_,auVar106,auVar95);
                            auVar138 = ZEXT1664(auVar95);
                            uVar171 = *(undefined4 *)(*pauVar58 + 4);
                            auVar96._4_4_ = uVar171;
                            auVar96._0_4_ = uVar171;
                            auVar96._8_4_ = uVar171;
                            auVar96._12_4_ = uVar171;
                            auVar96 = vfmadd231ps_avx512vl(auVar137._0_16_,auVar106,auVar96);
                            auVar137 = ZEXT1664(auVar96);
                            uVar171 = *(undefined4 *)(*pauVar58 + 8);
                            auVar97._4_4_ = uVar171;
                            auVar97._0_4_ = uVar171;
                            auVar97._8_4_ = uVar171;
                            auVar97._12_4_ = uVar171;
                            auVar97 = vfmadd231ps_avx512vl(auVar136._0_16_,auVar106,auVar97);
                            auVar136 = ZEXT1664(auVar97);
                            uVar171 = *(undefined4 *)(*pauVar58 + 0xc);
                            auVar98._4_4_ = uVar171;
                            auVar98._0_4_ = uVar171;
                            auVar98._8_4_ = uVar171;
                            auVar98._12_4_ = uVar171;
                            auVar98 = vfmadd231ps_avx512vl(auVar135._0_16_,auVar106,auVar98);
                            auVar135 = ZEXT1664(auVar98);
                            uVar171 = *(undefined4 *)pauVar58[1];
                            auVar99._4_4_ = uVar171;
                            auVar99._0_4_ = uVar171;
                            auVar99._8_4_ = uVar171;
                            auVar99._12_4_ = uVar171;
                            auVar99 = vfmadd231ps_avx512vl(auVar134._0_16_,auVar106,auVar99);
                            auVar134 = ZEXT1664(auVar99);
                            uVar171 = *(undefined4 *)(pauVar58[1] + 4);
                            auVar100._4_4_ = uVar171;
                            auVar100._0_4_ = uVar171;
                            auVar100._8_4_ = uVar171;
                            auVar100._12_4_ = uVar171;
                            auVar100 = vfmadd231ps_avx512vl(auVar133._0_16_,auVar106,auVar100);
                            auVar133 = ZEXT1664(auVar100);
                            uVar171 = *(undefined4 *)(pauVar58[1] + 8);
                            auVar101._4_4_ = uVar171;
                            auVar101._0_4_ = uVar171;
                            auVar101._8_4_ = uVar171;
                            auVar101._12_4_ = uVar171;
                            auVar101 = vfmadd231ps_avx512vl(auVar132._0_16_,auVar106,auVar101);
                            auVar132 = ZEXT1664(auVar101);
                            uVar171 = *(undefined4 *)(pauVar58[1] + 0xc);
                            auVar102._4_4_ = uVar171;
                            auVar102._0_4_ = uVar171;
                            auVar102._8_4_ = uVar171;
                            auVar102._12_4_ = uVar171;
                            auVar102 = vfmadd231ps_avx512vl(auVar131._0_16_,auVar106,auVar102);
                            auVar131 = ZEXT1664(auVar102);
                            uVar171 = *(undefined4 *)pauVar58[2];
                            auVar103._4_4_ = uVar171;
                            auVar103._0_4_ = uVar171;
                            auVar103._8_4_ = uVar171;
                            auVar103._12_4_ = uVar171;
                            auVar103 = vfmadd231ps_avx512vl(auVar130._0_16_,auVar106,auVar103);
                            auVar130 = ZEXT1664(auVar103);
                            uVar171 = *(undefined4 *)(pauVar58[2] + 4);
                            auVar104._4_4_ = uVar171;
                            auVar104._0_4_ = uVar171;
                            auVar104._8_4_ = uVar171;
                            auVar104._12_4_ = uVar171;
                            auVar104 = vfmadd231ps_avx512vl(auVar127._0_16_,auVar106,auVar104);
                            auVar127 = ZEXT1664(auVar104);
                            uVar171 = *(undefined4 *)(pauVar58[2] + 8);
                            auVar105._4_4_ = uVar171;
                            auVar105._0_4_ = uVar171;
                            auVar105._8_4_ = uVar171;
                            auVar105._12_4_ = uVar171;
                            auVar105 = vfmadd231ps_avx512vl(auVar128._0_16_,auVar106,auVar105);
                            auVar128 = ZEXT1664(auVar105);
                            uVar171 = *(undefined4 *)(pauVar58[2] + 0xc);
                            auVar87._4_4_ = uVar171;
                            auVar87._0_4_ = uVar171;
                            auVar87._8_4_ = uVar171;
                            auVar87._12_4_ = uVar171;
                            auVar106 = vfmadd231ps_avx512vl(auVar129._0_16_,auVar106,auVar87);
                            auVar129 = ZEXT1664(auVar106);
                            iVar68 = iVar68 + -1;
                            pauVar57 = (undefined1 (*) [64])(*pauVar57 + 0x10);
                            pauVar58 = pauVar58 + 3;
                          } while (iVar68 != 0);
                          pauVar49 = pauVar49 + uVar46 * 3 + 3;
                        }
                        if (iVar44 < K) {
                          *(undefined1 (*) [16])*pauVar39 = auVar95;
                          *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar96;
                          *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar97;
                          *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar98;
                          *(undefined1 (*) [16])pauVar39[1] = auVar99;
                          *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar100;
                          *(undefined1 (*) [16])(pauVar39[1] + 0x20) = auVar101;
                          *(undefined1 (*) [16])(pauVar39[1] + 0x30) = auVar102;
                          *(undefined1 (*) [16])pauVar39[2] = auVar103;
                          *(undefined1 (*) [16])(pauVar39[2] + 0x10) = auVar104;
                          *(undefined1 (*) [16])(pauVar39[2] + 0x20) = auVar105;
                          *(undefined1 (*) [16])(pauVar39[2] + 0x30) = auVar106;
                        }
                        else {
                          if (iVar69 == 4) {
                            *pauVar55 = auVar95;
                            pauVar55[1] = auVar96;
                            pauVar55[2] = auVar97;
                            pauVar55[3] = auVar98;
                            pauVar55[4] = auVar99;
                            pauVar55[5] = auVar100;
                            pauVar55[6] = auVar101;
                            pauVar55[7] = auVar102;
                            pauVar55[8] = auVar103;
                            pauVar55[9] = auVar104;
                            pauVar55[10] = auVar105;
                            pauVar55[0xb] = auVar106;
                            pauVar55 = pauVar55 + 0xc;
                          }
                          if (iVar69 == 1) {
                            auVar87 = vunpcklps_avx(auVar95,auVar96);
                            auVar89 = vunpcklps_avx(auVar97,auVar98);
                            auVar88 = vunpckhps_avx(auVar95,auVar96);
                            auVar97 = vunpckhps_avx(auVar97,auVar98);
                            auVar95 = vmovlhps_avx(auVar87,auVar89);
                            auVar87 = vunpckhpd_avx(auVar87,auVar89);
                            auVar96 = vmovlhps_avx(auVar88,auVar97);
                            auVar88 = vunpckhpd_avx(auVar88,auVar97);
                            auVar98 = vunpcklps_avx(auVar99,auVar100);
                            auVar89 = vunpcklps_avx(auVar101,auVar102);
                            auVar99 = vunpckhps_avx(auVar99,auVar100);
                            auVar100 = vunpckhps_avx(auVar101,auVar102);
                            auVar97 = vmovlhps_avx(auVar98,auVar89);
                            auVar101 = vunpckhpd_avx(auVar98,auVar89);
                            auVar98 = vmovlhps_avx(auVar99,auVar100);
                            auVar102 = vunpckhpd_avx(auVar99,auVar100);
                            auVar100 = vunpcklps_avx(auVar103,auVar104);
                            auVar89 = vunpcklps_avx(auVar105,auVar106);
                            auVar104 = vunpckhps_avx(auVar103,auVar104);
                            auVar105 = vunpckhps_avx(auVar105,auVar106);
                            auVar99 = vmovlhps_avx(auVar100,auVar89);
                            auVar103 = vunpckhpd_avx(auVar100,auVar89);
                            auVar100 = vmovlhps_avx(auVar104,auVar105);
                            auVar104 = vunpckhpd_avx(auVar104,auVar105);
                            *pauVar55 = auVar95;
                            *(undefined1 (*) [16])(*pauVar55 + lVar45 * 4) = auVar87;
                            *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar96;
                            *(undefined1 (*) [16])(*pauVar55 + lVar42 * 4) = auVar88;
                            pauVar55[1] = auVar97;
                            *(undefined1 (*) [16])(pauVar55[1] + lVar45 * 4) = auVar101;
                            *(undefined1 (*) [16])(pauVar55[1] + lVar78 * 4) = auVar98;
                            *(undefined1 (*) [16])(pauVar55[1] + lVar42 * 4) = auVar102;
                            pauVar55[2] = auVar99;
                            *(undefined1 (*) [16])(pauVar55[2] + lVar45 * 4) = auVar103;
                            *(undefined1 (*) [16])(pauVar55[2] + lVar78 * 4) = auVar100;
                            *(undefined1 (*) [16])(pauVar55[2] + lVar42 * 4) = auVar104;
                            pauVar55 = pauVar55 + 3;
                          }
                        }
                        pauVar39 = pauVar39 + 3;
                        uVar80 = uVar52 + 0xc;
                        iVar68 = uVar52 + 0x17;
                        uVar52 = uVar80;
                      } while (iVar68 < (int)uVar76);
                    }
                    iVar68 = uVar80 + 7;
                    while (iVar68 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar134 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar95 = *(undefined1 (*) [16])*pauVar41;
                          auVar127 = ZEXT1664(auVar95);
                          auVar129 = ZEXT1664(auVar95);
                          auVar131 = ZEXT1664(auVar95);
                          auVar133 = ZEXT1664(auVar95);
                          auVar128 = ZEXT1664(auVar95);
                          auVar130 = ZEXT1664(auVar95);
                          auVar132 = ZEXT1664(auVar95);
                          auVar134 = ZEXT1664(auVar95);
                        }
                      }
                      else {
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                        auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x10));
                        auVar131 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x20));
                        auVar133 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x30));
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])pauVar39[1]);
                        auVar130 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[1] + 0x10));
                        auVar132 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[1] + 0x20));
                        auVar134 = ZEXT1664(*(undefined1 (*) [16])(pauVar39[1] + 0x30));
                      }
                      auVar102 = auVar134._0_16_;
                      auVar101 = auVar132._0_16_;
                      auVar100 = auVar130._0_16_;
                      auVar99 = auVar128._0_16_;
                      auVar98 = auVar133._0_16_;
                      auVar97 = auVar131._0_16_;
                      auVar96 = auVar129._0_16_;
                      auVar95 = auVar127._0_16_;
                      if (0 < iVar35) {
                        lVar62 = 0;
                        iVar68 = iVar35;
                        do {
                          auVar102 = *(undefined1 (*) [16])(*pauVar53 + lVar62);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 * 2);
                          auVar106._4_4_ = uVar171;
                          auVar106._0_4_ = uVar171;
                          auVar106._8_4_ = uVar171;
                          auVar106._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_avx512vl(auVar127._0_16_,auVar102,auVar106);
                          auVar127 = ZEXT1664(auVar95);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 * 2 + 4);
                          auVar88._4_4_ = uVar171;
                          auVar88._0_4_ = uVar171;
                          auVar88._8_4_ = uVar171;
                          auVar88._12_4_ = uVar171;
                          auVar96 = vfmadd231ps_avx512vl(auVar129._0_16_,auVar102,auVar88);
                          auVar129 = ZEXT1664(auVar96);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 * 2 + 8);
                          auVar89._4_4_ = uVar171;
                          auVar89._0_4_ = uVar171;
                          auVar89._8_4_ = uVar171;
                          auVar89._12_4_ = uVar171;
                          auVar97 = vfmadd231ps_avx512vl(auVar131._0_16_,auVar102,auVar89);
                          auVar131 = ZEXT1664(auVar97);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 * 2 + 0xc);
                          auVar90._4_4_ = uVar171;
                          auVar90._0_4_ = uVar171;
                          auVar90._8_4_ = uVar171;
                          auVar90._12_4_ = uVar171;
                          auVar98 = vfmadd231ps_avx512vl(auVar133._0_16_,auVar102,auVar90);
                          auVar133 = ZEXT1664(auVar98);
                          uVar171 = *(undefined4 *)(pauVar49[1] + lVar62 * 2);
                          auVar91._4_4_ = uVar171;
                          auVar91._0_4_ = uVar171;
                          auVar91._8_4_ = uVar171;
                          auVar91._12_4_ = uVar171;
                          auVar99 = vfmadd231ps_avx512vl(auVar128._0_16_,auVar102,auVar91);
                          auVar128 = ZEXT1664(auVar99);
                          uVar171 = *(undefined4 *)(pauVar49[1] + lVar62 * 2 + 4);
                          auVar92._4_4_ = uVar171;
                          auVar92._0_4_ = uVar171;
                          auVar92._8_4_ = uVar171;
                          auVar92._12_4_ = uVar171;
                          auVar100 = vfmadd231ps_avx512vl(auVar130._0_16_,auVar102,auVar92);
                          auVar130 = ZEXT1664(auVar100);
                          uVar171 = *(undefined4 *)(pauVar49[1] + lVar62 * 2 + 8);
                          auVar93._4_4_ = uVar171;
                          auVar93._0_4_ = uVar171;
                          auVar93._8_4_ = uVar171;
                          auVar93._12_4_ = uVar171;
                          auVar101 = vfmadd231ps_avx512vl(auVar132._0_16_,auVar102,auVar93);
                          auVar132 = ZEXT1664(auVar101);
                          uVar171 = *(undefined4 *)(pauVar49[1] + lVar62 * 2 + 0xc);
                          auVar94._4_4_ = uVar171;
                          auVar94._0_4_ = uVar171;
                          auVar94._8_4_ = uVar171;
                          auVar94._12_4_ = uVar171;
                          auVar102 = vfmadd231ps_avx512vl(auVar134._0_16_,auVar102,auVar94);
                          auVar134 = ZEXT1664(auVar102);
                          lVar62 = lVar62 + 0x10;
                          iVar68 = iVar68 + -1;
                        } while (iVar68 != 0);
                        pauVar49 = pauVar49 + uVar46 * 2 + 2;
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [16])*pauVar39 = auVar95;
                        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar96;
                        *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar97;
                        *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar98;
                        *(undefined1 (*) [16])pauVar39[1] = auVar99;
                        *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar100;
                        *(undefined1 (*) [16])(pauVar39[1] + 0x20) = auVar101;
                        *(undefined1 (*) [16])(pauVar39[1] + 0x30) = auVar102;
                      }
                      else {
                        if (iVar69 == 4) {
                          *pauVar55 = auVar95;
                          pauVar55[1] = auVar96;
                          pauVar55[2] = auVar97;
                          pauVar55[3] = auVar98;
                          pauVar55[4] = auVar99;
                          pauVar55[5] = auVar100;
                          pauVar55[6] = auVar101;
                          pauVar55[7] = auVar102;
                          pauVar55 = pauVar55 + 8;
                        }
                        if (iVar69 == 1) {
                          auVar103 = vunpcklps_avx(auVar95,auVar96);
                          auVar105 = vunpcklps_avx(auVar97,auVar98);
                          auVar104 = vunpckhps_avx(auVar95,auVar96);
                          auVar97 = vunpckhps_avx(auVar97,auVar98);
                          auVar95 = vmovlhps_avx(auVar103,auVar105);
                          auVar103 = vunpckhpd_avx(auVar103,auVar105);
                          auVar96 = vmovlhps_avx(auVar104,auVar97);
                          auVar104 = vunpckhpd_avx(auVar104,auVar97);
                          auVar98 = vunpcklps_avx(auVar99,auVar100);
                          auVar105 = vunpcklps_avx(auVar101,auVar102);
                          auVar100 = vunpckhps_avx(auVar99,auVar100);
                          auVar101 = vunpckhps_avx(auVar101,auVar102);
                          auVar97 = vmovlhps_avx(auVar98,auVar105);
                          auVar99 = vunpckhpd_avx(auVar98,auVar105);
                          auVar98 = vmovlhps_avx(auVar100,auVar101);
                          auVar100 = vunpckhpd_avx(auVar100,auVar101);
                          *pauVar55 = auVar95;
                          *(undefined1 (*) [16])(*pauVar55 + lVar45 * 4) = auVar103;
                          *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar96;
                          *(undefined1 (*) [16])(*pauVar55 + lVar42 * 4) = auVar104;
                          pauVar55[1] = auVar97;
                          *(undefined1 (*) [16])(pauVar55[1] + lVar45 * 4) = auVar99;
                          *(undefined1 (*) [16])(pauVar55[1] + lVar78 * 4) = auVar98;
                          *(undefined1 (*) [16])(pauVar55[1] + lVar42 * 4) = auVar100;
                          pauVar55 = pauVar55 + 2;
                        }
                      }
                      pauVar39 = pauVar39 + 2;
                      iVar68 = uVar80 + 0xf;
                      uVar80 = uVar80 + 8;
                    }
                    uVar52 = uVar80 | 3;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar95 = *(undefined1 (*) [16])*pauVar41;
                          auVar127 = ZEXT1664(auVar95);
                          auVar128 = ZEXT1664(auVar95);
                          auVar129 = ZEXT1664(auVar95);
                          auVar130 = ZEXT1664(auVar95);
                        }
                      }
                      else {
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x10));
                        auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x20));
                        auVar130 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x30));
                      }
                      auVar98 = auVar130._0_16_;
                      auVar97 = auVar129._0_16_;
                      auVar96 = auVar128._0_16_;
                      auVar95 = auVar127._0_16_;
                      if (0 < iVar35) {
                        lVar62 = 0;
                        iVar68 = iVar35;
                        do {
                          auVar98 = *(undefined1 (*) [16])(*pauVar53 + lVar62);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62);
                          auVar3._4_4_ = uVar171;
                          auVar3._0_4_ = uVar171;
                          auVar3._8_4_ = uVar171;
                          auVar3._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_avx512vl(auVar127._0_16_,auVar98,auVar3);
                          auVar127 = ZEXT1664(auVar95);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 + 4);
                          auVar4._4_4_ = uVar171;
                          auVar4._0_4_ = uVar171;
                          auVar4._8_4_ = uVar171;
                          auVar4._12_4_ = uVar171;
                          auVar96 = vfmadd231ps_avx512vl(auVar128._0_16_,auVar98,auVar4);
                          auVar128 = ZEXT1664(auVar96);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 + 8);
                          auVar5._4_4_ = uVar171;
                          auVar5._0_4_ = uVar171;
                          auVar5._8_4_ = uVar171;
                          auVar5._12_4_ = uVar171;
                          auVar97 = vfmadd231ps_avx512vl(auVar129._0_16_,auVar98,auVar5);
                          auVar129 = ZEXT1664(auVar97);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 + 0xc);
                          auVar6._4_4_ = uVar171;
                          auVar6._0_4_ = uVar171;
                          auVar6._8_4_ = uVar171;
                          auVar6._12_4_ = uVar171;
                          auVar98 = vfmadd231ps_avx512vl(auVar130._0_16_,auVar98,auVar6);
                          auVar130 = ZEXT1664(auVar98);
                          lVar62 = lVar62 + 0x10;
                          iVar68 = iVar68 + -1;
                        } while (iVar68 != 0);
                        pauVar49 = pauVar49 + uVar46 + 1;
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [16])*pauVar39 = auVar95;
                        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar96;
                        *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar97;
                        *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar98;
                      }
                      else {
                        if (iVar69 == 4) {
                          *pauVar55 = auVar95;
                          pauVar55[1] = auVar96;
                          pauVar55[2] = auVar97;
                          pauVar55[3] = auVar98;
                          pauVar55 = pauVar55 + 4;
                        }
                        if (iVar69 == 1) {
                          auVar100 = vunpcklps_avx(auVar95,auVar96);
                          auVar101 = vunpcklps_avx(auVar97,auVar98);
                          auVar99 = vunpckhps_avx(auVar95,auVar96);
                          auVar98 = vunpckhps_avx(auVar97,auVar98);
                          auVar95 = vmovlhps_avx(auVar100,auVar101);
                          auVar97 = vunpckhpd_avx(auVar100,auVar101);
                          auVar96 = vmovlhps_avx(auVar99,auVar98);
                          auVar98 = vunpckhpd_avx(auVar99,auVar98);
                          *pauVar55 = auVar95;
                          *(undefined1 (*) [16])(*pauVar55 + lVar45 * 4) = auVar97;
                          *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar96;
                          *(undefined1 (*) [16])(*pauVar55 + lVar42 * 4) = auVar98;
                          pauVar55 = pauVar55 + 1;
                        }
                      }
                      pauVar39 = pauVar39 + 1;
                      uVar52 = uVar80 + 7;
                      uVar80 = uVar80 + 4;
                    }
                    uVar52 = uVar80 | 1;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          auVar128 = ZEXT1664(*(undefined1 (*) [16])*pauVar41);
                          auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar41);
                        }
                      }
                      else {
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                        auVar127 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x10));
                      }
                      auVar96 = auVar127._0_16_;
                      auVar95 = auVar128._0_16_;
                      if (0 < iVar35) {
                        lVar62 = 0;
                        iVar68 = iVar35;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62);
                          auVar7._4_4_ = uVar171;
                          auVar7._0_4_ = uVar171;
                          auVar7._8_4_ = uVar171;
                          auVar7._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_avx512vl
                                              (auVar128._0_16_,
                                               *(undefined1 (*) [16])(*pauVar53 + lVar62 * 2),auVar7
                                              );
                          auVar128 = ZEXT1664(auVar95);
                          uVar171 = *(undefined4 *)(*pauVar49 + lVar62 + 4);
                          auVar8._4_4_ = uVar171;
                          auVar8._0_4_ = uVar171;
                          auVar8._8_4_ = uVar171;
                          auVar8._12_4_ = uVar171;
                          auVar96 = vfmadd231ps_avx512vl
                                              (auVar127._0_16_,
                                               *(undefined1 (*) [16])(*pauVar53 + lVar62 * 2),auVar8
                                              );
                          auVar127 = ZEXT1664(auVar96);
                          lVar62 = lVar62 + 8;
                          iVar68 = iVar68 + -1;
                        } while (iVar68 != 0);
                        pauVar49 = (undefined1 (*) [16])(*pauVar49 + uVar46 * 8 + 8);
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [16])*pauVar39 = auVar95;
                        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar96;
                      }
                      else {
                        if (iVar69 == 4) {
                          *pauVar55 = auVar95;
                          pauVar55[1] = auVar96;
                          pauVar55 = pauVar55 + 2;
                        }
                        if (iVar69 == 1) {
                          *(int *)*pauVar55 = auVar95._0_4_;
                          uVar171 = vextractps_avx(auVar95,1);
                          *(undefined4 *)(*pauVar55 + lVar45 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,2);
                          *(undefined4 *)(*pauVar55 + lVar78 * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar95,3);
                          *(undefined4 *)(*pauVar55 + (long)(iVar73 * 3) * 4) = uVar171;
                          *(int *)(*pauVar55 + 4) = auVar96._0_4_;
                          uVar171 = vextractps_avx(auVar96,1);
                          *(undefined4 *)
                           (*pauVar55 + ((long)((local_1d0 << 0x20) + 0x100000000) >> 0x20) * 4) =
                               uVar171;
                          uVar171 = vextractps_avx(auVar96,2);
                          *(undefined4 *)(*pauVar55 + (long)(iVar73 * 2 + 1) * 4) = uVar171;
                          uVar171 = vextractps_avx(auVar96,3);
                          *(undefined4 *)(*pauVar55 + local_288 * 4) = uVar171;
                          pauVar55 = (undefined1 (*) [16])(*pauVar55 + 8);
                        }
                      }
                      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                      uVar52 = uVar80 + 3;
                      uVar80 = uVar80 + 2;
                    }
                    if ((int)uVar80 < (int)uVar76) {
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar127 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar41);
                          }
                        }
                        else {
                          auVar127 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                        }
                        auVar95 = auVar127._0_16_;
                        if (0 < iVar35) {
                          lVar62 = 0;
                          iVar68 = iVar35;
                          do {
                            uVar171 = *(undefined4 *)(*pauVar49 + lVar62);
                            auVar9._4_4_ = uVar171;
                            auVar9._0_4_ = uVar171;
                            auVar9._8_4_ = uVar171;
                            auVar9._12_4_ = uVar171;
                            auVar95 = vfmadd231ps_avx512vl
                                                (auVar127._0_16_,
                                                 *(undefined1 (*) [16])(*pauVar53 + lVar62 * 4),
                                                 auVar9);
                            auVar127 = ZEXT1664(auVar95);
                            lVar62 = lVar62 + 4;
                            iVar68 = iVar68 + -1;
                          } while (iVar68 != 0);
                          pauVar49 = (undefined1 (*) [16])(*pauVar49 + uVar46 * 4 + 4);
                        }
                        if (iVar44 < K) {
                          *(undefined1 (*) [16])*pauVar39 = auVar95;
                        }
                        else {
                          if (iVar69 == 4) {
                            *pauVar55 = auVar95;
                            pauVar55 = pauVar55 + 1;
                          }
                          if (iVar69 == 1) {
                            *(int *)*pauVar55 = auVar95._0_4_;
                            uVar171 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar55 + lVar45 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar55 + lVar78 * 4) = uVar171;
                            uVar171 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar55 + lVar42 * 4) = uVar171;
                            pauVar55 = (undefined1 (*) [16])(*pauVar55 + 4);
                          }
                        }
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
                        uVar80 = uVar80 + 1;
                      } while (uVar80 != uVar76);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + local_278);
                    uVar61 = local_268 + 4;
                    local_300 = pauVar41;
                  } while ((long)(local_268 + 7) < local_1c8);
                }
                if ((int)((uint)uVar61 | 1) < (int)uVar47) {
                  uVar46 = (ulong)(iVar35 - 1);
                  uVar66 = (ulong)(iVar35 + 0xfU & 0xfffffff0);
                  auVar127 = vpbroadcastq_avx512f();
                  iVar69 = local_170;
                  if (local_f8 < local_170) {
                    iVar69 = TILE_K;
                  }
                  iVar68 = local_170;
                  if (local_f8 < local_170) {
                    iVar68 = TILE_K;
                  }
                  lVar78 = (long)iVar73;
                  uVar48 = (long)(int)(uint)uVar61;
                  do {
                    pauVar41 = (undefined1 (*) [64])
                               ((long)local_250->data + uVar48 * 4 + local_1c0 * 4);
                    if (local_300 == (undefined1 (*) [64])0x0) {
                      pauVar41 = local_300;
                    }
                    uVar80 = 0;
                    pauVar55 = (undefined1 (*) [16])
                               ((long)local_258->data +
                               local_118 * 4 + (uVar48 + local_1c0) * lVar78 * 4);
                    pauVar49 = local_298;
                    if (0xb < (int)uVar76) {
                      uVar52 = 0;
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar132 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar133 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar171 = *(undefined4 *)*pauVar41;
                            auVar172._4_4_ = uVar171;
                            auVar172._0_4_ = uVar171;
                            auVar172._8_4_ = uVar171;
                            auVar172._12_4_ = uVar171;
                            auVar128 = ZEXT1664(auVar172);
                            uVar171 = *(undefined4 *)(*pauVar41 + 4);
                            auVar197._4_4_ = uVar171;
                            auVar197._0_4_ = uVar171;
                            auVar197._8_4_ = uVar171;
                            auVar197._12_4_ = uVar171;
                            auVar131 = ZEXT1664(auVar197);
                            auVar129 = ZEXT1664(auVar172);
                            auVar130 = ZEXT1664(auVar172);
                            auVar132 = ZEXT1664(auVar197);
                            auVar133 = ZEXT1664(auVar197);
                          }
                        }
                        else {
                          auVar95 = vshufps_avx(*(undefined1 (*) [16])*pauVar39,
                                                *(undefined1 (*) [16])(*pauVar39 + 0x10),0x88);
                          auVar128 = ZEXT1664(auVar95);
                          auVar95 = vshufps_avx(*(undefined1 (*) [16])(*pauVar39 + 0x20),
                                                *(undefined1 (*) [16])(*pauVar39 + 0x30),0x88);
                          auVar129 = ZEXT1664(auVar95);
                          auVar95 = vshufps_avx(*(undefined1 (*) [16])pauVar39[1],
                                                *(undefined1 (*) [16])(pauVar39[1] + 0x10),0x88);
                          auVar130 = ZEXT1664(auVar95);
                          auVar95 = vshufps_avx(*(undefined1 (*) [16])*pauVar39,
                                                *(undefined1 (*) [16])(*pauVar39 + 0x10),0xdd);
                          auVar131 = ZEXT1664(auVar95);
                          auVar95 = vshufps_avx(*(undefined1 (*) [16])(*pauVar39 + 0x20),
                                                *(undefined1 (*) [16])(*pauVar39 + 0x30),0xdd);
                          auVar132 = ZEXT1664(auVar95);
                          auVar95 = vshufps_avx(*(undefined1 (*) [16])pauVar39[1],
                                                *(undefined1 (*) [16])(pauVar39[1] + 0x10),0xdd);
                          auVar133 = ZEXT1664(auVar95);
                        }
                        auVar100 = auVar133._0_16_;
                        auVar97 = auVar130._0_16_;
                        auVar99 = auVar132._0_16_;
                        auVar96 = auVar129._0_16_;
                        auVar98 = auVar131._0_16_;
                        auVar95 = auVar128._0_16_;
                        if (0 < iVar35) {
                          lVar42 = 0;
                          pauVar58 = pauVar49;
                          do {
                            uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 8);
                            auVar210._4_4_ = uVar171;
                            auVar210._0_4_ = uVar171;
                            auVar210._8_4_ = uVar171;
                            auVar210._12_4_ = uVar171;
                            auVar95 = vfmadd231ps_fma(auVar128._0_16_,auVar210,*pauVar58);
                            auVar128 = ZEXT1664(auVar95);
                            auVar96 = vfmadd231ps_fma(auVar129._0_16_,auVar210,pauVar58[1]);
                            auVar129 = ZEXT1664(auVar96);
                            auVar97 = vfmadd231ps_fma(auVar130._0_16_,pauVar58[2],auVar210);
                            auVar130 = ZEXT1664(auVar97);
                            uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 8 + 4);
                            auVar211._4_4_ = uVar171;
                            auVar211._0_4_ = uVar171;
                            auVar211._8_4_ = uVar171;
                            auVar211._12_4_ = uVar171;
                            auVar98 = vfmadd231ps_fma(auVar131._0_16_,auVar211,*pauVar58);
                            auVar131 = ZEXT1664(auVar98);
                            auVar99 = vfmadd231ps_fma(auVar132._0_16_,auVar211,pauVar58[1]);
                            auVar132 = ZEXT1664(auVar99);
                            auVar100 = vfmadd231ps_fma(auVar133._0_16_,auVar211,pauVar58[2]);
                            auVar133 = ZEXT1664(auVar100);
                            pauVar58 = pauVar58 + 3;
                            lVar42 = lVar42 + 1;
                          } while (iVar69 != (int)lVar42);
                          pauVar49 = pauVar49 + uVar46 * 3 + 3;
                        }
                        if (iVar44 < K) {
                          auVar101 = vunpcklps_avx(auVar95,auVar98);
                          auVar95 = vunpckhps_avx(auVar95,auVar98);
                          auVar98 = vunpcklps_avx(auVar96,auVar99);
                          auVar96 = vunpckhps_avx(auVar96,auVar99);
                          auVar99 = vunpcklps_avx(auVar97,auVar100);
                          auVar97 = vunpckhps_avx(auVar97,auVar100);
                          *(undefined1 (*) [16])*pauVar39 = auVar101;
                          *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar95;
                          *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar98;
                          *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar96;
                          *(undefined1 (*) [16])pauVar39[1] = auVar99;
                          *(undefined1 (*) [16])(pauVar39[1] + 0x10) = auVar97;
                        }
                        else {
                          *pauVar55 = auVar95;
                          pauVar55[1] = auVar96;
                          pauVar55[2] = auVar97;
                          *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar98;
                          *(undefined1 (*) [16])(pauVar55[1] + lVar78 * 4) = auVar99;
                          *(undefined1 (*) [16])(pauVar55[2] + lVar78 * 4) = auVar100;
                          pauVar55 = pauVar55 + 3;
                        }
                        pauVar39 = (undefined1 (*) [64])(pauVar39[1] + 0x20);
                        uVar80 = uVar52 + 0xc;
                        iVar67 = uVar52 + 0x17;
                        uVar52 = uVar80;
                      } while (iVar67 < (int)uVar76);
                    }
                    iVar67 = uVar80 + 7;
                    while (iVar67 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar131 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar171 = *(undefined4 *)*pauVar41;
                          auVar173._4_4_ = uVar171;
                          auVar173._0_4_ = uVar171;
                          auVar173._8_4_ = uVar171;
                          auVar173._12_4_ = uVar171;
                          auVar128 = ZEXT1664(auVar173);
                          uVar171 = *(undefined4 *)(*pauVar41 + 4);
                          auVar195._4_4_ = uVar171;
                          auVar195._0_4_ = uVar171;
                          auVar195._8_4_ = uVar171;
                          auVar195._12_4_ = uVar171;
                          auVar130 = ZEXT1664(auVar195);
                          auVar129 = ZEXT1664(auVar173);
                          auVar131 = ZEXT1664(auVar195);
                        }
                      }
                      else {
                        auVar95 = vshufps_avx(*(undefined1 (*) [16])*pauVar39,
                                              *(undefined1 (*) [16])(*pauVar39 + 0x10),0x88);
                        auVar128 = ZEXT1664(auVar95);
                        auVar95 = vshufps_avx(*(undefined1 (*) [16])(*pauVar39 + 0x20),
                                              *(undefined1 (*) [16])(*pauVar39 + 0x30),0x88);
                        auVar129 = ZEXT1664(auVar95);
                        auVar95 = vshufps_avx(*(undefined1 (*) [16])*pauVar39,
                                              *(undefined1 (*) [16])(*pauVar39 + 0x10),0xdd);
                        auVar130 = ZEXT1664(auVar95);
                        auVar95 = vshufps_avx(*(undefined1 (*) [16])(*pauVar39 + 0x20),
                                              *(undefined1 (*) [16])(*pauVar39 + 0x30),0xdd);
                        auVar131 = ZEXT1664(auVar95);
                      }
                      auVar98 = auVar131._0_16_;
                      auVar96 = auVar129._0_16_;
                      auVar97 = auVar130._0_16_;
                      auVar95 = auVar128._0_16_;
                      if (0 < iVar35) {
                        lVar42 = 0;
                        pauVar58 = pauVar49;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 8);
                          auVar207._4_4_ = uVar171;
                          auVar207._0_4_ = uVar171;
                          auVar207._8_4_ = uVar171;
                          auVar207._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_fma(auVar128._0_16_,auVar207,*pauVar58);
                          auVar128 = ZEXT1664(auVar95);
                          auVar96 = vfmadd231ps_fma(auVar129._0_16_,pauVar58[1],auVar207);
                          auVar129 = ZEXT1664(auVar96);
                          uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 8 + 4);
                          auVar208._4_4_ = uVar171;
                          auVar208._0_4_ = uVar171;
                          auVar208._8_4_ = uVar171;
                          auVar208._12_4_ = uVar171;
                          auVar97 = vfmadd231ps_fma(auVar130._0_16_,auVar208,*pauVar58);
                          auVar130 = ZEXT1664(auVar97);
                          auVar98 = vfmadd231ps_fma(auVar131._0_16_,auVar208,pauVar58[1]);
                          auVar131 = ZEXT1664(auVar98);
                          pauVar58 = pauVar58 + 2;
                          lVar42 = lVar42 + 1;
                        } while (iVar69 != (int)lVar42);
                        pauVar49 = pauVar49 + uVar46 * 2 + 2;
                      }
                      if (iVar44 < K) {
                        auVar99 = vunpcklps_avx(auVar95,auVar97);
                        auVar95 = vunpckhps_avx(auVar95,auVar97);
                        auVar97 = vunpcklps_avx(auVar96,auVar98);
                        auVar96 = vunpckhps_avx(auVar96,auVar98);
                        *(undefined1 (*) [16])*pauVar39 = auVar99;
                        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar95;
                        *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar97;
                        *(undefined1 (*) [16])(*pauVar39 + 0x30) = auVar96;
                      }
                      else {
                        *pauVar55 = auVar95;
                        pauVar55[1] = auVar96;
                        *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar97;
                        *(undefined1 (*) [16])(pauVar55[1] + lVar78 * 4) = auVar98;
                        pauVar55 = pauVar55 + 2;
                      }
                      pauVar39 = pauVar39 + 1;
                      iVar67 = uVar80 + 0xf;
                      uVar80 = uVar80 + 8;
                    }
                    uVar52 = uVar80 | 3;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar171 = *(undefined4 *)*pauVar41;
                          auVar128 = ZEXT1664(CONCAT412(uVar171,CONCAT48(uVar171,CONCAT44(uVar171,
                                                  uVar171))));
                          uVar171 = *(undefined4 *)(*pauVar41 + 4);
                          auVar129 = ZEXT1664(CONCAT412(uVar171,CONCAT48(uVar171,CONCAT44(uVar171,
                                                  uVar171))));
                        }
                      }
                      else {
                        auVar95 = vshufps_avx(*(undefined1 (*) [16])*pauVar39,
                                              *(undefined1 (*) [16])(*pauVar39 + 0x10),0x88);
                        auVar128 = ZEXT1664(auVar95);
                        auVar95 = vshufps_avx(*(undefined1 (*) [16])*pauVar39,
                                              *(undefined1 (*) [16])(*pauVar39 + 0x10),0xdd);
                        auVar129 = ZEXT1664(auVar95);
                      }
                      auVar96 = auVar129._0_16_;
                      auVar95 = auVar128._0_16_;
                      if (0 < iVar35) {
                        lVar42 = 0;
                        pauVar58 = pauVar49;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 8);
                          auVar10._4_4_ = uVar171;
                          auVar10._0_4_ = uVar171;
                          auVar10._8_4_ = uVar171;
                          auVar10._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_avx512vl(auVar128._0_16_,*pauVar58,auVar10);
                          auVar128 = ZEXT1664(auVar95);
                          uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 8 + 4);
                          auVar11._4_4_ = uVar171;
                          auVar11._0_4_ = uVar171;
                          auVar11._8_4_ = uVar171;
                          auVar11._12_4_ = uVar171;
                          auVar96 = vfmadd231ps_avx512vl(auVar129._0_16_,*pauVar58,auVar11);
                          auVar129 = ZEXT1664(auVar96);
                          pauVar58 = pauVar58 + 1;
                          lVar42 = lVar42 + 1;
                        } while (iVar68 != (int)lVar42);
                        pauVar49 = pauVar49 + uVar46 + 1;
                      }
                      if (iVar44 < K) {
                        auVar97 = vunpcklps_avx(auVar95,auVar96);
                        auVar95 = vunpckhps_avx(auVar95,auVar96);
                        *(undefined1 (*) [16])*pauVar39 = auVar97;
                        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar95;
                      }
                      else {
                        *pauVar55 = auVar95;
                        *(undefined1 (*) [16])(*pauVar55 + lVar78 * 4) = auVar96;
                        pauVar55 = pauVar55 + 1;
                      }
                      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                      uVar52 = uVar80 + 7;
                      uVar80 = uVar80 + 4;
                    }
                    uVar52 = uVar80 | 1;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          uVar171 = 0;
                          uVar185 = 0;
                          uVar202 = 0;
                          uVar184 = 0;
                        }
                        else {
                          uVar171 = *(undefined4 *)*pauVar41;
                          uVar185 = *(undefined4 *)(*pauVar41 + 4);
                          uVar202 = uVar171;
                          uVar184 = uVar185;
                        }
                      }
                      else {
                        uVar171 = *(undefined4 *)*pauVar39;
                        uVar185 = *(undefined4 *)(*pauVar39 + 4);
                        uVar202 = *(undefined4 *)(*pauVar39 + 8);
                        uVar184 = *(undefined4 *)(*pauVar39 + 0xc);
                      }
                      if (0 < iVar35) {
                        uVar2 = SUB128(ZEXT812(0),4);
                        uVar61 = 0;
                        auVar132 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar133 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        pauVar57 = pauVar53;
                        pauVar58 = pauVar49;
                        auVar128 = ZEXT1264(CONCAT84(uVar2,uVar171));
                        auVar129 = ZEXT1264(CONCAT84(uVar2,uVar202));
                        auVar130 = ZEXT1264(CONCAT84(uVar2,uVar185));
                        auVar131 = ZEXT1264(CONCAT84(uVar2,uVar184));
                        do {
                          auVar137 = auVar131;
                          auVar136 = auVar130;
                          auVar135 = auVar129;
                          auVar134 = auVar128;
                          auVar128 = vpbroadcastq_avx512f();
                          auVar129 = vporq_avx512f(auVar128,auVar132);
                          auVar128 = vporq_avx512f(auVar128,auVar133);
                          uVar2 = vpcmpuq_avx512f(auVar128,auVar127,2);
                          bVar36 = (byte)uVar2;
                          uVar2 = vpcmpuq_avx512f(auVar129,auVar127,2);
                          bVar37 = (byte)uVar2;
                          uVar86 = CONCAT11(bVar37,bVar36);
                          auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar57 + lVar78));
                          auVar131._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar128._4_4_;
                          auVar131._0_4_ = (uint)(bVar36 & 1) * auVar128._0_4_;
                          auVar131._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar128._8_4_;
                          auVar131._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar128._12_4_;
                          auVar131._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar128._16_4_;
                          auVar131._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar128._20_4_;
                          auVar131._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar128._24_4_;
                          auVar131._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar128._28_4_;
                          auVar131._32_4_ = (uint)(bVar37 & 1) * auVar128._32_4_;
                          auVar131._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar128._36_4_;
                          auVar131._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar128._40_4_;
                          auVar131._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar128._44_4_;
                          auVar131._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar128._48_4_;
                          auVar131._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar128._52_4_;
                          auVar131._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar128._56_4_;
                          auVar131._60_4_ = (uint)(bVar37 >> 7) * auVar128._60_4_;
                          auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar58 + lVar78));
                          auVar151._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar128._4_4_;
                          auVar151._0_4_ = (uint)(bVar36 & 1) * auVar128._0_4_;
                          auVar151._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar128._8_4_;
                          auVar151._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar128._12_4_;
                          auVar151._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar128._16_4_;
                          auVar151._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar128._20_4_;
                          auVar151._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar128._24_4_;
                          auVar151._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar128._28_4_;
                          auVar151._32_4_ = (uint)(bVar37 & 1) * auVar128._32_4_;
                          auVar151._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar128._36_4_;
                          auVar151._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar128._40_4_;
                          auVar151._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar128._44_4_;
                          auVar151._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar128._48_4_;
                          auVar151._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar128._52_4_;
                          auVar151._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar128._56_4_;
                          auVar151._60_4_ = (uint)(bVar37 >> 7) * auVar128._60_4_;
                          auVar128 = vfmadd213ps_avx512f(auVar131,auVar151,auVar134);
                          auVar129 = vgatherdps_avx512f(*(undefined4 *)(*pauVar57 + lVar78 + 4));
                          auVar152._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar129._4_4_;
                          auVar152._0_4_ = (uint)(bVar36 & 1) * auVar129._0_4_;
                          auVar152._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar129._8_4_;
                          auVar152._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar129._12_4_;
                          auVar152._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar129._16_4_;
                          auVar152._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar129._20_4_;
                          auVar152._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar129._24_4_;
                          auVar152._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar129._28_4_;
                          auVar152._32_4_ = (uint)(bVar37 & 1) * auVar129._32_4_;
                          auVar152._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar129._36_4_;
                          auVar152._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar129._40_4_;
                          auVar152._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar129._44_4_;
                          auVar152._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar129._48_4_;
                          auVar152._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar129._52_4_;
                          auVar152._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar129._56_4_;
                          auVar152._60_4_ = (uint)(bVar37 >> 7) * auVar129._60_4_;
                          auVar130 = vfmadd213ps_avx512f(auVar151,auVar152,auVar136);
                          auVar129 = vgatherdps_avx512f(*(undefined4 *)(*pauVar58 + lVar78 + 4));
                          auVar153._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar129._4_4_;
                          auVar153._0_4_ = (uint)(bVar36 & 1) * auVar129._0_4_;
                          auVar153._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar129._8_4_;
                          auVar153._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar129._12_4_;
                          auVar153._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar129._16_4_;
                          auVar153._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar129._20_4_;
                          auVar153._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar129._24_4_;
                          auVar153._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar129._28_4_;
                          auVar153._32_4_ = (uint)(bVar37 & 1) * auVar129._32_4_;
                          auVar153._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar129._36_4_;
                          auVar153._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar129._40_4_;
                          auVar153._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar129._44_4_;
                          auVar153._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar129._48_4_;
                          auVar153._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar129._52_4_;
                          auVar153._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar129._56_4_;
                          auVar153._60_4_ = (uint)(bVar37 >> 7) * auVar129._60_4_;
                          auVar129 = vfmadd213ps_avx512f(auVar131,auVar153,auVar135);
                          auVar131 = vfmadd213ps_avx512f(auVar153,auVar152,auVar137);
                          uVar61 = uVar61 + 0x10;
                          pauVar57 = pauVar57 + 2;
                          pauVar58 = pauVar58 + 8;
                        } while (uVar66 != uVar61);
                        auVar154._0_4_ =
                             (uint)(bVar36 & 1) * auVar131._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * auVar137._0_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                        auVar154._4_4_ =
                             (uint)bVar81 * auVar131._4_4_ | (uint)!bVar81 * auVar137._4_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                        auVar154._8_4_ =
                             (uint)bVar81 * auVar131._8_4_ | (uint)!bVar81 * auVar137._8_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                        auVar154._12_4_ =
                             (uint)bVar81 * auVar131._12_4_ | (uint)!bVar81 * auVar137._12_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                        auVar154._16_4_ =
                             (uint)bVar81 * auVar131._16_4_ | (uint)!bVar81 * auVar137._16_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                        auVar154._20_4_ =
                             (uint)bVar81 * auVar131._20_4_ | (uint)!bVar81 * auVar137._20_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                        auVar154._24_4_ =
                             (uint)bVar81 * auVar131._24_4_ | (uint)!bVar81 * auVar137._24_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                        auVar154._28_4_ =
                             (uint)bVar81 * auVar131._28_4_ | (uint)!bVar81 * auVar137._28_4_;
                        auVar154._32_4_ =
                             (uint)(bVar37 & 1) * auVar131._32_4_ |
                             (uint)!(bool)(bVar37 & 1) * auVar137._32_4_;
                        bVar81 = (bool)(bVar37 >> 1 & 1);
                        auVar154._36_4_ =
                             (uint)bVar81 * auVar131._36_4_ | (uint)!bVar81 * auVar137._36_4_;
                        bVar81 = (bool)(bVar37 >> 2 & 1);
                        auVar154._40_4_ =
                             (uint)bVar81 * auVar131._40_4_ | (uint)!bVar81 * auVar137._40_4_;
                        bVar81 = (bool)(bVar37 >> 3 & 1);
                        auVar154._44_4_ =
                             (uint)bVar81 * auVar131._44_4_ | (uint)!bVar81 * auVar137._44_4_;
                        bVar81 = (bool)(bVar37 >> 4 & 1);
                        auVar154._48_4_ =
                             (uint)bVar81 * auVar131._48_4_ | (uint)!bVar81 * auVar137._48_4_;
                        bVar81 = (bool)(bVar37 >> 5 & 1);
                        auVar154._52_4_ =
                             (uint)bVar81 * auVar131._52_4_ | (uint)!bVar81 * auVar137._52_4_;
                        bVar81 = (bool)(bVar37 >> 6 & 1);
                        auVar154._56_4_ =
                             (uint)bVar81 * auVar131._56_4_ | (uint)!bVar81 * auVar137._56_4_;
                        auVar154._60_4_ =
                             (uint)(bVar37 >> 7) * auVar131._60_4_ |
                             (uint)!(bool)(bVar37 >> 7) * auVar137._60_4_;
                        auVar109 = vextractf64x4_avx512f(auVar154,1);
                        auVar131 = vaddps_avx512f(auVar154,ZEXT3264(auVar109));
                        auVar186._0_4_ = auVar131._16_4_ + auVar131._0_4_;
                        auVar186._4_4_ = auVar131._20_4_ + auVar131._4_4_;
                        auVar186._8_4_ = auVar131._24_4_ + auVar131._8_4_;
                        auVar186._12_4_ = auVar131._28_4_ + auVar131._12_4_;
                        auVar95 = vshufpd_avx(auVar186,auVar186,1);
                        auVar187._0_4_ = auVar95._0_4_ + auVar186._0_4_;
                        auVar187._4_4_ = auVar95._4_4_ + auVar186._4_4_;
                        auVar187._8_4_ = auVar95._8_4_ + auVar186._8_4_;
                        auVar187._12_4_ = auVar95._12_4_ + auVar186._12_4_;
                        auVar95 = vhaddps_avx(auVar187,auVar187);
                        uVar184 = auVar95._0_4_;
                        auVar155._0_4_ =
                             (uint)(bVar36 & 1) * auVar130._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * auVar136._0_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                        auVar155._4_4_ =
                             (uint)bVar81 * auVar130._4_4_ | (uint)!bVar81 * auVar136._4_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                        auVar155._8_4_ =
                             (uint)bVar81 * auVar130._8_4_ | (uint)!bVar81 * auVar136._8_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                        auVar155._12_4_ =
                             (uint)bVar81 * auVar130._12_4_ | (uint)!bVar81 * auVar136._12_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                        auVar155._16_4_ =
                             (uint)bVar81 * auVar130._16_4_ | (uint)!bVar81 * auVar136._16_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                        auVar155._20_4_ =
                             (uint)bVar81 * auVar130._20_4_ | (uint)!bVar81 * auVar136._20_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                        auVar155._24_4_ =
                             (uint)bVar81 * auVar130._24_4_ | (uint)!bVar81 * auVar136._24_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                        auVar155._28_4_ =
                             (uint)bVar81 * auVar130._28_4_ | (uint)!bVar81 * auVar136._28_4_;
                        auVar155._32_4_ =
                             (uint)(bVar37 & 1) * auVar130._32_4_ |
                             (uint)!(bool)(bVar37 & 1) * auVar136._32_4_;
                        bVar81 = (bool)(bVar37 >> 1 & 1);
                        auVar155._36_4_ =
                             (uint)bVar81 * auVar130._36_4_ | (uint)!bVar81 * auVar136._36_4_;
                        bVar81 = (bool)(bVar37 >> 2 & 1);
                        auVar155._40_4_ =
                             (uint)bVar81 * auVar130._40_4_ | (uint)!bVar81 * auVar136._40_4_;
                        bVar81 = (bool)(bVar37 >> 3 & 1);
                        auVar155._44_4_ =
                             (uint)bVar81 * auVar130._44_4_ | (uint)!bVar81 * auVar136._44_4_;
                        bVar81 = (bool)(bVar37 >> 4 & 1);
                        auVar155._48_4_ =
                             (uint)bVar81 * auVar130._48_4_ | (uint)!bVar81 * auVar136._48_4_;
                        bVar81 = (bool)(bVar37 >> 5 & 1);
                        auVar155._52_4_ =
                             (uint)bVar81 * auVar130._52_4_ | (uint)!bVar81 * auVar136._52_4_;
                        bVar81 = (bool)(bVar37 >> 6 & 1);
                        auVar155._56_4_ =
                             (uint)bVar81 * auVar130._56_4_ | (uint)!bVar81 * auVar136._56_4_;
                        auVar155._60_4_ =
                             (uint)(bVar37 >> 7) * auVar130._60_4_ |
                             (uint)!(bool)(bVar37 >> 7) * auVar136._60_4_;
                        auVar156._0_4_ =
                             (uint)(bVar36 & 1) * auVar129._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * auVar135._0_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                        auVar156._4_4_ =
                             (uint)bVar81 * auVar129._4_4_ | (uint)!bVar81 * auVar135._4_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                        auVar156._8_4_ =
                             (uint)bVar81 * auVar129._8_4_ | (uint)!bVar81 * auVar135._8_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                        auVar156._12_4_ =
                             (uint)bVar81 * auVar129._12_4_ | (uint)!bVar81 * auVar135._12_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                        auVar156._16_4_ =
                             (uint)bVar81 * auVar129._16_4_ | (uint)!bVar81 * auVar135._16_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                        auVar156._20_4_ =
                             (uint)bVar81 * auVar129._20_4_ | (uint)!bVar81 * auVar135._20_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                        auVar156._24_4_ =
                             (uint)bVar81 * auVar129._24_4_ | (uint)!bVar81 * auVar135._24_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                        auVar156._28_4_ =
                             (uint)bVar81 * auVar129._28_4_ | (uint)!bVar81 * auVar135._28_4_;
                        auVar156._32_4_ =
                             (uint)(bVar37 & 1) * auVar129._32_4_ |
                             (uint)!(bool)(bVar37 & 1) * auVar135._32_4_;
                        bVar81 = (bool)(bVar37 >> 1 & 1);
                        auVar156._36_4_ =
                             (uint)bVar81 * auVar129._36_4_ | (uint)!bVar81 * auVar135._36_4_;
                        bVar81 = (bool)(bVar37 >> 2 & 1);
                        auVar156._40_4_ =
                             (uint)bVar81 * auVar129._40_4_ | (uint)!bVar81 * auVar135._40_4_;
                        bVar81 = (bool)(bVar37 >> 3 & 1);
                        auVar156._44_4_ =
                             (uint)bVar81 * auVar129._44_4_ | (uint)!bVar81 * auVar135._44_4_;
                        bVar81 = (bool)(bVar37 >> 4 & 1);
                        auVar156._48_4_ =
                             (uint)bVar81 * auVar129._48_4_ | (uint)!bVar81 * auVar135._48_4_;
                        bVar81 = (bool)(bVar37 >> 5 & 1);
                        auVar156._52_4_ =
                             (uint)bVar81 * auVar129._52_4_ | (uint)!bVar81 * auVar135._52_4_;
                        bVar81 = (bool)(bVar37 >> 6 & 1);
                        auVar156._56_4_ =
                             (uint)bVar81 * auVar129._56_4_ | (uint)!bVar81 * auVar135._56_4_;
                        auVar156._60_4_ =
                             (uint)(bVar37 >> 7) * auVar129._60_4_ |
                             (uint)!(bool)(bVar37 >> 7) * auVar135._60_4_;
                        auVar109 = vextractf64x4_avx512f(auVar156,1);
                        auVar129 = vaddps_avx512f(auVar156,ZEXT3264(auVar109));
                        auVar203._0_4_ = auVar129._0_4_ + auVar129._16_4_;
                        auVar203._4_4_ = auVar129._4_4_ + auVar129._20_4_;
                        auVar203._8_4_ = auVar129._8_4_ + auVar129._24_4_;
                        auVar203._12_4_ = auVar129._12_4_ + auVar129._28_4_;
                        auVar95 = vshufpd_avx(auVar203,auVar203,1);
                        auVar204._0_4_ = auVar203._0_4_ + auVar95._0_4_;
                        auVar204._4_4_ = auVar203._4_4_ + auVar95._4_4_;
                        auVar204._8_4_ = auVar203._8_4_ + auVar95._8_4_;
                        auVar204._12_4_ = auVar203._12_4_ + auVar95._12_4_;
                        auVar95 = vhaddps_avx(auVar204,auVar204);
                        uVar202 = auVar95._0_4_;
                        auVar109 = vextractf64x4_avx512f(auVar155,1);
                        auVar129 = vaddps_avx512f(auVar155,ZEXT3264(auVar109));
                        auVar198._0_4_ = auVar129._0_4_ + auVar129._16_4_;
                        auVar198._4_4_ = auVar129._4_4_ + auVar129._20_4_;
                        auVar198._8_4_ = auVar129._8_4_ + auVar129._24_4_;
                        auVar198._12_4_ = auVar129._12_4_ + auVar129._28_4_;
                        auVar95 = vshufpd_avx(auVar198,auVar198,1);
                        auVar199._0_4_ = auVar198._0_4_ + auVar95._0_4_;
                        auVar199._4_4_ = auVar198._4_4_ + auVar95._4_4_;
                        auVar199._8_4_ = auVar198._8_4_ + auVar95._8_4_;
                        auVar199._12_4_ = auVar198._12_4_ + auVar95._12_4_;
                        auVar95 = vhaddps_avx(auVar199,auVar199);
                        uVar185 = auVar95._0_4_;
                        auVar157._0_4_ =
                             (uint)(bVar36 & 1) * auVar128._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * auVar134._0_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                        auVar157._4_4_ =
                             (uint)bVar81 * auVar128._4_4_ | (uint)!bVar81 * auVar134._4_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                        auVar157._8_4_ =
                             (uint)bVar81 * auVar128._8_4_ | (uint)!bVar81 * auVar134._8_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                        auVar157._12_4_ =
                             (uint)bVar81 * auVar128._12_4_ | (uint)!bVar81 * auVar134._12_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                        auVar157._16_4_ =
                             (uint)bVar81 * auVar128._16_4_ | (uint)!bVar81 * auVar134._16_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                        auVar157._20_4_ =
                             (uint)bVar81 * auVar128._20_4_ | (uint)!bVar81 * auVar134._20_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                        auVar157._24_4_ =
                             (uint)bVar81 * auVar128._24_4_ | (uint)!bVar81 * auVar134._24_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                        auVar157._28_4_ =
                             (uint)bVar81 * auVar128._28_4_ | (uint)!bVar81 * auVar134._28_4_;
                        auVar157._32_4_ =
                             (uint)(bVar37 & 1) * auVar128._32_4_ |
                             (uint)!(bool)(bVar37 & 1) * auVar134._32_4_;
                        bVar81 = (bool)(bVar37 >> 1 & 1);
                        auVar157._36_4_ =
                             (uint)bVar81 * auVar128._36_4_ | (uint)!bVar81 * auVar134._36_4_;
                        bVar81 = (bool)(bVar37 >> 2 & 1);
                        auVar157._40_4_ =
                             (uint)bVar81 * auVar128._40_4_ | (uint)!bVar81 * auVar134._40_4_;
                        bVar81 = (bool)(bVar37 >> 3 & 1);
                        auVar157._44_4_ =
                             (uint)bVar81 * auVar128._44_4_ | (uint)!bVar81 * auVar134._44_4_;
                        bVar81 = (bool)(bVar37 >> 4 & 1);
                        auVar157._48_4_ =
                             (uint)bVar81 * auVar128._48_4_ | (uint)!bVar81 * auVar134._48_4_;
                        bVar81 = (bool)(bVar37 >> 5 & 1);
                        auVar157._52_4_ =
                             (uint)bVar81 * auVar128._52_4_ | (uint)!bVar81 * auVar134._52_4_;
                        bVar81 = (bool)(bVar37 >> 6 & 1);
                        auVar157._56_4_ =
                             (uint)bVar81 * auVar128._56_4_ | (uint)!bVar81 * auVar134._56_4_;
                        auVar157._60_4_ =
                             (uint)(bVar37 >> 7) * auVar128._60_4_ |
                             (uint)!(bool)(bVar37 >> 7) * auVar134._60_4_;
                        auVar109 = vextractf64x4_avx512f(auVar157,1);
                        auVar128 = vaddps_avx512f(auVar157,ZEXT3264(auVar109));
                        auVar174._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                        auVar174._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                        auVar174._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                        auVar174._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                        auVar95 = vshufpd_avx(auVar174,auVar174,1);
                        auVar175._0_4_ = auVar174._0_4_ + auVar95._0_4_;
                        auVar175._4_4_ = auVar174._4_4_ + auVar95._4_4_;
                        auVar175._8_4_ = auVar174._8_4_ + auVar95._8_4_;
                        auVar175._12_4_ = auVar174._12_4_ + auVar95._12_4_;
                        auVar95 = vhaddps_avx(auVar175,auVar175);
                        uVar171 = auVar95._0_4_;
                        pauVar49 = (undefined1 (*) [16])(*pauVar49 + uVar46 * 8 + 8);
                      }
                      if (iVar44 < K) {
                        *(undefined4 *)*pauVar39 = uVar171;
                        *(undefined4 *)(*pauVar39 + 4) = uVar185;
                        *(undefined4 *)(*pauVar39 + 8) = uVar202;
                        *(undefined4 *)(*pauVar39 + 0xc) = uVar184;
                      }
                      else {
                        *(undefined4 *)*pauVar55 = uVar171;
                        *(undefined4 *)(*pauVar55 + 4) = uVar202;
                        *(undefined4 *)(*pauVar55 + lVar78 * 4) = uVar185;
                        *(undefined4 *)
                         (*pauVar55 + ((long)((local_1d0 << 0x20) + 0x100000000) >> 0x20) * 4) =
                             uVar184;
                        pauVar55 = (undefined1 (*) [16])(*pauVar55 + 8);
                      }
                      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
                      uVar52 = uVar80 + 3;
                      uVar80 = uVar80 + 2;
                    }
                    if ((int)uVar80 < (int)uVar76) {
                      do {
                        pauVar57 = pauVar39;
                        if (iVar50 == 0) {
                          uVar171 = 0;
                          uVar185 = 0;
                          pauVar57 = pauVar41;
                          if (pauVar41 != (undefined1 (*) [64])0x0) goto LAB_0019b769;
                        }
                        else {
LAB_0019b769:
                          uVar171 = *(undefined4 *)*pauVar57;
                          uVar185 = *(undefined4 *)(*pauVar57 + 4);
                        }
                        if (0 < iVar35) {
                          uVar61 = 0;
                          auVar130 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                          auVar131 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          pauVar57 = pauVar53;
                          auVar128 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar171));
                          auVar129 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar185));
                          do {
                            auVar133 = auVar129;
                            auVar132 = auVar128;
                            auVar128 = vpbroadcastq_avx512f();
                            auVar129 = vporq_avx512f(auVar128,auVar130);
                            auVar128 = vporq_avx512f(auVar128,auVar131);
                            uVar2 = vpcmpuq_avx512f(auVar128,auVar127,2);
                            bVar36 = (byte)uVar2;
                            uVar2 = vpcmpuq_avx512f(auVar129,auVar127,2);
                            bVar37 = (byte)uVar2;
                            uVar86 = CONCAT11(bVar37,bVar36);
                            auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar57 + uVar61));
                            auVar158._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar128._4_4_;
                            auVar158._0_4_ = (uint)(bVar36 & 1) * auVar128._0_4_;
                            auVar158._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar128._8_4_;
                            auVar158._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar128._12_4_;
                            auVar158._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar128._16_4_;
                            auVar158._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar128._20_4_;
                            auVar158._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar128._24_4_;
                            auVar158._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar128._28_4_;
                            auVar158._32_4_ = (uint)(bVar37 & 1) * auVar128._32_4_;
                            auVar158._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar128._36_4_;
                            auVar158._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar128._40_4_;
                            auVar158._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar128._44_4_;
                            auVar158._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar128._48_4_;
                            auVar158._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar128._52_4_;
                            auVar158._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar128._56_4_;
                            auVar158._60_4_ = (uint)(bVar37 >> 7) * auVar128._60_4_;
                            piVar38 = (int *)(*pauVar49 + uVar61 * 4);
                            auVar159._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * piVar38[1];
                            auVar159._0_4_ = (uint)(bVar36 & 1) * *piVar38;
                            auVar159._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * piVar38[2];
                            auVar159._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * piVar38[3];
                            auVar159._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * piVar38[4];
                            auVar159._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * piVar38[5];
                            auVar159._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * piVar38[6];
                            auVar159._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * piVar38[7];
                            auVar159._32_4_ = (uint)(bVar37 & 1) * piVar38[8];
                            auVar159._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar38[9];
                            auVar159._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar38[10];
                            auVar159._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar38[0xb];
                            auVar159._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar38[0xc];
                            auVar159._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar38[0xd];
                            auVar159._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar38[0xe];
                            auVar159._60_4_ = (uint)(bVar37 >> 7) * piVar38[0xf];
                            auVar128 = vfmadd213ps_avx512f(auVar158,auVar159,auVar132);
                            auVar129 = vgatherdps_avx512f(*(undefined4 *)(*pauVar57 + uVar61 + 4));
                            auVar160._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar129._4_4_;
                            auVar160._0_4_ = (uint)(bVar36 & 1) * auVar129._0_4_;
                            auVar160._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar129._8_4_;
                            auVar160._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar129._12_4_;
                            auVar160._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar129._16_4_;
                            auVar160._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar129._20_4_;
                            auVar160._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar129._24_4_;
                            auVar160._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar129._28_4_;
                            auVar160._32_4_ = (uint)(bVar37 & 1) * auVar129._32_4_;
                            auVar160._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar129._36_4_;
                            auVar160._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar129._40_4_;
                            auVar160._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar129._44_4_;
                            auVar160._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar129._48_4_;
                            auVar160._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar129._52_4_;
                            auVar160._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar129._56_4_;
                            auVar160._60_4_ = (uint)(bVar37 >> 7) * auVar129._60_4_;
                            auVar129 = vfmadd213ps_avx512f(auVar160,auVar159,auVar133);
                            uVar61 = uVar61 + 0x10;
                            pauVar57 = pauVar57 + 2;
                          } while (uVar66 != uVar61);
                          auVar161._0_4_ =
                               (uint)(bVar36 & 1) * auVar129._0_4_ |
                               (uint)!(bool)(bVar36 & 1) * auVar133._0_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                          auVar161._4_4_ =
                               (uint)bVar81 * auVar129._4_4_ | (uint)!bVar81 * auVar133._4_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                          auVar161._8_4_ =
                               (uint)bVar81 * auVar129._8_4_ | (uint)!bVar81 * auVar133._8_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                          auVar161._12_4_ =
                               (uint)bVar81 * auVar129._12_4_ | (uint)!bVar81 * auVar133._12_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                          auVar161._16_4_ =
                               (uint)bVar81 * auVar129._16_4_ | (uint)!bVar81 * auVar133._16_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                          auVar161._20_4_ =
                               (uint)bVar81 * auVar129._20_4_ | (uint)!bVar81 * auVar133._20_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                          auVar161._24_4_ =
                               (uint)bVar81 * auVar129._24_4_ | (uint)!bVar81 * auVar133._24_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                          auVar161._28_4_ =
                               (uint)bVar81 * auVar129._28_4_ | (uint)!bVar81 * auVar133._28_4_;
                          auVar161._32_4_ =
                               (uint)(bVar37 & 1) * auVar129._32_4_ |
                               (uint)!(bool)(bVar37 & 1) * auVar133._32_4_;
                          bVar81 = (bool)(bVar37 >> 1 & 1);
                          auVar161._36_4_ =
                               (uint)bVar81 * auVar129._36_4_ | (uint)!bVar81 * auVar133._36_4_;
                          bVar81 = (bool)(bVar37 >> 2 & 1);
                          auVar161._40_4_ =
                               (uint)bVar81 * auVar129._40_4_ | (uint)!bVar81 * auVar133._40_4_;
                          bVar81 = (bool)(bVar37 >> 3 & 1);
                          auVar161._44_4_ =
                               (uint)bVar81 * auVar129._44_4_ | (uint)!bVar81 * auVar133._44_4_;
                          bVar81 = (bool)(bVar37 >> 4 & 1);
                          auVar161._48_4_ =
                               (uint)bVar81 * auVar129._48_4_ | (uint)!bVar81 * auVar133._48_4_;
                          bVar81 = (bool)(bVar37 >> 5 & 1);
                          auVar161._52_4_ =
                               (uint)bVar81 * auVar129._52_4_ | (uint)!bVar81 * auVar133._52_4_;
                          bVar81 = (bool)(bVar37 >> 6 & 1);
                          auVar161._56_4_ =
                               (uint)bVar81 * auVar129._56_4_ | (uint)!bVar81 * auVar133._56_4_;
                          auVar161._60_4_ =
                               (uint)(bVar37 >> 7) * auVar129._60_4_ |
                               (uint)!(bool)(bVar37 >> 7) * auVar133._60_4_;
                          auVar109 = vextractf64x4_avx512f(auVar161,1);
                          auVar129 = vaddps_avx512f(auVar161,ZEXT3264(auVar109));
                          auVar188._0_4_ = auVar129._0_4_ + auVar129._16_4_;
                          auVar188._4_4_ = auVar129._4_4_ + auVar129._20_4_;
                          auVar188._8_4_ = auVar129._8_4_ + auVar129._24_4_;
                          auVar188._12_4_ = auVar129._12_4_ + auVar129._28_4_;
                          auVar95 = vshufpd_avx(auVar188,auVar188,1);
                          auVar189._0_4_ = auVar188._0_4_ + auVar95._0_4_;
                          auVar189._4_4_ = auVar188._4_4_ + auVar95._4_4_;
                          auVar189._8_4_ = auVar188._8_4_ + auVar95._8_4_;
                          auVar189._12_4_ = auVar188._12_4_ + auVar95._12_4_;
                          auVar95 = vhaddps_avx(auVar189,auVar189);
                          uVar185 = auVar95._0_4_;
                          auVar162._0_4_ =
                               (uint)(bVar36 & 1) * auVar128._0_4_ |
                               (uint)!(bool)(bVar36 & 1) * auVar132._0_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                          auVar162._4_4_ =
                               (uint)bVar81 * auVar128._4_4_ | (uint)!bVar81 * auVar132._4_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                          auVar162._8_4_ =
                               (uint)bVar81 * auVar128._8_4_ | (uint)!bVar81 * auVar132._8_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                          auVar162._12_4_ =
                               (uint)bVar81 * auVar128._12_4_ | (uint)!bVar81 * auVar132._12_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                          auVar162._16_4_ =
                               (uint)bVar81 * auVar128._16_4_ | (uint)!bVar81 * auVar132._16_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                          auVar162._20_4_ =
                               (uint)bVar81 * auVar128._20_4_ | (uint)!bVar81 * auVar132._20_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                          auVar162._24_4_ =
                               (uint)bVar81 * auVar128._24_4_ | (uint)!bVar81 * auVar132._24_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                          auVar162._28_4_ =
                               (uint)bVar81 * auVar128._28_4_ | (uint)!bVar81 * auVar132._28_4_;
                          auVar162._32_4_ =
                               (uint)(bVar37 & 1) * auVar128._32_4_ |
                               (uint)!(bool)(bVar37 & 1) * auVar132._32_4_;
                          bVar81 = (bool)(bVar37 >> 1 & 1);
                          auVar162._36_4_ =
                               (uint)bVar81 * auVar128._36_4_ | (uint)!bVar81 * auVar132._36_4_;
                          bVar81 = (bool)(bVar37 >> 2 & 1);
                          auVar162._40_4_ =
                               (uint)bVar81 * auVar128._40_4_ | (uint)!bVar81 * auVar132._40_4_;
                          bVar81 = (bool)(bVar37 >> 3 & 1);
                          auVar162._44_4_ =
                               (uint)bVar81 * auVar128._44_4_ | (uint)!bVar81 * auVar132._44_4_;
                          bVar81 = (bool)(bVar37 >> 4 & 1);
                          auVar162._48_4_ =
                               (uint)bVar81 * auVar128._48_4_ | (uint)!bVar81 * auVar132._48_4_;
                          bVar81 = (bool)(bVar37 >> 5 & 1);
                          auVar162._52_4_ =
                               (uint)bVar81 * auVar128._52_4_ | (uint)!bVar81 * auVar132._52_4_;
                          bVar81 = (bool)(bVar37 >> 6 & 1);
                          auVar162._56_4_ =
                               (uint)bVar81 * auVar128._56_4_ | (uint)!bVar81 * auVar132._56_4_;
                          auVar162._60_4_ =
                               (uint)(bVar37 >> 7) * auVar128._60_4_ |
                               (uint)!(bool)(bVar37 >> 7) * auVar132._60_4_;
                          auVar109 = vextractf64x4_avx512f(auVar162,1);
                          auVar128 = vaddps_avx512f(auVar162,ZEXT3264(auVar109));
                          auVar176._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                          auVar176._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                          auVar176._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                          auVar176._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                          auVar95 = vshufpd_avx(auVar176,auVar176,1);
                          auVar177._0_4_ = auVar176._0_4_ + auVar95._0_4_;
                          auVar177._4_4_ = auVar176._4_4_ + auVar95._4_4_;
                          auVar177._8_4_ = auVar176._8_4_ + auVar95._8_4_;
                          auVar177._12_4_ = auVar176._12_4_ + auVar95._12_4_;
                          auVar95 = vhaddps_avx(auVar177,auVar177);
                          uVar171 = auVar95._0_4_;
                          pauVar49 = (undefined1 (*) [16])(*pauVar49 + uVar46 * 4 + 4);
                        }
                        if (iVar44 < K) {
                          *(undefined4 *)*pauVar39 = uVar171;
                          *(undefined4 *)(*pauVar39 + 4) = uVar185;
                        }
                        else {
                          *(undefined4 *)*pauVar55 = uVar171;
                          *(undefined4 *)(*pauVar55 + lVar78 * 4) = uVar185;
                          pauVar55 = (undefined1 (*) [16])(*pauVar55 + 4);
                        }
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 8);
                        uVar80 = uVar80 + 1;
                      } while (uVar80 != uVar76);
                    }
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)(iVar35 * 2) * 4);
                    uVar61 = uVar48 + 2;
                    lVar42 = uVar48 + 3;
                    uVar48 = uVar61;
                    local_300 = pauVar41;
                  } while (lVar42 < local_1c8);
                }
                if ((int)uVar61 < (int)uVar47) {
                  uVar46 = (ulong)(iVar35 - 1);
                  lVar78 = (long)(int)uVar61;
                  uVar61 = (ulong)(iVar35 + 0xfU & 0xfffffff0);
                  auVar127 = vpbroadcastq_avx512f();
                  do {
                    pauVar41 = (undefined1 (*) [64])
                               ((long)local_250->data + lVar78 * 4 + local_1c0 * 4);
                    if (local_300 == (undefined1 (*) [64])0x0) {
                      pauVar41 = local_300;
                    }
                    uVar80 = 0;
                    pauVar55 = (undefined1 (*) [16])
                               ((long)local_258->data +
                               local_118 * 4 + (lVar78 + local_1c0) * (long)iVar73 * 4);
                    pauVar49 = local_298;
                    if (0xb < (int)uVar76) {
                      uVar52 = 0;
                      do {
                        if (iVar50 == 0) {
                          if (pauVar41 == (undefined1 (*) [64])0x0) {
                            auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar130 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          else {
                            uVar171 = *(undefined4 *)*pauVar41;
                            auVar178._4_4_ = uVar171;
                            auVar178._0_4_ = uVar171;
                            auVar178._8_4_ = uVar171;
                            auVar178._12_4_ = uVar171;
                            auVar128 = ZEXT1664(auVar178);
                            auVar129 = ZEXT1664(auVar178);
                            auVar130 = ZEXT1664(auVar178);
                          }
                        }
                        else {
                          auVar128 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                          auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x10));
                          auVar130 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x20));
                        }
                        auVar97 = auVar130._0_16_;
                        auVar96 = auVar129._0_16_;
                        auVar95 = auVar128._0_16_;
                        if (0 < iVar35) {
                          lVar42 = 0;
                          pauVar58 = pauVar49;
                          do {
                            uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 4);
                            auVar200._4_4_ = uVar171;
                            auVar200._0_4_ = uVar171;
                            auVar200._8_4_ = uVar171;
                            auVar200._12_4_ = uVar171;
                            auVar95 = vfmadd231ps_fma(auVar128._0_16_,auVar200,*pauVar58);
                            auVar128 = ZEXT1664(auVar95);
                            auVar96 = vfmadd231ps_fma(auVar129._0_16_,auVar200,pauVar58[1]);
                            auVar129 = ZEXT1664(auVar96);
                            auVar97 = vfmadd231ps_fma(auVar130._0_16_,auVar200,pauVar58[2]);
                            auVar130 = ZEXT1664(auVar97);
                            pauVar58 = pauVar58 + 3;
                            lVar42 = lVar42 + 1;
                          } while (iVar35 != (int)lVar42);
                          pauVar49 = pauVar49 + uVar46 * 3 + 3;
                        }
                        if (iVar44 < K) {
                          *(undefined1 (*) [16])*pauVar39 = auVar95;
                          *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar96;
                          *(undefined1 (*) [16])(*pauVar39 + 0x20) = auVar97;
                        }
                        else {
                          *pauVar55 = auVar95;
                          pauVar55[1] = auVar96;
                          pauVar55[2] = auVar97;
                          pauVar55 = pauVar55 + 3;
                        }
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x30);
                        uVar80 = uVar52 + 0xc;
                        iVar69 = uVar52 + 0x17;
                        uVar52 = uVar80;
                      } while (iVar69 < (int)uVar76);
                    }
                    iVar69 = uVar80 + 7;
                    while (iVar69 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar129 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar171 = *(undefined4 *)*pauVar41;
                          auVar179._4_4_ = uVar171;
                          auVar179._0_4_ = uVar171;
                          auVar179._8_4_ = uVar171;
                          auVar179._12_4_ = uVar171;
                          auVar128 = ZEXT1664(auVar179);
                          auVar129 = ZEXT1664(auVar179);
                        }
                      }
                      else {
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                        auVar129 = ZEXT1664(*(undefined1 (*) [16])(*pauVar39 + 0x10));
                      }
                      auVar96 = auVar129._0_16_;
                      auVar95 = auVar128._0_16_;
                      if (0 < iVar35) {
                        lVar42 = 0;
                        pauVar58 = pauVar49;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 4);
                          auVar196._4_4_ = uVar171;
                          auVar196._0_4_ = uVar171;
                          auVar196._8_4_ = uVar171;
                          auVar196._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_fma(auVar128._0_16_,auVar196,*pauVar58);
                          auVar128 = ZEXT1664(auVar95);
                          auVar96 = vfmadd231ps_fma(auVar129._0_16_,auVar196,pauVar58[1]);
                          auVar129 = ZEXT1664(auVar96);
                          pauVar58 = pauVar58 + 2;
                          lVar42 = lVar42 + 1;
                        } while (iVar35 != (int)lVar42);
                        pauVar49 = pauVar49 + uVar46 * 2 + 2;
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [16])*pauVar39 = auVar95;
                        *(undefined1 (*) [16])(*pauVar39 + 0x10) = auVar96;
                      }
                      else {
                        *pauVar55 = auVar95;
                        pauVar55[1] = auVar96;
                        pauVar55 = pauVar55 + 2;
                      }
                      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x20);
                      iVar69 = uVar80 + 0xf;
                      uVar80 = uVar80 + 8;
                    }
                    uVar52 = uVar80 | 3;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
                        }
                        else {
                          uVar171 = *(undefined4 *)*pauVar41;
                          auVar128 = ZEXT1664(CONCAT412(uVar171,CONCAT48(uVar171,CONCAT44(uVar171,
                                                  uVar171))));
                        }
                      }
                      else {
                        auVar128 = ZEXT1664(*(undefined1 (*) [16])*pauVar39);
                      }
                      auVar95 = auVar128._0_16_;
                      if (0 < iVar35) {
                        lVar42 = 0;
                        pauVar58 = pauVar49;
                        do {
                          uVar171 = *(undefined4 *)(*pauVar53 + lVar42 * 4);
                          auVar190._4_4_ = uVar171;
                          auVar190._0_4_ = uVar171;
                          auVar190._8_4_ = uVar171;
                          auVar190._12_4_ = uVar171;
                          auVar95 = vfmadd231ps_fma(auVar128._0_16_,auVar190,*pauVar58);
                          auVar128 = ZEXT1664(auVar95);
                          pauVar58 = pauVar58 + 1;
                          lVar42 = lVar42 + 1;
                        } while (iVar35 != (int)lVar42);
                        pauVar49 = pauVar49 + uVar46 + 1;
                      }
                      if (iVar44 < K) {
                        *(undefined1 (*) [16])*pauVar39 = auVar95;
                      }
                      else {
                        *pauVar55 = auVar95;
                        pauVar55 = pauVar55 + 1;
                      }
                      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 0x10);
                      uVar52 = uVar80 + 7;
                      uVar80 = uVar80 + 4;
                    }
                    uVar52 = uVar80 | 1;
                    while ((int)uVar52 < (int)uVar76) {
                      if (iVar50 == 0) {
                        if (pauVar41 == (undefined1 (*) [64])0x0) {
                          uVar171 = 0;
                          uVar185 = 0;
                        }
                        else {
                          uVar171 = *(undefined4 *)*pauVar41;
                          uVar185 = uVar171;
                        }
                      }
                      else {
                        uVar171 = *(undefined4 *)*pauVar39;
                        uVar185 = *(undefined4 *)(*pauVar39 + 4);
                      }
                      if (0 < iVar35) {
                        uVar66 = 0;
                        auVar130 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar131 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        pauVar58 = pauVar49;
                        auVar128 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar171));
                        auVar129 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar185));
                        do {
                          auVar133 = auVar129;
                          auVar132 = auVar128;
                          auVar128 = vpbroadcastq_avx512f();
                          auVar129 = vporq_avx512f(auVar128,auVar130);
                          auVar128 = vporq_avx512f(auVar128,auVar131);
                          uVar2 = vpcmpuq_avx512f(auVar128,auVar127,2);
                          bVar36 = (byte)uVar2;
                          uVar2 = vpcmpuq_avx512f(auVar129,auVar127,2);
                          bVar37 = (byte)uVar2;
                          uVar86 = CONCAT11(bVar37,bVar36);
                          piVar38 = (int *)(*pauVar53 + uVar66 * 4);
                          auVar163._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * piVar38[1];
                          auVar163._0_4_ = (uint)(bVar36 & 1) * *piVar38;
                          auVar163._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * piVar38[2];
                          auVar163._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * piVar38[3];
                          auVar163._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * piVar38[4];
                          auVar163._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * piVar38[5];
                          auVar163._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * piVar38[6];
                          auVar163._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * piVar38[7];
                          auVar163._32_4_ = (uint)(bVar37 & 1) * piVar38[8];
                          auVar163._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar38[9];
                          auVar163._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar38[10];
                          auVar163._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar38[0xb];
                          auVar163._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar38[0xc];
                          auVar163._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar38[0xd];
                          auVar163._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar38[0xe];
                          auVar163._60_4_ = (uint)(bVar37 >> 7) * piVar38[0xf];
                          auVar128 = vgatherdps_avx512f(*(undefined4 *)(*pauVar58 + uVar66));
                          auVar164._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar128._4_4_;
                          auVar164._0_4_ = (uint)(bVar36 & 1) * auVar128._0_4_;
                          auVar164._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar128._8_4_;
                          auVar164._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar128._12_4_;
                          auVar164._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar128._16_4_;
                          auVar164._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar128._20_4_;
                          auVar164._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar128._24_4_;
                          auVar164._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar128._28_4_;
                          auVar164._32_4_ = (uint)(bVar37 & 1) * auVar128._32_4_;
                          auVar164._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar128._36_4_;
                          auVar164._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar128._40_4_;
                          auVar164._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar128._44_4_;
                          auVar164._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar128._48_4_;
                          auVar164._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar128._52_4_;
                          auVar164._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar128._56_4_;
                          auVar164._60_4_ = (uint)(bVar37 >> 7) * auVar128._60_4_;
                          auVar128 = vfmadd213ps_avx512f(auVar164,auVar163,auVar132);
                          auVar129 = vgatherdps_avx512f(*(undefined4 *)(*pauVar58 + uVar66 + 4));
                          auVar165._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * auVar129._4_4_;
                          auVar165._0_4_ = (uint)(bVar36 & 1) * auVar129._0_4_;
                          auVar165._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * auVar129._8_4_;
                          auVar165._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * auVar129._12_4_;
                          auVar165._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * auVar129._16_4_;
                          auVar165._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * auVar129._20_4_;
                          auVar165._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * auVar129._24_4_;
                          auVar165._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * auVar129._28_4_;
                          auVar165._32_4_ = (uint)(bVar37 & 1) * auVar129._32_4_;
                          auVar165._36_4_ = (uint)(bVar37 >> 1 & 1) * auVar129._36_4_;
                          auVar165._40_4_ = (uint)(bVar37 >> 2 & 1) * auVar129._40_4_;
                          auVar165._44_4_ = (uint)(bVar37 >> 3 & 1) * auVar129._44_4_;
                          auVar165._48_4_ = (uint)(bVar37 >> 4 & 1) * auVar129._48_4_;
                          auVar165._52_4_ = (uint)(bVar37 >> 5 & 1) * auVar129._52_4_;
                          auVar165._56_4_ = (uint)(bVar37 >> 6 & 1) * auVar129._56_4_;
                          auVar165._60_4_ = (uint)(bVar37 >> 7) * auVar129._60_4_;
                          auVar129 = vfmadd213ps_avx512f(auVar165,auVar163,auVar133);
                          uVar66 = uVar66 + 0x10;
                          pauVar58 = pauVar58 + 8;
                        } while (uVar61 != uVar66);
                        auVar166._0_4_ =
                             (uint)(bVar36 & 1) * auVar129._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * auVar133._0_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                        auVar166._4_4_ =
                             (uint)bVar81 * auVar129._4_4_ | (uint)!bVar81 * auVar133._4_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                        auVar166._8_4_ =
                             (uint)bVar81 * auVar129._8_4_ | (uint)!bVar81 * auVar133._8_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                        auVar166._12_4_ =
                             (uint)bVar81 * auVar129._12_4_ | (uint)!bVar81 * auVar133._12_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                        auVar166._16_4_ =
                             (uint)bVar81 * auVar129._16_4_ | (uint)!bVar81 * auVar133._16_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                        auVar166._20_4_ =
                             (uint)bVar81 * auVar129._20_4_ | (uint)!bVar81 * auVar133._20_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                        auVar166._24_4_ =
                             (uint)bVar81 * auVar129._24_4_ | (uint)!bVar81 * auVar133._24_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                        auVar166._28_4_ =
                             (uint)bVar81 * auVar129._28_4_ | (uint)!bVar81 * auVar133._28_4_;
                        auVar166._32_4_ =
                             (uint)(bVar37 & 1) * auVar129._32_4_ |
                             (uint)!(bool)(bVar37 & 1) * auVar133._32_4_;
                        bVar81 = (bool)(bVar37 >> 1 & 1);
                        auVar166._36_4_ =
                             (uint)bVar81 * auVar129._36_4_ | (uint)!bVar81 * auVar133._36_4_;
                        bVar81 = (bool)(bVar37 >> 2 & 1);
                        auVar166._40_4_ =
                             (uint)bVar81 * auVar129._40_4_ | (uint)!bVar81 * auVar133._40_4_;
                        bVar81 = (bool)(bVar37 >> 3 & 1);
                        auVar166._44_4_ =
                             (uint)bVar81 * auVar129._44_4_ | (uint)!bVar81 * auVar133._44_4_;
                        bVar81 = (bool)(bVar37 >> 4 & 1);
                        auVar166._48_4_ =
                             (uint)bVar81 * auVar129._48_4_ | (uint)!bVar81 * auVar133._48_4_;
                        bVar81 = (bool)(bVar37 >> 5 & 1);
                        auVar166._52_4_ =
                             (uint)bVar81 * auVar129._52_4_ | (uint)!bVar81 * auVar133._52_4_;
                        bVar81 = (bool)(bVar37 >> 6 & 1);
                        auVar166._56_4_ =
                             (uint)bVar81 * auVar129._56_4_ | (uint)!bVar81 * auVar133._56_4_;
                        auVar166._60_4_ =
                             (uint)(bVar37 >> 7) * auVar129._60_4_ |
                             (uint)!(bool)(bVar37 >> 7) * auVar133._60_4_;
                        auVar109 = vextractf64x4_avx512f(auVar166,1);
                        auVar129 = vaddps_avx512f(auVar166,ZEXT3264(auVar109));
                        auVar191._0_4_ = auVar129._0_4_ + auVar129._16_4_;
                        auVar191._4_4_ = auVar129._4_4_ + auVar129._20_4_;
                        auVar191._8_4_ = auVar129._8_4_ + auVar129._24_4_;
                        auVar191._12_4_ = auVar129._12_4_ + auVar129._28_4_;
                        auVar95 = vshufpd_avx(auVar191,auVar191,1);
                        auVar192._0_4_ = auVar191._0_4_ + auVar95._0_4_;
                        auVar192._4_4_ = auVar191._4_4_ + auVar95._4_4_;
                        auVar192._8_4_ = auVar191._8_4_ + auVar95._8_4_;
                        auVar192._12_4_ = auVar191._12_4_ + auVar95._12_4_;
                        auVar95 = vhaddps_avx(auVar192,auVar192);
                        uVar185 = auVar95._0_4_;
                        auVar167._0_4_ =
                             (uint)(bVar36 & 1) * auVar128._0_4_ |
                             (uint)!(bool)(bVar36 & 1) * auVar132._0_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                        auVar167._4_4_ =
                             (uint)bVar81 * auVar128._4_4_ | (uint)!bVar81 * auVar132._4_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                        auVar167._8_4_ =
                             (uint)bVar81 * auVar128._8_4_ | (uint)!bVar81 * auVar132._8_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                        auVar167._12_4_ =
                             (uint)bVar81 * auVar128._12_4_ | (uint)!bVar81 * auVar132._12_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                        auVar167._16_4_ =
                             (uint)bVar81 * auVar128._16_4_ | (uint)!bVar81 * auVar132._16_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                        auVar167._20_4_ =
                             (uint)bVar81 * auVar128._20_4_ | (uint)!bVar81 * auVar132._20_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                        auVar167._24_4_ =
                             (uint)bVar81 * auVar128._24_4_ | (uint)!bVar81 * auVar132._24_4_;
                        bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                        auVar167._28_4_ =
                             (uint)bVar81 * auVar128._28_4_ | (uint)!bVar81 * auVar132._28_4_;
                        auVar167._32_4_ =
                             (uint)(bVar37 & 1) * auVar128._32_4_ |
                             (uint)!(bool)(bVar37 & 1) * auVar132._32_4_;
                        bVar81 = (bool)(bVar37 >> 1 & 1);
                        auVar167._36_4_ =
                             (uint)bVar81 * auVar128._36_4_ | (uint)!bVar81 * auVar132._36_4_;
                        bVar81 = (bool)(bVar37 >> 2 & 1);
                        auVar167._40_4_ =
                             (uint)bVar81 * auVar128._40_4_ | (uint)!bVar81 * auVar132._40_4_;
                        bVar81 = (bool)(bVar37 >> 3 & 1);
                        auVar167._44_4_ =
                             (uint)bVar81 * auVar128._44_4_ | (uint)!bVar81 * auVar132._44_4_;
                        bVar81 = (bool)(bVar37 >> 4 & 1);
                        auVar167._48_4_ =
                             (uint)bVar81 * auVar128._48_4_ | (uint)!bVar81 * auVar132._48_4_;
                        bVar81 = (bool)(bVar37 >> 5 & 1);
                        auVar167._52_4_ =
                             (uint)bVar81 * auVar128._52_4_ | (uint)!bVar81 * auVar132._52_4_;
                        bVar81 = (bool)(bVar37 >> 6 & 1);
                        auVar167._56_4_ =
                             (uint)bVar81 * auVar128._56_4_ | (uint)!bVar81 * auVar132._56_4_;
                        auVar167._60_4_ =
                             (uint)(bVar37 >> 7) * auVar128._60_4_ |
                             (uint)!(bool)(bVar37 >> 7) * auVar132._60_4_;
                        auVar109 = vextractf64x4_avx512f(auVar167,1);
                        auVar128 = vaddps_avx512f(auVar167,ZEXT3264(auVar109));
                        auVar180._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                        auVar180._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                        auVar180._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                        auVar180._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                        auVar95 = vshufpd_avx(auVar180,auVar180,1);
                        auVar181._0_4_ = auVar180._0_4_ + auVar95._0_4_;
                        auVar181._4_4_ = auVar180._4_4_ + auVar95._4_4_;
                        auVar181._8_4_ = auVar180._8_4_ + auVar95._8_4_;
                        auVar181._12_4_ = auVar180._12_4_ + auVar95._12_4_;
                        auVar95 = vhaddps_avx(auVar181,auVar181);
                        uVar171 = auVar95._0_4_;
                        pauVar49 = (undefined1 (*) [16])(*pauVar49 + uVar46 * 8 + 8);
                      }
                      if (iVar44 < K) {
                        *(undefined4 *)*pauVar39 = uVar171;
                        *(undefined4 *)(*pauVar39 + 4) = uVar185;
                      }
                      else {
                        *(undefined4 *)*pauVar55 = uVar171;
                        *(undefined4 *)(*pauVar55 + 4) = uVar185;
                        pauVar55 = (undefined1 (*) [16])(*pauVar55 + 8);
                      }
                      pauVar39 = (undefined1 (*) [64])(*pauVar39 + 8);
                      uVar52 = uVar80 + 3;
                      uVar80 = uVar80 + 2;
                    }
                    if ((int)uVar80 < (int)uVar76) {
                      do {
                        uVar171 = 0;
                        if (pauVar41 != (undefined1 (*) [64])0x0 || iVar50 != 0) {
                          pauVar57 = pauVar41;
                          if (iVar50 != 0) {
                            pauVar57 = pauVar39;
                          }
                          uVar171 = *(undefined4 *)*pauVar57;
                        }
                        if (0 < iVar35) {
                          uVar66 = 0;
                          auVar129 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                          auVar130 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          auVar128 = ZEXT1264(CONCAT84(SUB128(ZEXT812(0),4),uVar171));
                          do {
                            auVar132 = auVar128;
                            auVar128 = vpbroadcastq_avx512f();
                            auVar131 = vporq_avx512f(auVar128,auVar129);
                            auVar128 = vporq_avx512f(auVar128,auVar130);
                            uVar2 = vpcmpuq_avx512f(auVar128,auVar127,2);
                            bVar36 = (byte)uVar2;
                            uVar2 = vpcmpuq_avx512f(auVar131,auVar127,2);
                            bVar37 = (byte)uVar2;
                            uVar86 = CONCAT11(bVar37,bVar36);
                            piVar38 = (int *)(*pauVar53 + uVar66 * 4);
                            auVar168._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * piVar38[1];
                            auVar168._0_4_ = (uint)(bVar36 & 1) * *piVar38;
                            auVar168._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * piVar38[2];
                            auVar168._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * piVar38[3];
                            auVar168._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * piVar38[4];
                            auVar168._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * piVar38[5];
                            auVar168._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * piVar38[6];
                            auVar168._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * piVar38[7];
                            auVar168._32_4_ = (uint)(bVar37 & 1) * piVar38[8];
                            auVar168._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar38[9];
                            auVar168._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar38[10];
                            auVar168._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar38[0xb];
                            auVar168._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar38[0xc];
                            auVar168._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar38[0xd];
                            auVar168._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar38[0xe];
                            auVar168._60_4_ = (uint)(bVar37 >> 7) * piVar38[0xf];
                            piVar38 = (int *)(*pauVar49 + uVar66 * 4);
                            auVar169._4_4_ = (uint)((byte)(uVar86 >> 1) & 1) * piVar38[1];
                            auVar169._0_4_ = (uint)(bVar36 & 1) * *piVar38;
                            auVar169._8_4_ = (uint)((byte)(uVar86 >> 2) & 1) * piVar38[2];
                            auVar169._12_4_ = (uint)((byte)(uVar86 >> 3) & 1) * piVar38[3];
                            auVar169._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * piVar38[4];
                            auVar169._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * piVar38[5];
                            auVar169._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * piVar38[6];
                            auVar169._28_4_ = (uint)((byte)(uVar86 >> 7) & 1) * piVar38[7];
                            auVar169._32_4_ = (uint)(bVar37 & 1) * piVar38[8];
                            auVar169._36_4_ = (uint)(bVar37 >> 1 & 1) * piVar38[9];
                            auVar169._40_4_ = (uint)(bVar37 >> 2 & 1) * piVar38[10];
                            auVar169._44_4_ = (uint)(bVar37 >> 3 & 1) * piVar38[0xb];
                            auVar169._48_4_ = (uint)(bVar37 >> 4 & 1) * piVar38[0xc];
                            auVar169._52_4_ = (uint)(bVar37 >> 5 & 1) * piVar38[0xd];
                            auVar169._56_4_ = (uint)(bVar37 >> 6 & 1) * piVar38[0xe];
                            auVar169._60_4_ = (uint)(bVar37 >> 7) * piVar38[0xf];
                            auVar128 = vfmadd213ps_avx512f(auVar169,auVar168,auVar132);
                            uVar66 = uVar66 + 0x10;
                          } while (uVar61 != uVar66);
                          auVar170._0_4_ =
                               (uint)(bVar36 & 1) * auVar128._0_4_ |
                               (uint)!(bool)(bVar36 & 1) * auVar132._0_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 1) & 1);
                          auVar170._4_4_ =
                               (uint)bVar81 * auVar128._4_4_ | (uint)!bVar81 * auVar132._4_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 2) & 1);
                          auVar170._8_4_ =
                               (uint)bVar81 * auVar128._8_4_ | (uint)!bVar81 * auVar132._8_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 3) & 1);
                          auVar170._12_4_ =
                               (uint)bVar81 * auVar128._12_4_ | (uint)!bVar81 * auVar132._12_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 4) & 1);
                          auVar170._16_4_ =
                               (uint)bVar81 * auVar128._16_4_ | (uint)!bVar81 * auVar132._16_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 5) & 1);
                          auVar170._20_4_ =
                               (uint)bVar81 * auVar128._20_4_ | (uint)!bVar81 * auVar132._20_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 6) & 1);
                          auVar170._24_4_ =
                               (uint)bVar81 * auVar128._24_4_ | (uint)!bVar81 * auVar132._24_4_;
                          bVar81 = (bool)((byte)(uVar86 >> 7) & 1);
                          auVar170._28_4_ =
                               (uint)bVar81 * auVar128._28_4_ | (uint)!bVar81 * auVar132._28_4_;
                          auVar170._32_4_ =
                               (uint)(bVar37 & 1) * auVar128._32_4_ |
                               (uint)!(bool)(bVar37 & 1) * auVar132._32_4_;
                          bVar81 = (bool)(bVar37 >> 1 & 1);
                          auVar170._36_4_ =
                               (uint)bVar81 * auVar128._36_4_ | (uint)!bVar81 * auVar132._36_4_;
                          bVar81 = (bool)(bVar37 >> 2 & 1);
                          auVar170._40_4_ =
                               (uint)bVar81 * auVar128._40_4_ | (uint)!bVar81 * auVar132._40_4_;
                          bVar81 = (bool)(bVar37 >> 3 & 1);
                          auVar170._44_4_ =
                               (uint)bVar81 * auVar128._44_4_ | (uint)!bVar81 * auVar132._44_4_;
                          bVar81 = (bool)(bVar37 >> 4 & 1);
                          auVar170._48_4_ =
                               (uint)bVar81 * auVar128._48_4_ | (uint)!bVar81 * auVar132._48_4_;
                          bVar81 = (bool)(bVar37 >> 5 & 1);
                          auVar170._52_4_ =
                               (uint)bVar81 * auVar128._52_4_ | (uint)!bVar81 * auVar132._52_4_;
                          bVar81 = (bool)(bVar37 >> 6 & 1);
                          auVar170._56_4_ =
                               (uint)bVar81 * auVar128._56_4_ | (uint)!bVar81 * auVar132._56_4_;
                          auVar170._60_4_ =
                               (uint)(bVar37 >> 7) * auVar128._60_4_ |
                               (uint)!(bool)(bVar37 >> 7) * auVar132._60_4_;
                          auVar109 = vextractf64x4_avx512f(auVar170,1);
                          auVar128 = vaddps_avx512f(auVar170,ZEXT3264(auVar109));
                          auVar182._0_4_ = auVar128._0_4_ + auVar128._16_4_;
                          auVar182._4_4_ = auVar128._4_4_ + auVar128._20_4_;
                          auVar182._8_4_ = auVar128._8_4_ + auVar128._24_4_;
                          auVar182._12_4_ = auVar128._12_4_ + auVar128._28_4_;
                          auVar95 = vshufpd_avx(auVar182,auVar182,1);
                          auVar183._0_4_ = auVar182._0_4_ + auVar95._0_4_;
                          auVar183._4_4_ = auVar182._4_4_ + auVar95._4_4_;
                          auVar183._8_4_ = auVar182._8_4_ + auVar95._8_4_;
                          auVar183._12_4_ = auVar182._12_4_ + auVar95._12_4_;
                          auVar95 = vhaddps_avx(auVar183,auVar183);
                          uVar171 = auVar95._0_4_;
                          pauVar49 = (undefined1 (*) [16])(*pauVar49 + uVar46 * 4 + 4);
                        }
                        if (iVar44 < K) {
                          *(undefined4 *)*pauVar39 = uVar171;
                        }
                        else {
                          *(undefined4 *)*pauVar55 = uVar171;
                          pauVar55 = (undefined1 (*) [16])(*pauVar55 + 4);
                        }
                        pauVar39 = (undefined1 (*) [64])(*pauVar39 + 4);
                        uVar80 = uVar80 + 1;
                      } while (uVar80 != uVar76);
                    }
                    lVar78 = lVar78 + 1;
                    pauVar53 = (undefined1 (*) [64])(*pauVar53 + (long)iVar35 * 4);
                    local_300 = pauVar41;
                  } while (lVar78 != local_1c8);
                }
                iVar50 = iVar50 + TILE_K;
                local_25c = iVar70;
              } while (iVar50 < K);
            }
            iVar70 = iVar70 + TILE_N;
            uVar61 = local_1b8;
          } while (iVar70 < (int)local_1b8);
        }
        uVar47 = (int)uVar79 + 1;
        uVar46 = (ulong)uVar47;
        local_108 = uVar79;
      } while (uVar47 != local_21c);
    }
    iVar43 = 0;
  }
  piVar38 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar38 != (int *)0x0) {
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        if (local_218.data != (void *)0x0) {
          free(local_218.data);
        }
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218.elemsize._4_4_ = 0;
  local_218.elempack = 0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
LAB_0019becb:
  piVar38 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar38 != (int *)0x0) {
    LOCK();
    *piVar38 = *piVar38 + -1;
    UNLOCK();
    if (*piVar38 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar43;
}

Assistant:

static int convolution_im2col_gemm(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT_tileX;
    if (K > TILE_K)
    {
        topT_tileX.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT_tileX.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat topT_tile;
        if (K > TILE_K)
            topT_tile = topT_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                bool k_end = k + TILE_K >= K;

                convolution_gemm_transB_packed_tile(AT_tile, BT_tile, bias, topT_tile, top_blob, i, max_ii, j, max_jj, k, max_kk, k_end);
            }
        }
    }

    return 0;
}